

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx::CurveNiMBIntersectorK<8,8>::
     intersect_t<embree::avx::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [28];
  undefined1 (*pauVar10) [32];
  undefined1 (*pauVar11) [28];
  undefined4 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  Primitive PVar32;
  uint uVar33;
  uint uVar34;
  undefined4 uVar35;
  Geometry *pGVar36;
  __int_type_conflict _Var37;
  RTCFilterFunctionN p_Var38;
  uint uVar39;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [28];
  undefined1 auVar137 [28];
  undefined1 auVar138 [28];
  undefined1 auVar139 [28];
  undefined1 auVar140 [28];
  undefined1 auVar141 [24];
  uint uVar142;
  uint uVar143;
  ulong uVar144;
  ulong uVar145;
  uint uVar146;
  long lVar147;
  long lVar148;
  long lVar149;
  undefined1 auVar156 [16];
  undefined1 auVar150 [8];
  long lVar151;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar152;
  float fVar176;
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  float fVar177;
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  float fVar178;
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [64];
  float fVar179;
  float fVar199;
  float fVar201;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  float fVar180;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  float fVar204;
  float fVar205;
  float fVar207;
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  float fVar202;
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  float fVar200;
  float fVar203;
  float fVar208;
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  float fVar206;
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  float fVar209;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar224;
  float fVar225;
  undefined1 auVar218 [32];
  float fVar227;
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  float fVar226;
  undefined1 auVar221 [32];
  float fVar228;
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  float fVar229;
  float fVar249;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  float fVar230;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  float fVar247;
  float fVar251;
  float fVar253;
  float fVar256;
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  float fVar252;
  float fVar254;
  float fVar257;
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  float fVar248;
  float fVar250;
  float fVar255;
  undefined1 auVar245 [32];
  undefined1 auVar246 [64];
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar270;
  float fVar273;
  float fVar275;
  undefined1 auVar261 [16];
  float fVar271;
  undefined1 auVar263 [16];
  float fVar272;
  float fVar274;
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  float fVar280;
  float fVar288;
  float fVar289;
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  float fVar291;
  float fVar292;
  float fVar293;
  undefined1 auVar283 [32];
  float fVar290;
  float fVar294;
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  float fVar295;
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar296 [16];
  float fVar304;
  float fVar305;
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  float fVar306;
  undefined1 auVar302 [32];
  undefined1 auVar303 [64];
  undefined1 auVar307 [16];
  float fVar316;
  float fVar317;
  float fVar318;
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [64];
  undefined1 auVar320 [16];
  float fVar319;
  float fVar330;
  float fVar331;
  float fVar333;
  float fVar334;
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  float fVar332;
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [64];
  float fVar335;
  float fVar336;
  float fVar346;
  float fVar347;
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [64];
  float fVar348;
  float fVar356;
  float fVar357;
  float fVar359;
  float fVar361;
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  float fVar358;
  float fVar360;
  float fVar362;
  undefined1 auVar355 [32];
  float fVar363;
  float fVar370;
  float fVar371;
  float fVar372;
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  float fVar373;
  float fVar384;
  float in_register_0000151c;
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  float fVar385;
  float fVar390;
  float fVar391;
  float fVar393;
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  float fVar392;
  float fVar394;
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  float fVar395;
  float fVar396;
  float fVar401;
  float fVar403;
  float fVar404;
  float in_register_0000159c;
  undefined1 auVar398 [32];
  float fVar402;
  undefined1 auVar399 [32];
  undefined1 auVar400 [32];
  float fVar405;
  float fVar409;
  float in_register_000015dc;
  undefined1 auVar407 [32];
  undefined1 auVar408 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined8 uStack_918;
  float local_900;
  float fStack_8fc;
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  undefined8 uStack_8b8;
  undefined8 uStack_8a8;
  undefined8 uStack_898;
  RTCFilterFunctionNArguments local_890;
  undefined1 local_860 [8];
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  float local_7c0;
  float fStack_7bc;
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [32];
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined1 *local_758;
  undefined1 (*local_750) [16];
  undefined1 (*local_748) [32];
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined1 local_6a0 [32];
  LinearSpace3fa *local_670;
  Primitive *local_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined1 local_640 [32];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [8];
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  uint local_3c0;
  uint local_3bc;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  float local_340 [4];
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  RTCHitN local_280 [16];
  undefined1 auStack_270 [16];
  undefined1 local_260 [16];
  undefined1 auStack_250 [16];
  undefined1 local_240 [16];
  undefined1 auStack_230 [16];
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined4 local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  undefined1 auVar262 [16];
  undefined1 auVar374 [16];
  undefined1 auVar397 [16];
  undefined1 auVar406 [16];
  
  PVar32 = prim[1];
  uVar144 = (ulong)(byte)PVar32;
  lVar147 = uVar144 * 0x25;
  auVar282 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar282 = vinsertps_avx(auVar282,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar214 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar214 = vinsertps_avx(auVar214,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar282 = vsubps_avx(auVar282,*(undefined1 (*) [16])(prim + lVar147 + 6));
  fVar229 = *(float *)(prim + lVar147 + 0x12);
  auVar181._0_4_ = fVar229 * auVar282._0_4_;
  auVar181._4_4_ = fVar229 * auVar282._4_4_;
  auVar181._8_4_ = fVar229 * auVar282._8_4_;
  auVar181._12_4_ = fVar229 * auVar282._12_4_;
  auVar282 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 4 + 6)));
  auVar281._0_4_ = fVar229 * auVar214._0_4_;
  auVar281._4_4_ = fVar229 * auVar214._4_4_;
  auVar281._8_4_ = fVar229 * auVar214._8_4_;
  auVar281._12_4_ = fVar229 * auVar214._12_4_;
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 4 + 10)));
  auVar165._16_16_ = auVar214;
  auVar165._0_16_ = auVar282;
  auVar165 = vcvtdq2ps_avx(auVar165);
  lVar151 = uVar144 * 5;
  auVar282 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar151 + 6)));
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar151 + 10)));
  auVar218._16_16_ = auVar214;
  auVar218._0_16_ = auVar282;
  auVar282 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 6 + 6)));
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 6 + 10)));
  auVar172 = vcvtdq2ps_avx(auVar218);
  auVar236._16_16_ = auVar214;
  auVar236._0_16_ = auVar282;
  auVar41 = vcvtdq2ps_avx(auVar236);
  auVar282 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 0xf + 6)));
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 0xf + 10)));
  auVar237._16_16_ = auVar214;
  auVar237._0_16_ = auVar282;
  auVar42 = vcvtdq2ps_avx(auVar237);
  lVar148 = (ulong)(byte)PVar32 * 0x10;
  auVar282 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar148 + 6)));
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar148 + 10)));
  auVar297._16_16_ = auVar214;
  auVar297._0_16_ = auVar282;
  auVar282 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar148 + uVar144 + 6)));
  auVar43 = vcvtdq2ps_avx(auVar297);
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar148 + uVar144 + 10)));
  auVar308._16_16_ = auVar214;
  auVar308._0_16_ = auVar282;
  auVar282 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 0x1a + 6)));
  auVar44 = vcvtdq2ps_avx(auVar308);
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 0x1a + 10)));
  auVar309._16_16_ = auVar214;
  auVar309._0_16_ = auVar282;
  auVar342 = vcvtdq2ps_avx(auVar309);
  auVar282 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 0x1b + 6)));
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 0x1b + 10)));
  auVar337._16_16_ = auVar214;
  auVar337._0_16_ = auVar282;
  auVar282 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 0x1c + 6)));
  auVar214 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 0x1c + 10)));
  auVar45 = vcvtdq2ps_avx(auVar337);
  auVar349._16_16_ = auVar214;
  auVar349._0_16_ = auVar282;
  auVar46 = vcvtdq2ps_avx(auVar349);
  auVar282 = vshufps_avx(auVar281,auVar281,0);
  auVar214 = vshufps_avx(auVar281,auVar281,0x55);
  auVar212 = vshufps_avx(auVar281,auVar281,0xaa);
  fVar229 = auVar212._0_4_;
  fVar248 = auVar212._4_4_;
  fVar247 = auVar212._8_4_;
  fVar250 = auVar212._12_4_;
  fVar227 = auVar214._0_4_;
  fVar255 = auVar214._4_4_;
  fVar249 = auVar214._8_4_;
  fVar206 = auVar214._12_4_;
  fVar251 = auVar282._0_4_;
  fVar253 = auVar282._4_4_;
  fVar256 = auVar282._8_4_;
  fVar258 = auVar282._12_4_;
  auVar375._0_4_ = fVar251 * auVar165._0_4_ + fVar227 * auVar172._0_4_ + fVar229 * auVar41._0_4_;
  auVar375._4_4_ = fVar253 * auVar165._4_4_ + fVar255 * auVar172._4_4_ + fVar248 * auVar41._4_4_;
  auVar375._8_4_ = fVar256 * auVar165._8_4_ + fVar249 * auVar172._8_4_ + fVar247 * auVar41._8_4_;
  auVar375._12_4_ = fVar258 * auVar165._12_4_ + fVar206 * auVar172._12_4_ + fVar250 * auVar41._12_4_
  ;
  auVar375._16_4_ = fVar251 * auVar165._16_4_ + fVar227 * auVar172._16_4_ + fVar229 * auVar41._16_4_
  ;
  auVar375._20_4_ = fVar253 * auVar165._20_4_ + fVar255 * auVar172._20_4_ + fVar248 * auVar41._20_4_
  ;
  auVar375._24_4_ = fVar256 * auVar165._24_4_ + fVar249 * auVar172._24_4_ + fVar247 * auVar41._24_4_
  ;
  auVar375._28_4_ = fVar206 + in_register_000015dc + in_register_0000151c;
  auVar364._0_4_ = fVar251 * auVar42._0_4_ + fVar227 * auVar43._0_4_ + auVar44._0_4_ * fVar229;
  auVar364._4_4_ = fVar253 * auVar42._4_4_ + fVar255 * auVar43._4_4_ + auVar44._4_4_ * fVar248;
  auVar364._8_4_ = fVar256 * auVar42._8_4_ + fVar249 * auVar43._8_4_ + auVar44._8_4_ * fVar247;
  auVar364._12_4_ = fVar258 * auVar42._12_4_ + fVar206 * auVar43._12_4_ + auVar44._12_4_ * fVar250;
  auVar364._16_4_ = fVar251 * auVar42._16_4_ + fVar227 * auVar43._16_4_ + auVar44._16_4_ * fVar229;
  auVar364._20_4_ = fVar253 * auVar42._20_4_ + fVar255 * auVar43._20_4_ + auVar44._20_4_ * fVar248;
  auVar364._24_4_ = fVar256 * auVar42._24_4_ + fVar249 * auVar43._24_4_ + auVar44._24_4_ * fVar247;
  auVar364._28_4_ = fVar206 + in_register_000015dc + in_register_0000159c;
  auVar283._0_4_ = fVar251 * auVar342._0_4_ + fVar227 * auVar45._0_4_ + auVar46._0_4_ * fVar229;
  auVar283._4_4_ = fVar253 * auVar342._4_4_ + fVar255 * auVar45._4_4_ + auVar46._4_4_ * fVar248;
  auVar283._8_4_ = fVar256 * auVar342._8_4_ + fVar249 * auVar45._8_4_ + auVar46._8_4_ * fVar247;
  auVar283._12_4_ = fVar258 * auVar342._12_4_ + fVar206 * auVar45._12_4_ + auVar46._12_4_ * fVar250;
  auVar283._16_4_ = fVar251 * auVar342._16_4_ + fVar227 * auVar45._16_4_ + auVar46._16_4_ * fVar229;
  auVar283._20_4_ = fVar253 * auVar342._20_4_ + fVar255 * auVar45._20_4_ + auVar46._20_4_ * fVar248;
  auVar283._24_4_ = fVar256 * auVar342._24_4_ + fVar249 * auVar45._24_4_ + auVar46._24_4_ * fVar247;
  auVar283._28_4_ = fVar258 + fVar206 + fVar250;
  auVar282 = vshufps_avx(auVar181,auVar181,0);
  auVar214 = vshufps_avx(auVar181,auVar181,0x55);
  auVar212 = vshufps_avx(auVar181,auVar181,0xaa);
  fVar229 = auVar212._0_4_;
  fVar248 = auVar212._4_4_;
  fVar247 = auVar212._8_4_;
  fVar250 = auVar212._12_4_;
  fVar253 = auVar214._0_4_;
  fVar256 = auVar214._4_4_;
  fVar258 = auVar214._8_4_;
  fVar270 = auVar214._12_4_;
  fVar227 = auVar172._28_4_ + auVar41._28_4_;
  fVar255 = auVar282._0_4_;
  fVar249 = auVar282._4_4_;
  fVar206 = auVar282._8_4_;
  fVar251 = auVar282._12_4_;
  auVar186._0_4_ = fVar255 * auVar165._0_4_ + fVar253 * auVar172._0_4_ + fVar229 * auVar41._0_4_;
  auVar186._4_4_ = fVar249 * auVar165._4_4_ + fVar256 * auVar172._4_4_ + fVar248 * auVar41._4_4_;
  auVar186._8_4_ = fVar206 * auVar165._8_4_ + fVar258 * auVar172._8_4_ + fVar247 * auVar41._8_4_;
  auVar186._12_4_ = fVar251 * auVar165._12_4_ + fVar270 * auVar172._12_4_ + fVar250 * auVar41._12_4_
  ;
  auVar186._16_4_ = fVar255 * auVar165._16_4_ + fVar253 * auVar172._16_4_ + fVar229 * auVar41._16_4_
  ;
  auVar186._20_4_ = fVar249 * auVar165._20_4_ + fVar256 * auVar172._20_4_ + fVar248 * auVar41._20_4_
  ;
  auVar186._24_4_ = fVar206 * auVar165._24_4_ + fVar258 * auVar172._24_4_ + fVar247 * auVar41._24_4_
  ;
  auVar186._28_4_ = auVar165._28_4_ + fVar227;
  auVar157._0_4_ = fVar255 * auVar42._0_4_ + auVar44._0_4_ * fVar229 + fVar253 * auVar43._0_4_;
  auVar157._4_4_ = fVar249 * auVar42._4_4_ + auVar44._4_4_ * fVar248 + fVar256 * auVar43._4_4_;
  auVar157._8_4_ = fVar206 * auVar42._8_4_ + auVar44._8_4_ * fVar247 + fVar258 * auVar43._8_4_;
  auVar157._12_4_ = fVar251 * auVar42._12_4_ + auVar44._12_4_ * fVar250 + fVar270 * auVar43._12_4_;
  auVar157._16_4_ = fVar255 * auVar42._16_4_ + auVar44._16_4_ * fVar229 + fVar253 * auVar43._16_4_;
  auVar157._20_4_ = fVar249 * auVar42._20_4_ + auVar44._20_4_ * fVar248 + fVar256 * auVar43._20_4_;
  auVar157._24_4_ = fVar206 * auVar42._24_4_ + auVar44._24_4_ * fVar247 + fVar258 * auVar43._24_4_;
  auVar157._28_4_ = auVar165._28_4_ + auVar44._28_4_ + auVar41._28_4_;
  auVar321._8_4_ = 0x7fffffff;
  auVar321._0_8_ = 0x7fffffff7fffffff;
  auVar321._12_4_ = 0x7fffffff;
  auVar321._16_4_ = 0x7fffffff;
  auVar321._20_4_ = 0x7fffffff;
  auVar321._24_4_ = 0x7fffffff;
  auVar321._28_4_ = 0x7fffffff;
  auVar238._8_4_ = 0x219392ef;
  auVar238._0_8_ = 0x219392ef219392ef;
  auVar238._12_4_ = 0x219392ef;
  auVar238._16_4_ = 0x219392ef;
  auVar238._20_4_ = 0x219392ef;
  auVar238._24_4_ = 0x219392ef;
  auVar238._28_4_ = 0x219392ef;
  auVar165 = vandps_avx(auVar375,auVar321);
  auVar165 = vcmpps_avx(auVar165,auVar238,1);
  auVar172 = vblendvps_avx(auVar375,auVar238,auVar165);
  auVar165 = vandps_avx(auVar364,auVar321);
  auVar165 = vcmpps_avx(auVar165,auVar238,1);
  auVar41 = vblendvps_avx(auVar364,auVar238,auVar165);
  auVar165 = vandps_avx(auVar321,auVar283);
  auVar165 = vcmpps_avx(auVar165,auVar238,1);
  auVar165 = vblendvps_avx(auVar283,auVar238,auVar165);
  auVar219._0_4_ = fVar255 * auVar342._0_4_ + fVar253 * auVar45._0_4_ + auVar46._0_4_ * fVar229;
  auVar219._4_4_ = fVar249 * auVar342._4_4_ + fVar256 * auVar45._4_4_ + auVar46._4_4_ * fVar248;
  auVar219._8_4_ = fVar206 * auVar342._8_4_ + fVar258 * auVar45._8_4_ + auVar46._8_4_ * fVar247;
  auVar219._12_4_ = fVar251 * auVar342._12_4_ + fVar270 * auVar45._12_4_ + auVar46._12_4_ * fVar250;
  auVar219._16_4_ = fVar255 * auVar342._16_4_ + fVar253 * auVar45._16_4_ + auVar46._16_4_ * fVar229;
  auVar219._20_4_ = fVar249 * auVar342._20_4_ + fVar256 * auVar45._20_4_ + auVar46._20_4_ * fVar248;
  auVar219._24_4_ = fVar206 * auVar342._24_4_ + fVar258 * auVar45._24_4_ + auVar46._24_4_ * fVar247;
  auVar219._28_4_ = fVar227 + auVar43._28_4_ + fVar250;
  auVar42 = vrcpps_avx(auVar172);
  fVar229 = auVar42._0_4_;
  fVar247 = auVar42._4_4_;
  auVar43._4_4_ = auVar172._4_4_ * fVar247;
  auVar43._0_4_ = auVar172._0_4_ * fVar229;
  fVar227 = auVar42._8_4_;
  auVar43._8_4_ = auVar172._8_4_ * fVar227;
  fVar249 = auVar42._12_4_;
  auVar43._12_4_ = auVar172._12_4_ * fVar249;
  fVar251 = auVar42._16_4_;
  auVar43._16_4_ = auVar172._16_4_ * fVar251;
  fVar253 = auVar42._20_4_;
  auVar43._20_4_ = auVar172._20_4_ * fVar253;
  fVar256 = auVar42._24_4_;
  auVar43._24_4_ = auVar172._24_4_ * fVar256;
  auVar43._28_4_ = auVar172._28_4_;
  auVar322._8_4_ = 0x3f800000;
  auVar322._0_8_ = 0x3f8000003f800000;
  auVar322._12_4_ = 0x3f800000;
  auVar322._16_4_ = 0x3f800000;
  auVar322._20_4_ = 0x3f800000;
  auVar322._24_4_ = 0x3f800000;
  auVar322._28_4_ = 0x3f800000;
  auVar44 = vsubps_avx(auVar322,auVar43);
  auVar43 = vrcpps_avx(auVar41);
  fVar229 = fVar229 + fVar229 * auVar44._0_4_;
  fVar247 = fVar247 + fVar247 * auVar44._4_4_;
  fVar227 = fVar227 + fVar227 * auVar44._8_4_;
  fVar249 = fVar249 + fVar249 * auVar44._12_4_;
  fVar251 = fVar251 + fVar251 * auVar44._16_4_;
  fVar253 = fVar253 + fVar253 * auVar44._20_4_;
  fVar256 = fVar256 + fVar256 * auVar44._24_4_;
  fVar258 = auVar43._0_4_;
  fVar270 = auVar43._4_4_;
  auVar172._4_4_ = fVar270 * auVar41._4_4_;
  auVar172._0_4_ = fVar258 * auVar41._0_4_;
  fVar273 = auVar43._8_4_;
  auVar172._8_4_ = fVar273 * auVar41._8_4_;
  fVar275 = auVar43._12_4_;
  auVar172._12_4_ = fVar275 * auVar41._12_4_;
  fVar277 = auVar43._16_4_;
  auVar172._16_4_ = fVar277 * auVar41._16_4_;
  fVar278 = auVar43._20_4_;
  auVar172._20_4_ = fVar278 * auVar41._20_4_;
  fVar279 = auVar43._24_4_;
  auVar172._24_4_ = fVar279 * auVar41._24_4_;
  auVar172._28_4_ = auVar44._28_4_;
  auVar41 = vsubps_avx(auVar322,auVar172);
  fVar258 = fVar258 + fVar258 * auVar41._0_4_;
  fVar270 = fVar270 + fVar270 * auVar41._4_4_;
  fVar273 = fVar273 + fVar273 * auVar41._8_4_;
  fVar275 = fVar275 + fVar275 * auVar41._12_4_;
  fVar277 = fVar277 + fVar277 * auVar41._16_4_;
  fVar278 = fVar278 + fVar278 * auVar41._20_4_;
  fVar279 = fVar279 + fVar279 * auVar41._24_4_;
  auVar172 = vrcpps_avx(auVar165);
  fVar280 = auVar172._0_4_;
  fVar288 = auVar172._4_4_;
  auVar342._4_4_ = fVar288 * auVar165._4_4_;
  auVar342._0_4_ = fVar280 * auVar165._0_4_;
  fVar289 = auVar172._8_4_;
  auVar342._8_4_ = fVar289 * auVar165._8_4_;
  fVar290 = auVar172._12_4_;
  auVar342._12_4_ = fVar290 * auVar165._12_4_;
  fVar291 = auVar172._16_4_;
  auVar342._16_4_ = fVar291 * auVar165._16_4_;
  fVar292 = auVar172._20_4_;
  auVar342._20_4_ = fVar292 * auVar165._20_4_;
  fVar293 = auVar172._24_4_;
  auVar342._24_4_ = fVar293 * auVar165._24_4_;
  auVar342._28_4_ = auVar165._28_4_;
  auVar165 = vsubps_avx(auVar322,auVar342);
  fVar280 = fVar280 + fVar280 * auVar165._0_4_;
  fVar288 = fVar288 + fVar288 * auVar165._4_4_;
  fVar289 = fVar289 + fVar289 * auVar165._8_4_;
  fVar290 = fVar290 + fVar290 * auVar165._12_4_;
  fVar291 = fVar291 + fVar291 * auVar165._16_4_;
  fVar292 = fVar292 + fVar292 * auVar165._20_4_;
  fVar293 = fVar293 + fVar293 * auVar165._24_4_;
  auVar282 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar147 + 0x16)) *
                           *(float *)(prim + lVar147 + 0x1a)));
  auVar234 = vshufps_avx(auVar282,auVar282,0);
  auVar282._8_8_ = 0;
  auVar282._0_8_ = *(ulong *)(prim + uVar144 * 7 + 6);
  auVar282 = vpmovsxwd_avx(auVar282);
  auVar214._8_8_ = 0;
  auVar214._0_8_ = *(ulong *)(prim + uVar144 * 7 + 0xe);
  auVar214 = vpmovsxwd_avx(auVar214);
  auVar310._16_16_ = auVar214;
  auVar310._0_16_ = auVar282;
  auVar165 = vcvtdq2ps_avx(auVar310);
  auVar212._8_8_ = 0;
  auVar212._0_8_ = *(ulong *)(prim + uVar144 * 0xb + 6);
  auVar282 = vpmovsxwd_avx(auVar212);
  auVar235._8_8_ = 0;
  auVar235._0_8_ = *(ulong *)(prim + uVar144 * 0xb + 0xe);
  auVar214 = vpmovsxwd_avx(auVar235);
  auVar323._16_16_ = auVar214;
  auVar323._0_16_ = auVar282;
  auVar172 = vcvtdq2ps_avx(auVar323);
  auVar172 = vsubps_avx(auVar172,auVar165);
  fVar248 = auVar234._0_4_;
  fVar250 = auVar234._4_4_;
  fVar255 = auVar234._8_4_;
  fVar206 = auVar234._12_4_;
  auVar234._8_8_ = 0;
  auVar234._0_8_ = *(ulong *)(prim + uVar144 * 9 + 6);
  auVar282 = vpmovsxwd_avx(auVar234);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar144 * 9 + 0xe);
  auVar214 = vpmovsxwd_avx(auVar13);
  auVar311._0_4_ = auVar172._0_4_ * fVar248 + auVar165._0_4_;
  auVar311._4_4_ = auVar172._4_4_ * fVar250 + auVar165._4_4_;
  auVar311._8_4_ = auVar172._8_4_ * fVar255 + auVar165._8_4_;
  auVar311._12_4_ = auVar172._12_4_ * fVar206 + auVar165._12_4_;
  auVar311._16_4_ = auVar172._16_4_ * fVar248 + auVar165._16_4_;
  auVar311._20_4_ = auVar172._20_4_ * fVar250 + auVar165._20_4_;
  auVar311._24_4_ = auVar172._24_4_ * fVar255 + auVar165._24_4_;
  auVar311._28_4_ = auVar172._28_4_ + auVar165._28_4_;
  auVar324._16_16_ = auVar214;
  auVar324._0_16_ = auVar282;
  auVar165 = vcvtdq2ps_avx(auVar324);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar144 * 0xd + 6);
  auVar282 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar144 * 0xd + 0xe);
  auVar214 = vpmovsxwd_avx(auVar15);
  auVar338._16_16_ = auVar214;
  auVar338._0_16_ = auVar282;
  auVar172 = vcvtdq2ps_avx(auVar338);
  auVar172 = vsubps_avx(auVar172,auVar165);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar144 * 0x12 + 6);
  auVar282 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar144 * 0x12 + 0xe);
  auVar214 = vpmovsxwd_avx(auVar17);
  auVar325._0_4_ = auVar165._0_4_ + auVar172._0_4_ * fVar248;
  auVar325._4_4_ = auVar165._4_4_ + auVar172._4_4_ * fVar250;
  auVar325._8_4_ = auVar165._8_4_ + auVar172._8_4_ * fVar255;
  auVar325._12_4_ = auVar165._12_4_ + auVar172._12_4_ * fVar206;
  auVar325._16_4_ = auVar165._16_4_ + auVar172._16_4_ * fVar248;
  auVar325._20_4_ = auVar165._20_4_ + auVar172._20_4_ * fVar250;
  auVar325._24_4_ = auVar165._24_4_ + auVar172._24_4_ * fVar255;
  auVar325._28_4_ = auVar165._28_4_ + auVar172._28_4_;
  auVar339._16_16_ = auVar214;
  auVar339._0_16_ = auVar282;
  auVar165 = vcvtdq2ps_avx(auVar339);
  uVar145 = (ulong)(uint)((int)lVar151 << 2);
  lVar147 = uVar144 * 2 + uVar145;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + lVar147 + 6);
  auVar282 = vpmovsxwd_avx(auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + lVar147 + 0xe);
  auVar214 = vpmovsxwd_avx(auVar19);
  auVar350._16_16_ = auVar214;
  auVar350._0_16_ = auVar282;
  auVar172 = vcvtdq2ps_avx(auVar350);
  auVar172 = vsubps_avx(auVar172,auVar165);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar145 + 6);
  auVar282 = vpmovsxwd_avx(auVar20);
  auVar340._0_4_ = auVar165._0_4_ + auVar172._0_4_ * fVar248;
  auVar340._4_4_ = auVar165._4_4_ + auVar172._4_4_ * fVar250;
  auVar340._8_4_ = auVar165._8_4_ + auVar172._8_4_ * fVar255;
  auVar340._12_4_ = auVar165._12_4_ + auVar172._12_4_ * fVar206;
  auVar340._16_4_ = auVar165._16_4_ + auVar172._16_4_ * fVar248;
  auVar340._20_4_ = auVar165._20_4_ + auVar172._20_4_ * fVar250;
  auVar340._24_4_ = auVar165._24_4_ + auVar172._24_4_ * fVar255;
  auVar340._28_4_ = auVar165._28_4_ + auVar172._28_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar145 + 0xe);
  auVar214 = vpmovsxwd_avx(auVar21);
  auVar351._16_16_ = auVar214;
  auVar351._0_16_ = auVar282;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar144 * 0x18 + 6);
  auVar282 = vpmovsxwd_avx(auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar144 * 0x18 + 0xe);
  auVar214 = vpmovsxwd_avx(auVar23);
  auVar165 = vcvtdq2ps_avx(auVar351);
  auVar365._16_16_ = auVar214;
  auVar365._0_16_ = auVar282;
  auVar172 = vcvtdq2ps_avx(auVar365);
  auVar172 = vsubps_avx(auVar172,auVar165);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar144 * 0x1d + 6);
  auVar282 = vpmovsxwd_avx(auVar24);
  auVar352._0_4_ = auVar165._0_4_ + auVar172._0_4_ * fVar248;
  auVar352._4_4_ = auVar165._4_4_ + auVar172._4_4_ * fVar250;
  auVar352._8_4_ = auVar165._8_4_ + auVar172._8_4_ * fVar255;
  auVar352._12_4_ = auVar165._12_4_ + auVar172._12_4_ * fVar206;
  auVar352._16_4_ = auVar165._16_4_ + auVar172._16_4_ * fVar248;
  auVar352._20_4_ = auVar165._20_4_ + auVar172._20_4_ * fVar250;
  auVar352._24_4_ = auVar165._24_4_ + auVar172._24_4_ * fVar255;
  auVar352._28_4_ = auVar165._28_4_ + auVar172._28_4_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar144 * 0x1d + 0xe);
  auVar214 = vpmovsxwd_avx(auVar25);
  auVar366._16_16_ = auVar214;
  auVar366._0_16_ = auVar282;
  auVar165 = vcvtdq2ps_avx(auVar366);
  lVar147 = uVar144 + (ulong)(byte)PVar32 * 0x20;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + lVar147 + 6);
  auVar282 = vpmovsxwd_avx(auVar26);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + lVar147 + 0xe);
  auVar214 = vpmovsxwd_avx(auVar27);
  auVar376._16_16_ = auVar214;
  auVar376._0_16_ = auVar282;
  auVar172 = vcvtdq2ps_avx(auVar376);
  auVar172 = vsubps_avx(auVar172,auVar165);
  auVar367._0_4_ = auVar165._0_4_ + auVar172._0_4_ * fVar248;
  auVar367._4_4_ = auVar165._4_4_ + auVar172._4_4_ * fVar250;
  auVar367._8_4_ = auVar165._8_4_ + auVar172._8_4_ * fVar255;
  auVar367._12_4_ = auVar165._12_4_ + auVar172._12_4_ * fVar206;
  auVar367._16_4_ = auVar165._16_4_ + auVar172._16_4_ * fVar248;
  auVar367._20_4_ = auVar165._20_4_ + auVar172._20_4_ * fVar250;
  auVar367._24_4_ = auVar165._24_4_ + auVar172._24_4_ * fVar255;
  auVar367._28_4_ = auVar165._28_4_ + auVar172._28_4_;
  lVar147 = (ulong)(byte)PVar32 * 0x20 - uVar144;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + lVar147 + 6);
  auVar282 = vpmovsxwd_avx(auVar28);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + lVar147 + 0xe);
  auVar214 = vpmovsxwd_avx(auVar29);
  auVar377._16_16_ = auVar214;
  auVar377._0_16_ = auVar282;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar144 * 0x23 + 6);
  auVar282 = vpmovsxwd_avx(auVar30);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(prim + uVar144 * 0x23 + 0xe);
  auVar214 = vpmovsxwd_avx(auVar31);
  auVar386._16_16_ = auVar214;
  auVar386._0_16_ = auVar282;
  auVar165 = vcvtdq2ps_avx(auVar377);
  auVar172 = vcvtdq2ps_avx(auVar386);
  auVar172 = vsubps_avx(auVar172,auVar165);
  auVar378._0_4_ = auVar165._0_4_ + auVar172._0_4_ * fVar248;
  auVar378._4_4_ = auVar165._4_4_ + auVar172._4_4_ * fVar250;
  auVar378._8_4_ = auVar165._8_4_ + auVar172._8_4_ * fVar255;
  auVar378._12_4_ = auVar165._12_4_ + auVar172._12_4_ * fVar206;
  auVar378._16_4_ = auVar165._16_4_ + auVar172._16_4_ * fVar248;
  auVar378._20_4_ = auVar165._20_4_ + auVar172._20_4_ * fVar250;
  auVar378._24_4_ = auVar165._24_4_ + auVar172._24_4_ * fVar255;
  auVar378._28_4_ = auVar165._28_4_ + fVar206;
  auVar165 = vsubps_avx(auVar311,auVar186);
  auVar296._0_4_ = fVar229 * auVar165._0_4_;
  auVar296._4_4_ = fVar247 * auVar165._4_4_;
  auVar296._8_4_ = fVar227 * auVar165._8_4_;
  auVar296._12_4_ = fVar249 * auVar165._12_4_;
  auVar45._16_4_ = fVar251 * auVar165._16_4_;
  auVar45._0_16_ = auVar296;
  auVar45._20_4_ = fVar253 * auVar165._20_4_;
  auVar45._24_4_ = fVar256 * auVar165._24_4_;
  auVar45._28_4_ = auVar165._28_4_;
  auVar165 = vsubps_avx(auVar325,auVar186);
  auVar231._0_4_ = fVar229 * auVar165._0_4_;
  auVar231._4_4_ = fVar247 * auVar165._4_4_;
  auVar231._8_4_ = fVar227 * auVar165._8_4_;
  auVar231._12_4_ = fVar249 * auVar165._12_4_;
  auVar46._16_4_ = fVar251 * auVar165._16_4_;
  auVar46._0_16_ = auVar231;
  auVar46._20_4_ = fVar253 * auVar165._20_4_;
  auVar46._24_4_ = fVar256 * auVar165._24_4_;
  auVar46._28_4_ = auVar42._28_4_ + auVar44._28_4_;
  auVar165 = vsubps_avx(auVar340,auVar157);
  auVar182._0_4_ = fVar258 * auVar165._0_4_;
  auVar182._4_4_ = fVar270 * auVar165._4_4_;
  auVar182._8_4_ = fVar273 * auVar165._8_4_;
  auVar182._12_4_ = fVar275 * auVar165._12_4_;
  auVar42._16_4_ = fVar277 * auVar165._16_4_;
  auVar42._0_16_ = auVar182;
  auVar42._20_4_ = fVar278 * auVar165._20_4_;
  auVar42._24_4_ = fVar279 * auVar165._24_4_;
  auVar42._28_4_ = auVar165._28_4_;
  auVar165 = vsubps_avx(auVar352,auVar157);
  auVar261._0_4_ = fVar258 * auVar165._0_4_;
  auVar261._4_4_ = fVar270 * auVar165._4_4_;
  auVar261._8_4_ = fVar273 * auVar165._8_4_;
  auVar261._12_4_ = fVar275 * auVar165._12_4_;
  auVar44._16_4_ = fVar277 * auVar165._16_4_;
  auVar44._0_16_ = auVar261;
  auVar44._20_4_ = fVar278 * auVar165._20_4_;
  auVar44._24_4_ = fVar279 * auVar165._24_4_;
  auVar44._28_4_ = auVar43._28_4_ + auVar41._28_4_;
  auVar165 = vsubps_avx(auVar367,auVar219);
  auVar153._0_4_ = fVar280 * auVar165._0_4_;
  auVar153._4_4_ = fVar288 * auVar165._4_4_;
  auVar153._8_4_ = fVar289 * auVar165._8_4_;
  auVar153._12_4_ = fVar290 * auVar165._12_4_;
  auVar41._16_4_ = fVar291 * auVar165._16_4_;
  auVar41._0_16_ = auVar153;
  auVar41._20_4_ = fVar292 * auVar165._20_4_;
  auVar41._24_4_ = fVar293 * auVar165._24_4_;
  auVar41._28_4_ = auVar165._28_4_;
  auVar165 = vsubps_avx(auVar378,auVar219);
  auVar210._0_4_ = fVar280 * auVar165._0_4_;
  auVar210._4_4_ = fVar288 * auVar165._4_4_;
  auVar210._8_4_ = fVar289 * auVar165._8_4_;
  auVar210._12_4_ = fVar290 * auVar165._12_4_;
  auVar47._16_4_ = fVar291 * auVar165._16_4_;
  auVar47._0_16_ = auVar210;
  auVar47._20_4_ = fVar292 * auVar165._20_4_;
  auVar47._24_4_ = fVar293 * auVar165._24_4_;
  auVar47._28_4_ = auVar165._28_4_;
  auVar282 = vpminsd_avx(auVar45._16_16_,auVar46._16_16_);
  auVar214 = vpminsd_avx(auVar296,auVar231);
  auVar326._16_16_ = auVar282;
  auVar326._0_16_ = auVar214;
  auVar282 = vpminsd_avx(auVar42._16_16_,auVar44._16_16_);
  auVar214 = vpminsd_avx(auVar182,auVar261);
  auVar368._16_16_ = auVar282;
  auVar368._0_16_ = auVar214;
  auVar165 = vmaxps_avx(auVar326,auVar368);
  auVar282 = vpminsd_avx(auVar41._16_16_,auVar47._16_16_);
  auVar214 = vpminsd_avx(auVar153,auVar210);
  auVar387._16_16_ = auVar282;
  auVar387._0_16_ = auVar214;
  uVar12 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar398._4_4_ = uVar12;
  auVar398._0_4_ = uVar12;
  auVar398._8_4_ = uVar12;
  auVar398._12_4_ = uVar12;
  auVar398._16_4_ = uVar12;
  auVar398._20_4_ = uVar12;
  auVar398._24_4_ = uVar12;
  auVar398._28_4_ = uVar12;
  auVar172 = vmaxps_avx(auVar387,auVar398);
  auVar165 = vmaxps_avx(auVar165,auVar172);
  local_80._4_4_ = auVar165._4_4_ * 0.99999964;
  local_80._0_4_ = auVar165._0_4_ * 0.99999964;
  local_80._8_4_ = auVar165._8_4_ * 0.99999964;
  local_80._12_4_ = auVar165._12_4_ * 0.99999964;
  local_80._16_4_ = auVar165._16_4_ * 0.99999964;
  local_80._20_4_ = auVar165._20_4_ * 0.99999964;
  local_80._24_4_ = auVar165._24_4_ * 0.99999964;
  local_80._28_4_ = auVar165._28_4_;
  auVar282 = vpmaxsd_avx(auVar45._16_16_,auVar46._16_16_);
  auVar214 = vpmaxsd_avx(auVar296,auVar231);
  auVar239._16_16_ = auVar282;
  auVar239._0_16_ = auVar214;
  auVar282 = vpmaxsd_avx(auVar42._16_16_,auVar44._16_16_);
  auVar214 = vpmaxsd_avx(auVar182,auVar261);
  auVar187._16_16_ = auVar282;
  auVar187._0_16_ = auVar214;
  auVar165 = vminps_avx(auVar239,auVar187);
  auVar282 = vpmaxsd_avx(auVar41._16_16_,auVar47._16_16_);
  auVar214 = vpmaxsd_avx(auVar153,auVar210);
  uVar12 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar220._4_4_ = uVar12;
  auVar220._0_4_ = uVar12;
  auVar220._8_4_ = uVar12;
  auVar220._12_4_ = uVar12;
  auVar220._16_4_ = uVar12;
  auVar220._20_4_ = uVar12;
  auVar220._24_4_ = uVar12;
  auVar220._28_4_ = uVar12;
  auVar158._16_16_ = auVar282;
  auVar158._0_16_ = auVar214;
  auVar172 = vminps_avx(auVar158,auVar220);
  auVar165 = vminps_avx(auVar165,auVar172);
  auVar40._4_4_ = auVar165._4_4_ * 1.0000004;
  auVar40._0_4_ = auVar165._0_4_ * 1.0000004;
  auVar40._8_4_ = auVar165._8_4_ * 1.0000004;
  auVar40._12_4_ = auVar165._12_4_ * 1.0000004;
  auVar40._16_4_ = auVar165._16_4_ * 1.0000004;
  auVar40._20_4_ = auVar165._20_4_ * 1.0000004;
  auVar40._24_4_ = auVar165._24_4_ * 1.0000004;
  auVar40._28_4_ = auVar165._28_4_;
  auVar165 = vcmpps_avx(local_80,auVar40,2);
  auVar282 = vpshufd_avx(ZEXT116((byte)PVar32),0);
  auVar188._16_16_ = auVar282;
  auVar188._0_16_ = auVar282;
  auVar172 = vcvtdq2ps_avx(auVar188);
  auVar172 = vcmpps_avx(_DAT_01faff40,auVar172,1);
  auVar165 = vandps_avx(auVar165,auVar172);
  uVar142 = vmovmskps_avx(auVar165);
  if (uVar142 != 0) {
    uVar142 = uVar142 & 0xff;
    local_670 = pre->ray_space + k;
    local_660 = mm_lookupmask_ps._16_8_;
    uStack_658 = mm_lookupmask_ps._24_8_;
    uStack_650 = mm_lookupmask_ps._16_8_;
    uStack_648 = mm_lookupmask_ps._24_8_;
    uVar146 = 1 << ((byte)k & 0x1f);
    local_748 = (undefined1 (*) [32])&local_1a0;
    local_750 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar146 & 0xf) << 4));
    local_758 = mm_lookupmask_ps + (long)((int)uVar146 >> 4) * 0x10;
    local_668 = prim;
    do {
      lVar147 = 0;
      if (uVar142 != 0) {
        for (; (uVar142 >> lVar147 & 1) == 0; lVar147 = lVar147 + 1) {
        }
      }
      uVar146 = *(uint *)(local_668 + 2);
      uVar33 = *(uint *)(local_668 + lVar147 * 4 + 6);
      pGVar36 = (context->scene->geometries).items[uVar146].ptr;
      uVar144 = (ulong)*(uint *)(*(long *)&pGVar36->field_0x58 +
                                (ulong)uVar33 *
                                pGVar36[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar229 = (pGVar36->time_range).lower;
      fVar229 = pGVar36->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar229) /
                ((pGVar36->time_range).upper - fVar229));
      auVar282 = vroundss_avx(ZEXT416((uint)fVar229),ZEXT416((uint)fVar229),9);
      auVar282 = vminss_avx(auVar282,ZEXT416((uint)(pGVar36->fnumTimeSegments + -1.0)));
      auVar282 = vmaxss_avx(ZEXT816(0) << 0x20,auVar282);
      fVar229 = fVar229 - auVar282._0_4_;
      _Var37 = pGVar36[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar149 = (long)(int)auVar282._0_4_ * 0x38;
      lVar147 = *(long *)(_Var37 + 0x10 + lVar149);
      lVar151 = *(long *)(_Var37 + 0x38 + lVar149);
      lVar148 = *(long *)(_Var37 + 0x48 + lVar149);
      auVar282 = vshufps_avx(ZEXT416((uint)fVar229),ZEXT416((uint)fVar229),0);
      pfVar1 = (float *)(lVar151 + uVar144 * lVar148);
      fVar248 = auVar282._0_4_;
      fVar247 = auVar282._4_4_;
      fVar250 = auVar282._8_4_;
      fVar227 = auVar282._12_4_;
      pfVar2 = (float *)(lVar151 + (uVar144 + 1) * lVar148);
      pfVar3 = (float *)(lVar151 + (uVar144 + 2) * lVar148);
      pfVar4 = (float *)(lVar151 + lVar148 * (uVar144 + 3));
      lVar151 = *(long *)(_Var37 + lVar149);
      auVar282 = vshufps_avx(ZEXT416((uint)(1.0 - fVar229)),ZEXT416((uint)(1.0 - fVar229)),0);
      pfVar5 = (float *)(lVar151 + lVar147 * uVar144);
      fVar229 = auVar282._0_4_;
      fVar255 = auVar282._4_4_;
      fVar249 = auVar282._8_4_;
      fVar206 = auVar282._12_4_;
      pfVar6 = (float *)(lVar151 + lVar147 * (uVar144 + 1));
      pfVar7 = (float *)(lVar151 + lVar147 * (uVar144 + 2));
      pfVar8 = (float *)(lVar151 + lVar147 * (uVar144 + 3));
      uVar34 = (uint)pGVar36[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar147 = (long)(int)uVar34 * 0x44;
      fVar259 = fVar248 * *pfVar1 + fVar229 * *pfVar5;
      fVar271 = fVar247 * pfVar1[1] + fVar255 * pfVar5[1];
      auVar262._0_8_ = CONCAT44(fVar271,fVar259);
      auVar262._8_4_ = fVar250 * pfVar1[2] + fVar249 * pfVar5[2];
      auVar262._12_4_ = fVar227 * pfVar1[3] + fVar206 * pfVar5[3];
      fVar395 = fVar229 * *pfVar6 + fVar248 * *pfVar2;
      fVar401 = fVar255 * pfVar6[1] + fVar247 * pfVar2[1];
      auVar397._0_8_ = CONCAT44(fVar401,fVar395);
      auVar397._8_4_ = fVar249 * pfVar6[2] + fVar250 * pfVar2[2];
      auVar397._12_4_ = fVar206 * pfVar6[3] + fVar227 * pfVar2[3];
      fVar405 = fVar229 * *pfVar7 + fVar248 * *pfVar3;
      fVar409 = fVar255 * pfVar7[1] + fVar247 * pfVar3[1];
      auVar406._0_8_ = CONCAT44(fVar409,fVar405);
      auVar406._8_4_ = fVar249 * pfVar7[2] + fVar250 * pfVar3[2];
      auVar406._12_4_ = fVar206 * pfVar7[3] + fVar227 * pfVar3[3];
      fVar373 = fVar229 * *pfVar8 + fVar248 * *pfVar4;
      fVar384 = fVar255 * pfVar8[1] + fVar247 * pfVar4[1];
      auVar374._0_8_ = CONCAT44(fVar384,fVar373);
      auVar374._8_4_ = fVar249 * pfVar8[2] + fVar250 * pfVar4[2];
      auVar374._12_4_ = fVar206 * pfVar8[3] + fVar227 * pfVar4[3];
      auVar282 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar235 = vinsertps_avx(auVar282,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar212 = vsubps_avx(auVar262,auVar235);
      auVar282 = vshufps_avx(auVar212,auVar212,0);
      auVar214 = vshufps_avx(auVar212,auVar212,0x55);
      auVar212 = vshufps_avx(auVar212,auVar212,0xaa);
      fVar229 = (local_670->vx).field_0.m128[0];
      fVar248 = (local_670->vx).field_0.m128[1];
      fVar247 = (local_670->vx).field_0.m128[2];
      fVar250 = (local_670->vx).field_0.m128[3];
      fVar227 = (local_670->vy).field_0.m128[0];
      fVar255 = (local_670->vy).field_0.m128[1];
      fVar249 = (local_670->vy).field_0.m128[2];
      fVar206 = (local_670->vy).field_0.m128[3];
      fVar251 = (local_670->vz).field_0.m128[0];
      fVar253 = (local_670->vz).field_0.m128[1];
      fVar256 = (local_670->vz).field_0.m128[2];
      fVar258 = (local_670->vz).field_0.m128[3];
      auVar232._0_4_ =
           auVar282._0_4_ * fVar229 + auVar214._0_4_ * fVar227 + fVar251 * auVar212._0_4_;
      auVar232._4_4_ =
           auVar282._4_4_ * fVar248 + auVar214._4_4_ * fVar255 + fVar253 * auVar212._4_4_;
      auVar232._8_4_ =
           auVar282._8_4_ * fVar247 + auVar214._8_4_ * fVar249 + fVar256 * auVar212._8_4_;
      auVar232._12_4_ =
           auVar282._12_4_ * fVar250 + auVar214._12_4_ * fVar206 + fVar258 * auVar212._12_4_;
      auVar282 = vblendps_avx(auVar232,auVar262,8);
      auVar234 = vsubps_avx(auVar397,auVar235);
      auVar214 = vshufps_avx(auVar234,auVar234,0);
      auVar212 = vshufps_avx(auVar234,auVar234,0x55);
      auVar234 = vshufps_avx(auVar234,auVar234,0xaa);
      auVar307._0_4_ =
           auVar214._0_4_ * fVar229 + auVar212._0_4_ * fVar227 + fVar251 * auVar234._0_4_;
      auVar307._4_4_ =
           auVar214._4_4_ * fVar248 + auVar212._4_4_ * fVar255 + fVar253 * auVar234._4_4_;
      auVar307._8_4_ =
           auVar214._8_4_ * fVar247 + auVar212._8_4_ * fVar249 + fVar256 * auVar234._8_4_;
      auVar307._12_4_ =
           auVar214._12_4_ * fVar250 + auVar212._12_4_ * fVar206 + fVar258 * auVar234._12_4_;
      auVar214 = vblendps_avx(auVar307,auVar397,8);
      auVar13 = vsubps_avx(auVar406,auVar235);
      auVar212 = vshufps_avx(auVar13,auVar13,0);
      auVar234 = vshufps_avx(auVar13,auVar13,0x55);
      auVar13 = vshufps_avx(auVar13,auVar13,0xaa);
      auVar320._0_4_ = auVar212._0_4_ * fVar229 + auVar234._0_4_ * fVar227 + auVar13._0_4_ * fVar251
      ;
      auVar320._4_4_ = auVar212._4_4_ * fVar248 + auVar234._4_4_ * fVar255 + auVar13._4_4_ * fVar253
      ;
      auVar320._8_4_ = auVar212._8_4_ * fVar247 + auVar234._8_4_ * fVar249 + auVar13._8_4_ * fVar256
      ;
      auVar320._12_4_ =
           auVar212._12_4_ * fVar250 + auVar234._12_4_ * fVar206 + auVar13._12_4_ * fVar258;
      auVar212 = vblendps_avx(auVar320,auVar406,8);
      auVar13 = vsubps_avx(auVar374,auVar235);
      auVar235 = vshufps_avx(auVar13,auVar13,0);
      auVar234 = vshufps_avx(auVar13,auVar13,0x55);
      auVar13 = vshufps_avx(auVar13,auVar13,0xaa);
      auVar183._0_4_ = auVar235._0_4_ * fVar229 + auVar234._0_4_ * fVar227 + fVar251 * auVar13._0_4_
      ;
      auVar183._4_4_ = auVar235._4_4_ * fVar248 + auVar234._4_4_ * fVar255 + fVar253 * auVar13._4_4_
      ;
      auVar183._8_4_ = auVar235._8_4_ * fVar247 + auVar234._8_4_ * fVar249 + fVar256 * auVar13._8_4_
      ;
      auVar183._12_4_ =
           auVar235._12_4_ * fVar250 + auVar234._12_4_ * fVar206 + fVar258 * auVar13._12_4_;
      auVar235 = vblendps_avx(auVar183,auVar374,8);
      auVar263._8_4_ = 0x7fffffff;
      auVar263._0_8_ = 0x7fffffff7fffffff;
      auVar263._12_4_ = 0x7fffffff;
      auVar282 = vandps_avx(auVar282,auVar263);
      auVar214 = vandps_avx(auVar214,auVar263);
      auVar234 = vmaxps_avx(auVar282,auVar214);
      auVar282 = vandps_avx(auVar212,auVar263);
      auVar214 = vandps_avx(auVar235,auVar263);
      auVar282 = vmaxps_avx(auVar282,auVar214);
      auVar282 = vmaxps_avx(auVar234,auVar282);
      auVar214 = vmovshdup_avx(auVar282);
      auVar214 = vmaxss_avx(auVar214,auVar282);
      auVar282 = vshufpd_avx(auVar282,auVar282,1);
      auVar282 = vmaxss_avx(auVar282,auVar214);
      fVar290 = *(float *)(bspline_basis0 + lVar147 + 0x908);
      fVar291 = *(float *)(bspline_basis0 + lVar147 + 0x90c);
      fVar292 = *(float *)(bspline_basis0 + lVar147 + 0x910);
      fVar293 = *(float *)(bspline_basis0 + lVar147 + 0x914);
      fVar333 = *(float *)(bspline_basis0 + lVar147 + 0x918);
      fVar334 = *(float *)(bspline_basis0 + lVar147 + 0x91c);
      fVar252 = *(float *)(bspline_basis0 + lVar147 + 0x920);
      auVar214 = vshufps_avx(auVar320,auVar320,0);
      register0x00001250 = auVar214;
      _local_540 = auVar214;
      auVar212 = vshufps_avx(auVar320,auVar320,0x55);
      fVar229 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar147 + 0xd8c);
      fVar248 = *(float *)(bspline_basis0 + lVar147 + 0xd90);
      fVar247 = *(float *)(bspline_basis0 + lVar147 + 0xd94);
      fVar250 = *(float *)(bspline_basis0 + lVar147 + 0xd98);
      fVar227 = *(float *)(bspline_basis0 + lVar147 + 0xd9c);
      fVar255 = *(float *)(bspline_basis0 + lVar147 + 0xda0);
      fVar249 = *(float *)(bspline_basis0 + lVar147 + 0xda4);
      auVar136 = *(undefined1 (*) [28])(bspline_basis0 + lVar147 + 0xd8c);
      auVar235 = vshufps_avx(auVar183,auVar183,0);
      register0x00001210 = auVar235;
      _local_560 = auVar235;
      fVar152 = auVar235._0_4_;
      fVar176 = auVar235._4_4_;
      fVar228 = auVar235._8_4_;
      fVar177 = auVar235._12_4_;
      fVar179 = auVar214._0_4_;
      fVar199 = auVar214._4_4_;
      fVar295 = auVar214._8_4_;
      fVar202 = auVar214._12_4_;
      auVar214 = vshufps_avx(auVar183,auVar183,0x55);
      register0x00001550 = auVar214;
      _local_6c0 = auVar214;
      fVar385 = auVar214._0_4_;
      fVar390 = auVar214._4_4_;
      fVar391 = auVar214._8_4_;
      fVar393 = auVar214._12_4_;
      fVar209 = auVar212._0_4_;
      fVar224 = auVar212._4_4_;
      fVar225 = auVar212._8_4_;
      fVar226 = auVar212._12_4_;
      auVar214 = vshufps_avx(auVar406,auVar406,0xff);
      register0x00001450 = auVar214;
      _local_a0 = auVar214;
      auVar212 = vshufps_avx(auVar374,auVar374,0xff);
      register0x00001390 = auVar212;
      _local_2c0 = auVar212;
      fVar278 = auVar212._0_4_;
      fVar279 = auVar212._4_4_;
      fVar288 = auVar212._8_4_;
      fVar289 = auVar212._12_4_;
      fVar335 = auVar214._0_4_;
      fVar346 = auVar214._4_4_;
      fVar347 = auVar214._8_4_;
      auVar212 = vshufps_avx(auVar307,auVar307,0);
      register0x00001310 = auVar212;
      _local_700 = auVar212;
      pauVar10 = (undefined1 (*) [32])(bspline_basis0 + lVar147 + 0x484);
      fVar206 = *(float *)*pauVar10;
      fVar251 = *(float *)(bspline_basis0 + lVar147 + 0x488);
      fVar253 = *(float *)(bspline_basis0 + lVar147 + 0x48c);
      fVar256 = *(float *)(bspline_basis0 + lVar147 + 0x490);
      fVar258 = *(float *)(bspline_basis0 + lVar147 + 0x494);
      fVar270 = *(float *)(bspline_basis0 + lVar147 + 0x498);
      fVar273 = *(float *)(bspline_basis0 + lVar147 + 0x49c);
      auVar137 = *(undefined1 (*) [28])*pauVar10;
      fVar275 = *(float *)(bspline_basis0 + lVar147 + 0x4a0);
      fVar260 = auVar212._0_4_;
      fVar272 = auVar212._4_4_;
      fVar274 = auVar212._8_4_;
      fVar276 = auVar212._12_4_;
      auVar212 = vshufps_avx(auVar307,auVar307,0x55);
      register0x000015d0 = auVar212;
      _local_720 = auVar212;
      fVar316 = auVar212._0_4_;
      fVar317 = auVar212._4_4_;
      fVar318 = auVar212._8_4_;
      fVar336 = auVar212._12_4_;
      auVar212 = vshufps_avx(auVar397,auVar397,0xff);
      register0x00001590 = auVar212;
      _local_c0 = auVar212;
      fVar392 = auVar212._0_4_;
      fVar394 = auVar212._4_4_;
      fVar396 = auVar212._8_4_;
      fVar402 = auVar212._12_4_;
      auVar212 = vshufps_avx(auVar232,auVar232,0);
      register0x000014d0 = auVar212;
      _local_6e0 = auVar212;
      local_5e0 = *(float *)(bspline_basis0 + lVar147);
      fStack_5dc = *(float *)(bspline_basis0 + lVar147 + 4);
      fStack_5d8 = *(float *)(bspline_basis0 + lVar147 + 8);
      fStack_5d4 = *(float *)(bspline_basis0 + lVar147 + 0xc);
      fStack_5d0 = *(float *)(bspline_basis0 + lVar147 + 0x10);
      fStack_5cc = *(float *)(bspline_basis0 + lVar147 + 0x14);
      fStack_5c8 = *(float *)(bspline_basis0 + lVar147 + 0x18);
      fStack_5c4 = *(float *)(bspline_basis0 + lVar147 + 0x1c);
      fVar363 = auVar212._0_4_;
      fVar370 = auVar212._4_4_;
      fVar371 = auVar212._8_4_;
      fVar372 = auVar212._12_4_;
      auVar312._0_4_ =
           fVar363 * local_5e0 + fVar260 * fVar206 + fVar179 * fVar290 + fVar152 * fVar229;
      auVar312._4_4_ =
           fVar370 * fStack_5dc + fVar272 * fVar251 + fVar199 * fVar291 + fVar176 * fVar248;
      auVar312._8_4_ =
           fVar371 * fStack_5d8 + fVar274 * fVar253 + fVar295 * fVar292 + fVar228 * fVar247;
      auVar312._12_4_ =
           fVar372 * fStack_5d4 + fVar276 * fVar256 + fVar202 * fVar293 + fVar177 * fVar250;
      auVar312._16_4_ =
           fVar363 * fStack_5d0 + fVar260 * fVar258 + fVar179 * fVar333 + fVar152 * fVar227;
      auVar312._20_4_ =
           fVar370 * fStack_5cc + fVar272 * fVar270 + fVar199 * fVar334 + fVar176 * fVar255;
      auVar312._24_4_ =
           fVar371 * fStack_5c8 + fVar274 * fVar273 + fVar295 * fVar252 + fVar228 * fVar249;
      auVar312._28_4_ = fVar275 + fVar202 + fVar177 + 0.0;
      auVar235 = vshufps_avx(auVar232,auVar232,0x55);
      register0x00001410 = auVar235;
      _local_2a0 = auVar235;
      fVar319 = auVar235._0_4_;
      fVar330 = auVar235._4_4_;
      fVar331 = auVar235._8_4_;
      fVar332 = auVar235._12_4_;
      auVar379._0_4_ =
           fVar319 * local_5e0 + fVar316 * fVar206 + fVar209 * fVar290 + fVar385 * fVar229;
      auVar379._4_4_ =
           fVar330 * fStack_5dc + fVar317 * fVar251 + fVar224 * fVar291 + fVar390 * fVar248;
      auVar379._8_4_ =
           fVar331 * fStack_5d8 + fVar318 * fVar253 + fVar225 * fVar292 + fVar391 * fVar247;
      auVar379._12_4_ =
           fVar332 * fStack_5d4 + fVar336 * fVar256 + fVar226 * fVar293 + fVar393 * fVar250;
      auVar379._16_4_ =
           fVar319 * fStack_5d0 + fVar316 * fVar258 + fVar209 * fVar333 + fVar385 * fVar227;
      auVar379._20_4_ =
           fVar330 * fStack_5cc + fVar317 * fVar270 + fVar224 * fVar334 + fVar390 * fVar255;
      auVar379._24_4_ =
           fVar331 * fStack_5c8 + fVar318 * fVar273 + fVar225 * fVar252 + fVar391 * fVar249;
      auVar379._28_4_ = fVar226 + 0.0 + 0.0 + 0.0;
      auVar235 = vpermilps_avx(auVar262,0xff);
      register0x00001490 = auVar235;
      _local_2e0 = auVar235;
      fVar348 = auVar235._0_4_;
      fVar356 = auVar235._4_4_;
      fVar357 = auVar235._8_4_;
      auVar159._0_4_ =
           fVar348 * local_5e0 + fVar392 * fVar206 + fVar335 * fVar290 + fVar278 * fVar229;
      auVar159._4_4_ =
           fVar356 * fStack_5dc + fVar394 * fVar251 + fVar346 * fVar291 + fVar279 * fVar248;
      auVar159._8_4_ =
           fVar357 * fStack_5d8 + fVar396 * fVar253 + fVar347 * fVar292 + fVar288 * fVar247;
      auVar159._12_4_ =
           auVar235._12_4_ * fStack_5d4 +
           fVar402 * fVar256 + auVar214._12_4_ * fVar293 + fVar289 * fVar250;
      auVar159._16_4_ =
           fVar348 * fStack_5d0 + fVar392 * fVar258 + fVar335 * fVar333 + fVar278 * fVar227;
      auVar159._20_4_ =
           fVar356 * fStack_5cc + fVar394 * fVar270 + fVar346 * fVar334 + fVar279 * fVar255;
      auVar159._24_4_ =
           fVar357 * fStack_5c8 + fVar396 * fVar273 + fVar347 * fVar252 + fVar288 * fVar249;
      auVar159._28_4_ = 0;
      fVar359 = *(float *)(bspline_basis1 + lVar147 + 0x908);
      fVar304 = *(float *)(bspline_basis1 + lVar147 + 0x90c);
      fVar358 = *(float *)(bspline_basis1 + lVar147 + 0x910);
      fVar254 = *(float *)(bspline_basis1 + lVar147 + 0x914);
      fVar361 = *(float *)(bspline_basis1 + lVar147 + 0x918);
      fVar360 = *(float *)(bspline_basis1 + lVar147 + 0x91c);
      fVar362 = *(float *)(bspline_basis1 + lVar147 + 0x920);
      fVar257 = *(float *)(bspline_basis1 + lVar147 + 0xd8c);
      fVar305 = *(float *)(bspline_basis1 + lVar147 + 0xd90);
      fVar294 = *(float *)(bspline_basis1 + lVar147 + 0xd94);
      fVar178 = *(float *)(bspline_basis1 + lVar147 + 0xd98);
      fVar180 = *(float *)(bspline_basis1 + lVar147 + 0xd9c);
      fVar200 = *(float *)(bspline_basis1 + lVar147 + 0xda0);
      fVar201 = *(float *)(bspline_basis1 + lVar147 + 0xda4);
      fVar203 = *(float *)(bspline_basis1 + lVar147 + 0x484);
      fVar204 = *(float *)(bspline_basis1 + lVar147 + 0x488);
      fVar205 = *(float *)(bspline_basis1 + lVar147 + 0x48c);
      fVar207 = *(float *)(bspline_basis1 + lVar147 + 0x490);
      fVar208 = *(float *)(bspline_basis1 + lVar147 + 0x494);
      fVar306 = *(float *)(bspline_basis1 + lVar147 + 0x498);
      fVar230 = *(float *)(bspline_basis1 + lVar147 + 0x49c);
      fVar247 = fVar393 + 0.0;
      auVar165 = *(undefined1 (*) [32])(bspline_basis1 + lVar147);
      auVar303 = ZEXT3264(auVar165);
      fVar229 = auVar165._0_4_;
      fVar250 = auVar165._4_4_;
      fVar249 = auVar165._8_4_;
      fVar253 = auVar165._12_4_;
      fVar270 = auVar165._16_4_;
      fVar277 = auVar165._20_4_;
      fVar280 = auVar165._24_4_;
      auVar264._0_4_ = fVar363 * fVar229 + fVar260 * fVar203 + fVar359 * fVar179 + fVar257 * fVar152
      ;
      auVar264._4_4_ = fVar370 * fVar250 + fVar272 * fVar204 + fVar304 * fVar199 + fVar305 * fVar176
      ;
      auVar264._8_4_ = fVar371 * fVar249 + fVar274 * fVar205 + fVar358 * fVar295 + fVar294 * fVar228
      ;
      auVar264._12_4_ =
           fVar372 * fVar253 + fVar276 * fVar207 + fVar254 * fVar202 + fVar178 * fVar177;
      auVar264._16_4_ =
           fVar363 * fVar270 + fVar260 * fVar208 + fVar361 * fVar179 + fVar180 * fVar152;
      auVar264._20_4_ =
           fVar370 * fVar277 + fVar272 * fVar306 + fVar360 * fVar199 + fVar200 * fVar176;
      auVar264._24_4_ =
           fVar371 * fVar280 + fVar274 * fVar230 + fVar362 * fVar295 + fVar201 * fVar228;
      auVar264._28_4_ = fVar402 + fVar247;
      auVar240._0_4_ = fVar319 * fVar229 + fVar316 * fVar203 + fVar359 * fVar209 + fVar385 * fVar257
      ;
      auVar240._4_4_ = fVar330 * fVar250 + fVar317 * fVar204 + fVar304 * fVar224 + fVar390 * fVar305
      ;
      auVar240._8_4_ = fVar331 * fVar249 + fVar318 * fVar205 + fVar358 * fVar225 + fVar391 * fVar294
      ;
      auVar240._12_4_ =
           fVar332 * fVar253 + fVar336 * fVar207 + fVar254 * fVar226 + fVar393 * fVar178;
      auVar240._16_4_ =
           fVar319 * fVar270 + fVar316 * fVar208 + fVar361 * fVar209 + fVar385 * fVar180;
      auVar240._20_4_ =
           fVar330 * fVar277 + fVar317 * fVar306 + fVar360 * fVar224 + fVar390 * fVar200;
      auVar240._24_4_ =
           fVar331 * fVar280 + fVar318 * fVar230 + fVar362 * fVar225 + fVar391 * fVar201;
      auVar240._28_4_ = fVar247 + fVar393 + fVar275 + 0.0;
      local_840._0_4_ =
           fVar392 * fVar203 + fVar335 * fVar359 + fVar278 * fVar257 + fVar348 * fVar229;
      local_840._4_4_ =
           fVar394 * fVar204 + fVar346 * fVar304 + fVar279 * fVar305 + fVar356 * fVar250;
      local_840._8_4_ =
           fVar396 * fVar205 + fVar347 * fVar358 + fVar288 * fVar294 + fVar357 * fVar249;
      local_840._12_4_ =
           fVar402 * fVar207 + auVar214._12_4_ * fVar254 + fVar289 * fVar178 +
           auVar235._12_4_ * fVar253;
      local_840._16_4_ =
           fVar392 * fVar208 + fVar335 * fVar361 + fVar278 * fVar180 + fVar348 * fVar270;
      local_840._20_4_ =
           fVar394 * fVar306 + fVar346 * fVar360 + fVar279 * fVar200 + fVar356 * fVar277;
      local_840._24_4_ =
           fVar396 * fVar230 + fVar347 * fVar362 + fVar288 * fVar201 + fVar357 * fVar280;
      local_840._28_4_ = fVar393 + fVar289 + fVar275 + fVar247;
      auVar42 = vsubps_avx(auVar264,auVar312);
      auVar43 = vsubps_avx(auVar240,auVar379);
      fVar248 = auVar42._0_4_;
      fVar227 = auVar42._4_4_;
      auVar48._4_4_ = auVar379._4_4_ * fVar227;
      auVar48._0_4_ = auVar379._0_4_ * fVar248;
      fVar206 = auVar42._8_4_;
      auVar48._8_4_ = auVar379._8_4_ * fVar206;
      fVar256 = auVar42._12_4_;
      auVar48._12_4_ = auVar379._12_4_ * fVar256;
      fVar273 = auVar42._16_4_;
      auVar48._16_4_ = auVar379._16_4_ * fVar273;
      fVar278 = auVar42._20_4_;
      auVar48._20_4_ = auVar379._20_4_ * fVar278;
      fVar288 = auVar42._24_4_;
      auVar48._24_4_ = auVar379._24_4_ * fVar288;
      auVar48._28_4_ = fVar247;
      fVar247 = auVar43._0_4_;
      fVar255 = auVar43._4_4_;
      auVar49._4_4_ = auVar312._4_4_ * fVar255;
      auVar49._0_4_ = auVar312._0_4_ * fVar247;
      fVar251 = auVar43._8_4_;
      auVar49._8_4_ = auVar312._8_4_ * fVar251;
      fVar258 = auVar43._12_4_;
      auVar49._12_4_ = auVar312._12_4_ * fVar258;
      fVar275 = auVar43._16_4_;
      auVar49._16_4_ = auVar312._16_4_ * fVar275;
      fVar279 = auVar43._20_4_;
      auVar49._20_4_ = auVar312._20_4_ * fVar279;
      fVar289 = auVar43._24_4_;
      auVar49._24_4_ = auVar312._24_4_ * fVar289;
      auVar49._28_4_ = auVar240._28_4_;
      auVar41 = vsubps_avx(auVar48,auVar49);
      auVar172 = vmaxps_avx(auVar159,local_840);
      auVar50._4_4_ = auVar172._4_4_ * auVar172._4_4_ * (fVar227 * fVar227 + fVar255 * fVar255);
      auVar50._0_4_ = auVar172._0_4_ * auVar172._0_4_ * (fVar248 * fVar248 + fVar247 * fVar247);
      auVar50._8_4_ = auVar172._8_4_ * auVar172._8_4_ * (fVar206 * fVar206 + fVar251 * fVar251);
      auVar50._12_4_ = auVar172._12_4_ * auVar172._12_4_ * (fVar256 * fVar256 + fVar258 * fVar258);
      auVar50._16_4_ = auVar172._16_4_ * auVar172._16_4_ * (fVar273 * fVar273 + fVar275 * fVar275);
      auVar50._20_4_ = auVar172._20_4_ * auVar172._20_4_ * (fVar278 * fVar278 + fVar279 * fVar279);
      auVar50._24_4_ = auVar172._24_4_ * auVar172._24_4_ * (fVar288 * fVar288 + fVar289 * fVar289);
      auVar50._28_4_ = auVar43._28_4_ + auVar240._28_4_;
      auVar51._4_4_ = auVar41._4_4_ * auVar41._4_4_;
      auVar51._0_4_ = auVar41._0_4_ * auVar41._0_4_;
      auVar51._8_4_ = auVar41._8_4_ * auVar41._8_4_;
      auVar51._12_4_ = auVar41._12_4_ * auVar41._12_4_;
      auVar51._16_4_ = auVar41._16_4_ * auVar41._16_4_;
      auVar51._20_4_ = auVar41._20_4_ * auVar41._20_4_;
      auVar51._24_4_ = auVar41._24_4_ * auVar41._24_4_;
      auVar51._28_4_ = auVar41._28_4_;
      auVar172 = vcmpps_avx(auVar51,auVar50,2);
      auVar233._0_4_ = (float)(int)uVar34;
      auVar233._4_12_ = auVar212._4_12_;
      local_520._0_16_ = auVar233;
      auVar214 = vshufps_avx(auVar233,auVar233,0);
      auVar241._16_16_ = auVar214;
      auVar241._0_16_ = auVar214;
      auVar41 = vcmpps_avx(_DAT_01faff40,auVar241,1);
      auVar246 = ZEXT3264(auVar41);
      auVar214 = vpermilps_avx(auVar232,0xaa);
      auVar265._16_16_ = auVar214;
      auVar265._0_16_ = auVar214;
      auVar212 = vpermilps_avx(auVar307,0xaa);
      register0x00001550 = auVar212;
      _local_440 = auVar212;
      auVar235 = vpermilps_avx(auVar320,0xaa);
      register0x00001590 = auVar235;
      _local_e0 = auVar235;
      auVar234 = vpermilps_avx(auVar183,0xaa);
      register0x00001490 = auVar234;
      _local_820 = auVar234;
      auVar44 = auVar41 & auVar172;
      local_800._0_16_ = ZEXT416(*(uint *)(ray + k * 4 + 0x60));
      auVar282 = ZEXT416((uint)(auVar282._0_4_ * 4.7683716e-07));
      uStack_918 = auVar262._8_8_;
      uStack_898 = auVar397._8_8_;
      uStack_8a8 = auVar406._8_8_;
      uStack_8b8 = auVar374._8_8_;
      auVar342 = local_640;
      fVar248 = fVar260;
      fVar247 = fVar272;
      fVar227 = fVar274;
      fVar255 = fVar276;
      fVar206 = fVar316;
      fVar251 = fVar317;
      fVar256 = fVar318;
      fVar258 = fVar336;
      _local_620 = auVar265;
      if ((((((((auVar44 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar44 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar44 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar44 >> 0x7f,0) != '\0') ||
            (auVar44 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar44 >> 0xbf,0) != '\0') ||
          (auVar44 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar44[0x1f] < '\0') {
        local_460 = vandps_avx(auVar172,auVar41);
        local_620._0_4_ = auVar214._0_4_;
        local_620._4_4_ = auVar214._4_4_;
        fStack_618 = auVar214._8_4_;
        fStack_614 = auVar214._12_4_;
        fVar356 = auVar212._0_4_;
        fVar357 = auVar212._4_4_;
        fVar392 = auVar212._8_4_;
        fVar394 = auVar212._12_4_;
        fVar396 = auVar235._0_4_;
        fVar402 = auVar235._4_4_;
        fVar403 = auVar235._8_4_;
        fVar404 = auVar235._12_4_;
        fVar335 = auVar234._0_4_;
        fVar346 = auVar234._4_4_;
        fVar347 = auVar234._8_4_;
        fVar348 = auVar234._12_4_;
        fVar273 = auVar41._28_4_ +
                  *(float *)(bspline_basis1 + lVar147 + 0x924) +
                  *(float *)(bspline_basis1 + lVar147 + 0x4a0);
        local_480._0_4_ =
             (float)local_620._0_4_ * fVar229 +
             fVar356 * fVar203 + fVar396 * fVar359 + fVar335 * fVar257;
        local_480._4_4_ =
             (float)local_620._4_4_ * fVar250 +
             fVar357 * fVar204 + fVar402 * fVar304 + fVar346 * fVar305;
        fStack_478 = fStack_618 * fVar249 +
                     fVar392 * fVar205 + fVar403 * fVar358 + fVar347 * fVar294;
        fStack_474 = fStack_614 * fVar253 +
                     fVar394 * fVar207 + fVar404 * fVar254 + fVar348 * fVar178;
        fStack_470 = (float)local_620._0_4_ * fVar270 +
                     fVar356 * fVar208 + fVar396 * fVar361 + fVar335 * fVar180;
        fStack_46c = (float)local_620._4_4_ * fVar277 +
                     fVar357 * fVar306 + fVar402 * fVar360 + fVar346 * fVar200;
        fStack_468 = fStack_618 * fVar280 +
                     fVar392 * fVar230 + fVar403 * fVar362 + fVar347 * fVar201;
        fStack_464 = local_460._28_4_ + fVar273;
        local_5c0._0_4_ = auVar137._0_4_;
        local_5c0._4_4_ = auVar137._4_4_;
        fStack_5b8 = auVar137._8_4_;
        fStack_5b4 = auVar137._12_4_;
        fStack_5b0 = auVar137._16_4_;
        fStack_5ac = auVar137._20_4_;
        fStack_5a8 = auVar137._24_4_;
        local_7e0._0_4_ = auVar136._0_4_;
        local_7e0._4_4_ = auVar136._4_4_;
        uStack_7d8._0_4_ = auVar136._8_4_;
        uStack_7d8._4_4_ = auVar136._12_4_;
        uStack_7d0._0_4_ = auVar136._16_4_;
        uStack_7d0._4_4_ = auVar136._20_4_;
        uStack_7c8._0_4_ = auVar136._24_4_;
        local_7c0 = (float)local_620._0_4_ * local_5e0 +
                    fVar356 * (float)local_5c0._0_4_ +
                    fVar396 * fVar290 + fVar335 * (float)local_7e0._0_4_;
        fStack_7bc = (float)local_620._4_4_ * fStack_5dc +
                     fVar357 * (float)local_5c0._4_4_ +
                     fVar402 * fVar291 + fVar346 * (float)local_7e0._4_4_;
        fStack_7b8 = fStack_618 * fStack_5d8 +
                     fVar392 * fStack_5b8 + fVar403 * fVar292 + fVar347 * (float)uStack_7d8;
        fStack_7b4 = fStack_614 * fStack_5d4 +
                     fVar394 * fStack_5b4 + fVar404 * fVar293 + fVar348 * uStack_7d8._4_4_;
        fVar201 = (float)local_620._0_4_ * fStack_5d0 +
                  fVar356 * fStack_5b0 + fVar396 * fVar333 + fVar335 * (float)uStack_7d0;
        fVar204 = (float)local_620._4_4_ * fStack_5cc +
                  fVar357 * fStack_5ac + fVar402 * fVar334 + fVar346 * uStack_7d0._4_4_;
        fVar207 = fStack_618 * fStack_5c8 +
                  fVar392 * fStack_5a8 + fVar403 * fVar252 + fVar347 * (float)uStack_7c8;
        fVar306 = fStack_464 + fVar273 + local_460._28_4_ + auVar41._28_4_;
        fVar229 = *(float *)(bspline_basis0 + lVar147 + 0x1210);
        fVar250 = *(float *)(bspline_basis0 + lVar147 + 0x1214);
        fVar249 = *(float *)(bspline_basis0 + lVar147 + 0x1218);
        fVar253 = *(float *)(bspline_basis0 + lVar147 + 0x121c);
        fVar270 = *(float *)(bspline_basis0 + lVar147 + 0x1220);
        fVar273 = *(float *)(bspline_basis0 + lVar147 + 0x1224);
        fVar275 = *(float *)(bspline_basis0 + lVar147 + 0x1228);
        fVar277 = *(float *)(bspline_basis0 + lVar147 + 0x1694);
        fVar278 = *(float *)(bspline_basis0 + lVar147 + 0x1698);
        fVar279 = *(float *)(bspline_basis0 + lVar147 + 0x169c);
        fVar280 = *(float *)(bspline_basis0 + lVar147 + 0x16a0);
        fVar288 = *(float *)(bspline_basis0 + lVar147 + 0x16a4);
        fVar289 = *(float *)(bspline_basis0 + lVar147 + 0x16a8);
        fVar290 = *(float *)(bspline_basis0 + lVar147 + 0x16ac);
        fVar291 = *(float *)(bspline_basis0 + lVar147 + 0x1b18);
        fVar292 = *(float *)(bspline_basis0 + lVar147 + 0x1b1c);
        fVar293 = *(float *)(bspline_basis0 + lVar147 + 0x1b20);
        fVar333 = *(float *)(bspline_basis0 + lVar147 + 0x1b24);
        fVar334 = *(float *)(bspline_basis0 + lVar147 + 0x1b28);
        fVar252 = *(float *)(bspline_basis0 + lVar147 + 0x1b2c);
        fVar359 = *(float *)(bspline_basis0 + lVar147 + 0x1b30);
        fVar304 = *(float *)(bspline_basis0 + lVar147 + 0x1f9c);
        fVar358 = *(float *)(bspline_basis0 + lVar147 + 0x1fa0);
        fVar254 = *(float *)(bspline_basis0 + lVar147 + 0x1fa4);
        fVar361 = *(float *)(bspline_basis0 + lVar147 + 0x1fa8);
        fVar360 = *(float *)(bspline_basis0 + lVar147 + 0x1fac);
        fVar362 = *(float *)(bspline_basis0 + lVar147 + 0x1fb0);
        fVar257 = *(float *)(bspline_basis0 + lVar147 + 0x1fb4);
        fVar294 = *(float *)(bspline_basis1 + lVar147 + 0x4a0) + 0.0;
        fVar305 = *(float *)(bspline_basis0 + lVar147 + 0x1b34) +
                  *(float *)(bspline_basis0 + lVar147 + 0x1fb8);
        fVar178 = *(float *)(bspline_basis0 + lVar147 + 0x16b0) + fVar305;
        auVar160._0_4_ =
             fVar363 * fVar229 + fVar260 * fVar277 + fVar179 * fVar291 + fVar152 * fVar304;
        auVar160._4_4_ =
             fVar370 * fVar250 + fVar272 * fVar278 + fVar199 * fVar292 + fVar176 * fVar358;
        auVar160._8_4_ =
             fVar371 * fVar249 + fVar274 * fVar279 + fVar295 * fVar293 + fVar228 * fVar254;
        auVar160._12_4_ =
             fVar372 * fVar253 + fVar276 * fVar280 + fVar202 * fVar333 + fVar177 * fVar361;
        auVar160._16_4_ =
             fVar363 * fVar270 + fVar260 * fVar288 + fVar179 * fVar334 + fVar152 * fVar360;
        auVar160._20_4_ =
             fVar370 * fVar273 + fVar272 * fVar289 + fVar199 * fVar252 + fVar176 * fVar362;
        auVar160._24_4_ =
             fVar371 * fVar275 + fVar274 * fVar290 + fVar295 * fVar359 + fVar228 * fVar257;
        auVar160._28_4_ =
             *(float *)(bspline_basis0 + lVar147 + 0x16b0) +
             *(float *)(bspline_basis0 + lVar147 + 0x1fb8) + fVar294;
        auVar189._0_4_ =
             fVar319 * fVar229 + fVar316 * fVar277 + fVar209 * fVar291 + fVar385 * fVar304;
        auVar189._4_4_ =
             fVar330 * fVar250 + fVar317 * fVar278 + fVar224 * fVar292 + fVar390 * fVar358;
        auVar189._8_4_ =
             fVar331 * fVar249 + fVar318 * fVar279 + fVar225 * fVar293 + fVar391 * fVar254;
        auVar189._12_4_ =
             fVar332 * fVar253 + fVar336 * fVar280 + fVar226 * fVar333 + fVar393 * fVar361;
        auVar189._16_4_ =
             fVar319 * fVar270 + fVar316 * fVar288 + fVar209 * fVar334 + fVar385 * fVar360;
        auVar189._20_4_ =
             fVar330 * fVar273 + fVar317 * fVar289 + fVar224 * fVar252 + fVar390 * fVar362;
        auVar189._24_4_ =
             fVar331 * fVar275 + fVar318 * fVar290 + fVar225 * fVar359 + fVar391 * fVar257;
        auVar189._28_4_ = fVar305 + fVar294 + auVar165._28_4_ + 0.0;
        auVar284._0_4_ =
             (float)local_620._0_4_ * fVar229 +
             fVar356 * fVar277 + fVar396 * fVar291 + fVar335 * fVar304;
        auVar284._4_4_ =
             (float)local_620._4_4_ * fVar250 +
             fVar357 * fVar278 + fVar402 * fVar292 + fVar346 * fVar358;
        auVar284._8_4_ =
             fStack_618 * fVar249 + fVar392 * fVar279 + fVar403 * fVar293 + fVar347 * fVar254;
        auVar284._12_4_ =
             fStack_614 * fVar253 + fVar394 * fVar280 + fVar404 * fVar333 + fVar348 * fVar361;
        auVar284._16_4_ =
             (float)local_620._0_4_ * fVar270 +
             fVar356 * fVar288 + fVar396 * fVar334 + fVar335 * fVar360;
        auVar284._20_4_ =
             (float)local_620._4_4_ * fVar273 +
             fVar357 * fVar289 + fVar402 * fVar252 + fVar346 * fVar362;
        auVar284._24_4_ =
             fStack_618 * fVar275 + fVar392 * fVar290 + fVar403 * fVar359 + fVar347 * fVar257;
        auVar284._28_4_ = *(float *)(bspline_basis0 + lVar147 + 0x122c) + fVar178;
        fVar229 = *(float *)(bspline_basis1 + lVar147 + 0x1b18);
        fVar250 = *(float *)(bspline_basis1 + lVar147 + 0x1b1c);
        fVar249 = *(float *)(bspline_basis1 + lVar147 + 0x1b20);
        fVar253 = *(float *)(bspline_basis1 + lVar147 + 0x1b24);
        fVar270 = *(float *)(bspline_basis1 + lVar147 + 0x1b28);
        fVar273 = *(float *)(bspline_basis1 + lVar147 + 0x1b2c);
        fVar275 = *(float *)(bspline_basis1 + lVar147 + 0x1b30);
        fVar277 = *(float *)(bspline_basis1 + lVar147 + 0x1f9c);
        fVar278 = *(float *)(bspline_basis1 + lVar147 + 0x1fa0);
        fVar279 = *(float *)(bspline_basis1 + lVar147 + 0x1fa4);
        fVar280 = *(float *)(bspline_basis1 + lVar147 + 0x1fa8);
        fVar288 = *(float *)(bspline_basis1 + lVar147 + 0x1fac);
        fVar289 = *(float *)(bspline_basis1 + lVar147 + 0x1fb0);
        fVar290 = *(float *)(bspline_basis1 + lVar147 + 0x1fb4);
        fVar291 = *(float *)(bspline_basis1 + lVar147 + 0x1694);
        fVar292 = *(float *)(bspline_basis1 + lVar147 + 0x1698);
        fVar293 = *(float *)(bspline_basis1 + lVar147 + 0x169c);
        fVar333 = *(float *)(bspline_basis1 + lVar147 + 0x16a0);
        fVar334 = *(float *)(bspline_basis1 + lVar147 + 0x16a4);
        fVar252 = *(float *)(bspline_basis1 + lVar147 + 0x16a8);
        fVar359 = *(float *)(bspline_basis1 + lVar147 + 0x16ac);
        fVar304 = *(float *)(bspline_basis1 + lVar147 + 0x1210);
        fVar358 = *(float *)(bspline_basis1 + lVar147 + 0x1214);
        fVar254 = *(float *)(bspline_basis1 + lVar147 + 0x1218);
        fVar361 = *(float *)(bspline_basis1 + lVar147 + 0x121c);
        fVar360 = *(float *)(bspline_basis1 + lVar147 + 0x1220);
        fVar362 = *(float *)(bspline_basis1 + lVar147 + 0x1224);
        fVar257 = *(float *)(bspline_basis1 + lVar147 + 0x1228);
        auVar298._0_4_ =
             fVar304 * fVar363 + fVar260 * fVar291 + fVar179 * fVar229 + fVar152 * fVar277;
        auVar298._4_4_ =
             fVar358 * fVar370 + fVar272 * fVar292 + fVar199 * fVar250 + fVar176 * fVar278;
        auVar298._8_4_ =
             fVar254 * fVar371 + fVar274 * fVar293 + fVar295 * fVar249 + fVar228 * fVar279;
        auVar298._12_4_ =
             fVar361 * fVar372 + fVar276 * fVar333 + fVar202 * fVar253 + fVar177 * fVar280;
        auVar298._16_4_ =
             fVar360 * fVar363 + fVar260 * fVar334 + fVar179 * fVar270 + fVar152 * fVar288;
        auVar298._20_4_ =
             fVar362 * fVar370 + fVar272 * fVar252 + fVar199 * fVar273 + fVar176 * fVar289;
        auVar298._24_4_ =
             fVar257 * fVar371 + fVar274 * fVar359 + fVar295 * fVar275 + fVar228 * fVar290;
        auVar298._28_4_ = fVar202 + fVar202 + fVar332 + fVar178;
        auVar341._0_4_ =
             fVar304 * fVar319 + fVar316 * fVar291 + fVar209 * fVar229 + fVar385 * fVar277;
        auVar341._4_4_ =
             fVar358 * fVar330 + fVar317 * fVar292 + fVar224 * fVar250 + fVar390 * fVar278;
        auVar341._8_4_ =
             fVar254 * fVar331 + fVar318 * fVar293 + fVar225 * fVar249 + fVar391 * fVar279;
        auVar341._12_4_ =
             fVar361 * fVar332 + fVar336 * fVar333 + fVar226 * fVar253 + fVar393 * fVar280;
        auVar341._16_4_ =
             fVar360 * fVar319 + fVar316 * fVar334 + fVar209 * fVar270 + fVar385 * fVar288;
        auVar341._20_4_ =
             fVar362 * fVar330 + fVar317 * fVar252 + fVar224 * fVar273 + fVar390 * fVar289;
        auVar341._24_4_ =
             fVar257 * fVar331 + fVar318 * fVar359 + fVar225 * fVar275 + fVar391 * fVar290;
        auVar341._28_4_ = fVar202 + fVar202 + fVar202 + fVar332;
        auVar221._0_4_ =
             (float)local_620._0_4_ * fVar304 +
             fVar356 * fVar291 + fVar396 * fVar229 + fVar277 * fVar335;
        auVar221._4_4_ =
             (float)local_620._4_4_ * fVar358 +
             fVar357 * fVar292 + fVar402 * fVar250 + fVar278 * fVar346;
        auVar221._8_4_ =
             fStack_618 * fVar254 + fVar392 * fVar293 + fVar403 * fVar249 + fVar279 * fVar347;
        auVar221._12_4_ =
             fStack_614 * fVar361 + fVar394 * fVar333 + fVar404 * fVar253 + fVar280 * fVar348;
        auVar221._16_4_ =
             (float)local_620._0_4_ * fVar360 +
             fVar356 * fVar334 + fVar396 * fVar270 + fVar288 * fVar335;
        auVar221._20_4_ =
             (float)local_620._4_4_ * fVar362 +
             fVar357 * fVar252 + fVar402 * fVar273 + fVar289 * fVar346;
        auVar221._24_4_ =
             fStack_618 * fVar257 + fVar392 * fVar359 + fVar403 * fVar275 + fVar290 * fVar347;
        auVar221._28_4_ =
             *(float *)(bspline_basis1 + lVar147 + 0x122c) +
             *(float *)(bspline_basis1 + lVar147 + 0x16b0) +
             *(float *)(bspline_basis1 + lVar147 + 0x1b34) +
             *(float *)(bspline_basis1 + lVar147 + 0x1fb8);
        auVar266._8_4_ = 0x7fffffff;
        auVar266._0_8_ = 0x7fffffff7fffffff;
        auVar266._12_4_ = 0x7fffffff;
        auVar266._16_4_ = 0x7fffffff;
        auVar266._20_4_ = 0x7fffffff;
        auVar266._24_4_ = 0x7fffffff;
        auVar266._28_4_ = 0x7fffffff;
        auVar165 = vandps_avx(auVar160,auVar266);
        auVar172 = vandps_avx(auVar189,auVar266);
        auVar172 = vmaxps_avx(auVar165,auVar172);
        auVar165 = vandps_avx(auVar284,auVar266);
        auVar165 = vmaxps_avx(auVar172,auVar165);
        auVar214 = vpermilps_avx(auVar282,0);
        auVar285._16_16_ = auVar214;
        auVar285._0_16_ = auVar214;
        auVar165 = vcmpps_avx(auVar165,auVar285,1);
        auVar41 = vblendvps_avx(auVar160,auVar42,auVar165);
        auVar44 = vblendvps_avx(auVar189,auVar43,auVar165);
        auVar165 = vandps_avx(auVar298,auVar266);
        auVar172 = vandps_avx(auVar341,auVar266);
        auVar342 = vmaxps_avx(auVar165,auVar172);
        auVar165 = vandps_avx(auVar221,auVar266);
        auVar165 = vmaxps_avx(auVar342,auVar165);
        auVar342 = vcmpps_avx(auVar165,auVar285,1);
        auVar165 = vblendvps_avx(auVar298,auVar42,auVar342);
        auVar42 = vblendvps_avx(auVar341,auVar43,auVar342);
        fVar294 = auVar41._0_4_;
        fVar178 = auVar41._4_4_;
        fVar180 = auVar41._8_4_;
        fVar200 = auVar41._12_4_;
        fVar203 = auVar41._16_4_;
        fVar205 = auVar41._20_4_;
        fVar208 = auVar41._24_4_;
        fVar295 = -auVar41._28_4_;
        fVar230 = auVar165._0_4_;
        fVar152 = auVar165._4_4_;
        fVar176 = auVar165._8_4_;
        fVar228 = auVar165._12_4_;
        fVar177 = auVar165._16_4_;
        fVar179 = auVar165._20_4_;
        fVar199 = auVar165._24_4_;
        fVar229 = auVar44._0_4_;
        fVar270 = auVar44._4_4_;
        fVar278 = auVar44._8_4_;
        fVar289 = auVar44._12_4_;
        fVar293 = auVar44._16_4_;
        fVar359 = auVar44._20_4_;
        fVar361 = auVar44._24_4_;
        auVar161._0_4_ = fVar229 * fVar229 + fVar294 * fVar294;
        auVar161._4_4_ = fVar270 * fVar270 + fVar178 * fVar178;
        auVar161._8_4_ = fVar278 * fVar278 + fVar180 * fVar180;
        auVar161._12_4_ = fVar289 * fVar289 + fVar200 * fVar200;
        auVar161._16_4_ = fVar293 * fVar293 + fVar203 * fVar203;
        auVar161._20_4_ = fVar359 * fVar359 + fVar205 * fVar205;
        auVar161._24_4_ = fVar361 * fVar361 + fVar208 * fVar208;
        auVar161._28_4_ = auVar341._28_4_ + auVar41._28_4_;
        auVar41 = vrsqrtps_avx(auVar161);
        fVar250 = auVar41._0_4_;
        fVar249 = auVar41._4_4_;
        auVar52._4_4_ = fVar249 * 1.5;
        auVar52._0_4_ = fVar250 * 1.5;
        fVar253 = auVar41._8_4_;
        auVar52._8_4_ = fVar253 * 1.5;
        fVar273 = auVar41._12_4_;
        auVar52._12_4_ = fVar273 * 1.5;
        fVar275 = auVar41._16_4_;
        auVar52._16_4_ = fVar275 * 1.5;
        fVar277 = auVar41._20_4_;
        auVar52._20_4_ = fVar277 * 1.5;
        fVar279 = auVar41._24_4_;
        fVar305 = auVar172._28_4_;
        auVar52._24_4_ = fVar279 * 1.5;
        auVar52._28_4_ = fVar305;
        auVar53._4_4_ = fVar249 * fVar249 * fVar249 * auVar161._4_4_ * 0.5;
        auVar53._0_4_ = fVar250 * fVar250 * fVar250 * auVar161._0_4_ * 0.5;
        auVar53._8_4_ = fVar253 * fVar253 * fVar253 * auVar161._8_4_ * 0.5;
        auVar53._12_4_ = fVar273 * fVar273 * fVar273 * auVar161._12_4_ * 0.5;
        auVar53._16_4_ = fVar275 * fVar275 * fVar275 * auVar161._16_4_ * 0.5;
        auVar53._20_4_ = fVar277 * fVar277 * fVar277 * auVar161._20_4_ * 0.5;
        auVar53._24_4_ = fVar279 * fVar279 * fVar279 * auVar161._24_4_ * 0.5;
        auVar53._28_4_ = auVar161._28_4_;
        auVar172 = vsubps_avx(auVar52,auVar53);
        fVar250 = auVar172._0_4_;
        fVar273 = auVar172._4_4_;
        fVar279 = auVar172._8_4_;
        fVar290 = auVar172._12_4_;
        fVar333 = auVar172._16_4_;
        fVar304 = auVar172._20_4_;
        fVar360 = auVar172._24_4_;
        fVar249 = auVar42._0_4_;
        fVar275 = auVar42._4_4_;
        fVar280 = auVar42._8_4_;
        fVar291 = auVar42._12_4_;
        fVar334 = auVar42._16_4_;
        fVar358 = auVar42._20_4_;
        fVar362 = auVar42._24_4_;
        auVar162._0_4_ = fVar249 * fVar249 + fVar230 * fVar230;
        auVar162._4_4_ = fVar275 * fVar275 + fVar152 * fVar152;
        auVar162._8_4_ = fVar280 * fVar280 + fVar176 * fVar176;
        auVar162._12_4_ = fVar291 * fVar291 + fVar228 * fVar228;
        auVar162._16_4_ = fVar334 * fVar334 + fVar177 * fVar177;
        auVar162._20_4_ = fVar358 * fVar358 + fVar179 * fVar179;
        auVar162._24_4_ = fVar362 * fVar362 + fVar199 * fVar199;
        auVar162._28_4_ = auVar165._28_4_ + auVar172._28_4_;
        auVar165 = vrsqrtps_avx(auVar162);
        fVar253 = auVar165._0_4_;
        fVar277 = auVar165._4_4_;
        auVar54._4_4_ = fVar277 * 1.5;
        auVar54._0_4_ = fVar253 * 1.5;
        fVar288 = auVar165._8_4_;
        auVar54._8_4_ = fVar288 * 1.5;
        fVar292 = auVar165._12_4_;
        auVar54._12_4_ = fVar292 * 1.5;
        fVar252 = auVar165._16_4_;
        auVar54._16_4_ = fVar252 * 1.5;
        fVar254 = auVar165._20_4_;
        auVar54._20_4_ = fVar254 * 1.5;
        fVar257 = auVar165._24_4_;
        auVar54._24_4_ = fVar257 * 1.5;
        auVar54._28_4_ = fVar305;
        auVar55._4_4_ = fVar277 * fVar277 * fVar277 * auVar162._4_4_ * 0.5;
        auVar55._0_4_ = fVar253 * fVar253 * fVar253 * auVar162._0_4_ * 0.5;
        auVar55._8_4_ = fVar288 * fVar288 * fVar288 * auVar162._8_4_ * 0.5;
        auVar55._12_4_ = fVar292 * fVar292 * fVar292 * auVar162._12_4_ * 0.5;
        auVar55._16_4_ = fVar252 * fVar252 * fVar252 * auVar162._16_4_ * 0.5;
        auVar55._20_4_ = fVar254 * fVar254 * fVar254 * auVar162._20_4_ * 0.5;
        auVar55._24_4_ = fVar257 * fVar257 * fVar257 * auVar162._24_4_ * 0.5;
        auVar55._28_4_ = auVar162._28_4_;
        auVar165 = vsubps_avx(auVar54,auVar55);
        fVar253 = auVar165._0_4_;
        fVar277 = auVar165._4_4_;
        fVar288 = auVar165._8_4_;
        fVar292 = auVar165._12_4_;
        fVar252 = auVar165._16_4_;
        fVar254 = auVar165._20_4_;
        fVar257 = auVar165._24_4_;
        fVar229 = auVar159._0_4_ * fVar229 * fVar250;
        fVar270 = auVar159._4_4_ * fVar270 * fVar273;
        auVar56._4_4_ = fVar270;
        auVar56._0_4_ = fVar229;
        fVar278 = auVar159._8_4_ * fVar278 * fVar279;
        auVar56._8_4_ = fVar278;
        fVar289 = auVar159._12_4_ * fVar289 * fVar290;
        auVar56._12_4_ = fVar289;
        fVar293 = auVar159._16_4_ * fVar293 * fVar333;
        auVar56._16_4_ = fVar293;
        fVar359 = auVar159._20_4_ * fVar359 * fVar304;
        auVar56._20_4_ = fVar359;
        fVar361 = auVar159._24_4_ * fVar361 * fVar360;
        auVar56._24_4_ = fVar361;
        auVar56._28_4_ = fVar305;
        local_7e0._4_4_ = fVar270 + auVar312._4_4_;
        local_7e0._0_4_ = fVar229 + auVar312._0_4_;
        uStack_7d8._0_4_ = fVar278 + auVar312._8_4_;
        uStack_7d8._4_4_ = fVar289 + auVar312._12_4_;
        uStack_7d0._0_4_ = fVar293 + auVar312._16_4_;
        uStack_7d0._4_4_ = fVar359 + auVar312._20_4_;
        uStack_7c8._0_4_ = fVar361 + auVar312._24_4_;
        uStack_7c8._4_4_ = fVar305 + auVar312._28_4_;
        fVar229 = auVar159._0_4_ * fVar250 * -fVar294;
        fVar270 = auVar159._4_4_ * fVar273 * -fVar178;
        auVar57._4_4_ = fVar270;
        auVar57._0_4_ = fVar229;
        fVar278 = auVar159._8_4_ * fVar279 * -fVar180;
        auVar57._8_4_ = fVar278;
        fVar289 = auVar159._12_4_ * fVar290 * -fVar200;
        auVar57._12_4_ = fVar289;
        fVar293 = auVar159._16_4_ * fVar333 * -fVar203;
        auVar57._16_4_ = fVar293;
        fVar359 = auVar159._20_4_ * fVar304 * -fVar205;
        auVar57._20_4_ = fVar359;
        fVar361 = auVar159._24_4_ * fVar360 * -fVar208;
        auVar57._24_4_ = fVar361;
        auVar57._28_4_ = fVar295;
        local_5a0._4_4_ = auVar379._4_4_ + fVar270;
        local_5a0._0_4_ = auVar379._0_4_ + fVar229;
        fStack_598 = auVar379._8_4_ + fVar278;
        fStack_594 = auVar379._12_4_ + fVar289;
        fStack_590 = auVar379._16_4_ + fVar293;
        fStack_58c = auVar379._20_4_ + fVar359;
        fStack_588 = auVar379._24_4_ + fVar361;
        fStack_584 = auVar379._28_4_ + fVar295;
        fVar229 = fVar250 * 0.0 * auVar159._0_4_;
        fVar250 = fVar273 * 0.0 * auVar159._4_4_;
        auVar58._4_4_ = fVar250;
        auVar58._0_4_ = fVar229;
        fVar270 = fVar279 * 0.0 * auVar159._8_4_;
        auVar58._8_4_ = fVar270;
        fVar273 = fVar290 * 0.0 * auVar159._12_4_;
        auVar58._12_4_ = fVar273;
        fVar278 = fVar333 * 0.0 * auVar159._16_4_;
        auVar58._16_4_ = fVar278;
        fVar279 = fVar304 * 0.0 * auVar159._20_4_;
        auVar58._20_4_ = fVar279;
        fVar289 = fVar360 * 0.0 * auVar159._24_4_;
        auVar58._24_4_ = fVar289;
        auVar58._28_4_ = fVar394;
        auVar133._4_4_ = fStack_7bc;
        auVar133._0_4_ = local_7c0;
        auVar133._8_4_ = fStack_7b8;
        auVar133._12_4_ = fStack_7b4;
        auVar133._16_4_ = fVar201;
        auVar133._20_4_ = fVar204;
        auVar133._24_4_ = fVar207;
        auVar133._28_4_ = fVar306;
        auVar299._0_4_ = local_7c0 + fVar229;
        auVar299._4_4_ = fStack_7bc + fVar250;
        auVar299._8_4_ = fStack_7b8 + fVar270;
        auVar299._12_4_ = fStack_7b4 + fVar273;
        auVar299._16_4_ = fVar201 + fVar278;
        auVar299._20_4_ = fVar204 + fVar279;
        auVar299._24_4_ = fVar207 + fVar289;
        auVar299._28_4_ = fVar306 + fVar394;
        fVar229 = local_840._0_4_ * fVar249 * fVar253;
        fVar250 = local_840._4_4_ * fVar275 * fVar277;
        auVar59._4_4_ = fVar250;
        auVar59._0_4_ = fVar229;
        fVar249 = local_840._8_4_ * fVar280 * fVar288;
        auVar59._8_4_ = fVar249;
        fVar270 = local_840._12_4_ * fVar291 * fVar292;
        auVar59._12_4_ = fVar270;
        fVar273 = local_840._16_4_ * fVar334 * fVar252;
        auVar59._16_4_ = fVar273;
        fVar275 = local_840._20_4_ * fVar358 * fVar254;
        auVar59._20_4_ = fVar275;
        fVar278 = local_840._24_4_ * fVar362 * fVar257;
        auVar59._24_4_ = fVar278;
        auVar59._28_4_ = auVar42._28_4_;
        auVar342 = vsubps_avx(auVar312,auVar56);
        auVar353._0_4_ = auVar264._0_4_ + fVar229;
        auVar353._4_4_ = auVar264._4_4_ + fVar250;
        auVar353._8_4_ = auVar264._8_4_ + fVar249;
        auVar353._12_4_ = auVar264._12_4_ + fVar270;
        auVar353._16_4_ = auVar264._16_4_ + fVar273;
        auVar353._20_4_ = auVar264._20_4_ + fVar275;
        auVar353._24_4_ = auVar264._24_4_ + fVar278;
        auVar353._28_4_ = auVar264._28_4_ + auVar42._28_4_;
        fVar229 = local_840._0_4_ * fVar253 * -fVar230;
        fVar250 = local_840._4_4_ * fVar277 * -fVar152;
        auVar60._4_4_ = fVar250;
        auVar60._0_4_ = fVar229;
        fVar249 = local_840._8_4_ * fVar288 * -fVar176;
        auVar60._8_4_ = fVar249;
        fVar270 = local_840._12_4_ * fVar292 * -fVar228;
        auVar60._12_4_ = fVar270;
        fVar273 = local_840._16_4_ * fVar252 * -fVar177;
        auVar60._16_4_ = fVar273;
        fVar275 = local_840._20_4_ * fVar254 * -fVar179;
        auVar60._20_4_ = fVar275;
        fVar278 = local_840._24_4_ * fVar257 * -fVar199;
        auVar60._24_4_ = fVar278;
        auVar60._28_4_ = fVar404;
        auVar45 = vsubps_avx(auVar379,auVar57);
        auVar369._0_4_ = fVar229 + auVar240._0_4_;
        auVar369._4_4_ = fVar250 + auVar240._4_4_;
        auVar369._8_4_ = fVar249 + auVar240._8_4_;
        auVar369._12_4_ = fVar270 + auVar240._12_4_;
        auVar369._16_4_ = fVar273 + auVar240._16_4_;
        auVar369._20_4_ = fVar275 + auVar240._20_4_;
        auVar369._24_4_ = fVar278 + auVar240._24_4_;
        auVar369._28_4_ = fVar404 + auVar240._28_4_;
        fVar229 = fVar253 * 0.0 * local_840._0_4_;
        fVar250 = fVar277 * 0.0 * local_840._4_4_;
        auVar61._4_4_ = fVar250;
        auVar61._0_4_ = fVar229;
        fVar249 = fVar288 * 0.0 * local_840._8_4_;
        auVar61._8_4_ = fVar249;
        fVar253 = fVar292 * 0.0 * local_840._12_4_;
        auVar61._12_4_ = fVar253;
        fVar270 = fVar252 * 0.0 * local_840._16_4_;
        auVar61._16_4_ = fVar270;
        fVar273 = fVar254 * 0.0 * local_840._20_4_;
        auVar61._20_4_ = fVar273;
        fVar275 = fVar257 * 0.0 * local_840._24_4_;
        auVar61._24_4_ = fVar275;
        auVar61._28_4_ = fVar295;
        auVar46 = vsubps_avx(auVar133,auVar58);
        auVar407._0_4_ = (float)local_480._0_4_ + fVar229;
        auVar407._4_4_ = (float)local_480._4_4_ + fVar250;
        auVar407._8_4_ = fStack_478 + fVar249;
        auVar407._12_4_ = fStack_474 + fVar253;
        auVar407._16_4_ = fStack_470 + fVar270;
        auVar407._20_4_ = fStack_46c + fVar273;
        auVar407._24_4_ = fStack_468 + fVar275;
        auVar407._28_4_ = fStack_464 + fVar295;
        auVar165 = vsubps_avx(auVar264,auVar59);
        auVar172 = vsubps_avx(auVar240,auVar60);
        auVar41 = vsubps_avx(_local_480,auVar61);
        auVar42 = vsubps_avx(auVar369,auVar45);
        auVar43 = vsubps_avx(auVar407,auVar46);
        auVar62._4_4_ = auVar46._4_4_ * auVar42._4_4_;
        auVar62._0_4_ = auVar46._0_4_ * auVar42._0_4_;
        auVar62._8_4_ = auVar46._8_4_ * auVar42._8_4_;
        auVar62._12_4_ = auVar46._12_4_ * auVar42._12_4_;
        auVar62._16_4_ = auVar46._16_4_ * auVar42._16_4_;
        auVar62._20_4_ = auVar46._20_4_ * auVar42._20_4_;
        auVar62._24_4_ = auVar46._24_4_ * auVar42._24_4_;
        auVar62._28_4_ = fVar404;
        auVar63._4_4_ = auVar45._4_4_ * auVar43._4_4_;
        auVar63._0_4_ = auVar45._0_4_ * auVar43._0_4_;
        auVar63._8_4_ = auVar45._8_4_ * auVar43._8_4_;
        auVar63._12_4_ = auVar45._12_4_ * auVar43._12_4_;
        auVar63._16_4_ = auVar45._16_4_ * auVar43._16_4_;
        auVar63._20_4_ = auVar45._20_4_ * auVar43._20_4_;
        auVar63._24_4_ = auVar45._24_4_ * auVar43._24_4_;
        auVar63._28_4_ = auVar240._28_4_;
        auVar44 = vsubps_avx(auVar63,auVar62);
        auVar64._4_4_ = auVar342._4_4_ * auVar43._4_4_;
        auVar64._0_4_ = auVar342._0_4_ * auVar43._0_4_;
        auVar64._8_4_ = auVar342._8_4_ * auVar43._8_4_;
        auVar64._12_4_ = auVar342._12_4_ * auVar43._12_4_;
        auVar64._16_4_ = auVar342._16_4_ * auVar43._16_4_;
        auVar64._20_4_ = auVar342._20_4_ * auVar43._20_4_;
        auVar64._24_4_ = auVar342._24_4_ * auVar43._24_4_;
        auVar64._28_4_ = auVar43._28_4_;
        auVar47 = vsubps_avx(auVar353,auVar342);
        auVar65._4_4_ = auVar46._4_4_ * auVar47._4_4_;
        auVar65._0_4_ = auVar46._0_4_ * auVar47._0_4_;
        auVar65._8_4_ = auVar46._8_4_ * auVar47._8_4_;
        auVar65._12_4_ = auVar46._12_4_ * auVar47._12_4_;
        auVar65._16_4_ = auVar46._16_4_ * auVar47._16_4_;
        auVar65._20_4_ = auVar46._20_4_ * auVar47._20_4_;
        auVar65._24_4_ = auVar46._24_4_ * auVar47._24_4_;
        auVar65._28_4_ = auVar264._28_4_;
        auVar40 = vsubps_avx(auVar65,auVar64);
        auVar66._4_4_ = auVar47._4_4_ * auVar45._4_4_;
        auVar66._0_4_ = auVar47._0_4_ * auVar45._0_4_;
        auVar66._8_4_ = auVar47._8_4_ * auVar45._8_4_;
        auVar66._12_4_ = auVar47._12_4_ * auVar45._12_4_;
        auVar66._16_4_ = auVar47._16_4_ * auVar45._16_4_;
        auVar66._20_4_ = auVar47._20_4_ * auVar45._20_4_;
        auVar66._24_4_ = auVar47._24_4_ * auVar45._24_4_;
        auVar66._28_4_ = auVar43._28_4_;
        auVar67._4_4_ = auVar342._4_4_ * auVar42._4_4_;
        auVar67._0_4_ = auVar342._0_4_ * auVar42._0_4_;
        auVar67._8_4_ = auVar342._8_4_ * auVar42._8_4_;
        auVar67._12_4_ = auVar342._12_4_ * auVar42._12_4_;
        auVar67._16_4_ = auVar342._16_4_ * auVar42._16_4_;
        auVar67._20_4_ = auVar342._20_4_ * auVar42._20_4_;
        auVar67._24_4_ = auVar342._24_4_ * auVar42._24_4_;
        auVar67._28_4_ = auVar42._28_4_;
        auVar42 = vsubps_avx(auVar67,auVar66);
        auVar163._0_4_ = auVar44._0_4_ * 0.0 + auVar42._0_4_ + auVar40._0_4_ * 0.0;
        auVar163._4_4_ = auVar44._4_4_ * 0.0 + auVar42._4_4_ + auVar40._4_4_ * 0.0;
        auVar163._8_4_ = auVar44._8_4_ * 0.0 + auVar42._8_4_ + auVar40._8_4_ * 0.0;
        auVar163._12_4_ = auVar44._12_4_ * 0.0 + auVar42._12_4_ + auVar40._12_4_ * 0.0;
        auVar163._16_4_ = auVar44._16_4_ * 0.0 + auVar42._16_4_ + auVar40._16_4_ * 0.0;
        auVar163._20_4_ = auVar44._20_4_ * 0.0 + auVar42._20_4_ + auVar40._20_4_ * 0.0;
        auVar163._24_4_ = auVar44._24_4_ * 0.0 + auVar42._24_4_ + auVar40._24_4_ * 0.0;
        auVar163._28_4_ = auVar42._28_4_ + auVar42._28_4_ + auVar40._28_4_;
        auVar47 = vcmpps_avx(auVar163,ZEXT432(0) << 0x20,2);
        auVar165 = vblendvps_avx(auVar165,_local_7e0,auVar47);
        auVar172 = vblendvps_avx(auVar172,_local_5a0,auVar47);
        auVar41 = vblendvps_avx(auVar41,auVar299,auVar47);
        auVar303 = ZEXT3264(auVar41);
        auVar42 = vblendvps_avx(auVar342,auVar353,auVar47);
        auVar43 = vblendvps_avx(auVar45,auVar369,auVar47);
        auVar44 = vblendvps_avx(auVar46,auVar407,auVar47);
        auVar342 = vblendvps_avx(auVar353,auVar342,auVar47);
        auVar45 = vblendvps_avx(auVar369,auVar45,auVar47);
        auVar214 = vpackssdw_avx(local_460._0_16_,local_460._16_16_);
        auVar46 = vblendvps_avx(auVar407,auVar46,auVar47);
        auVar342 = vsubps_avx(auVar342,auVar165);
        auVar40 = vsubps_avx(auVar45,auVar172);
        auVar46 = vsubps_avx(auVar46,auVar41);
        auVar157 = vsubps_avx(auVar172,auVar43);
        fVar229 = auVar40._0_4_;
        fVar204 = auVar41._0_4_;
        fVar273 = auVar40._4_4_;
        fVar205 = auVar41._4_4_;
        auVar68._4_4_ = fVar205 * fVar273;
        auVar68._0_4_ = fVar204 * fVar229;
        fVar280 = auVar40._8_4_;
        fVar207 = auVar41._8_4_;
        auVar68._8_4_ = fVar207 * fVar280;
        fVar292 = auVar40._12_4_;
        fVar208 = auVar41._12_4_;
        auVar68._12_4_ = fVar208 * fVar292;
        fVar359 = auVar40._16_4_;
        fVar306 = auVar41._16_4_;
        auVar68._16_4_ = fVar306 * fVar359;
        fVar360 = auVar40._20_4_;
        fVar230 = auVar41._20_4_;
        auVar68._20_4_ = fVar230 * fVar360;
        fVar178 = auVar40._24_4_;
        fVar152 = auVar41._24_4_;
        auVar68._24_4_ = fVar152 * fVar178;
        auVar68._28_4_ = auVar45._28_4_;
        fVar250 = auVar172._0_4_;
        fVar319 = auVar46._0_4_;
        fVar275 = auVar172._4_4_;
        fVar330 = auVar46._4_4_;
        auVar69._4_4_ = fVar330 * fVar275;
        auVar69._0_4_ = fVar319 * fVar250;
        fVar288 = auVar172._8_4_;
        fVar331 = auVar46._8_4_;
        auVar69._8_4_ = fVar331 * fVar288;
        fVar293 = auVar172._12_4_;
        fVar332 = auVar46._12_4_;
        auVar69._12_4_ = fVar332 * fVar293;
        fVar304 = auVar172._16_4_;
        fVar335 = auVar46._16_4_;
        auVar69._16_4_ = fVar335 * fVar304;
        fVar362 = auVar172._20_4_;
        fVar346 = auVar46._20_4_;
        auVar69._20_4_ = fVar346 * fVar362;
        fVar180 = auVar172._24_4_;
        fVar347 = auVar46._24_4_;
        auVar69._24_4_ = fVar347 * fVar180;
        auVar69._28_4_ = auVar369._28_4_;
        auVar172 = vsubps_avx(auVar69,auVar68);
        fVar249 = auVar165._0_4_;
        fVar277 = auVar165._4_4_;
        auVar70._4_4_ = fVar330 * fVar277;
        auVar70._0_4_ = fVar319 * fVar249;
        fVar289 = auVar165._8_4_;
        auVar70._8_4_ = fVar331 * fVar289;
        fVar333 = auVar165._12_4_;
        auVar70._12_4_ = fVar332 * fVar333;
        fVar358 = auVar165._16_4_;
        auVar70._16_4_ = fVar335 * fVar358;
        fVar257 = auVar165._20_4_;
        auVar70._20_4_ = fVar346 * fVar257;
        fVar200 = auVar165._24_4_;
        auVar70._24_4_ = fVar347 * fVar200;
        auVar70._28_4_ = auVar369._28_4_;
        fVar253 = auVar342._0_4_;
        auVar399._0_4_ = fVar204 * fVar253;
        fVar278 = auVar342._4_4_;
        auVar399._4_4_ = fVar205 * fVar278;
        fVar290 = auVar342._8_4_;
        auVar399._8_4_ = fVar207 * fVar290;
        fVar334 = auVar342._12_4_;
        auVar399._12_4_ = fVar208 * fVar334;
        fVar254 = auVar342._16_4_;
        auVar399._16_4_ = fVar306 * fVar254;
        fVar305 = auVar342._20_4_;
        auVar399._20_4_ = fVar230 * fVar305;
        fVar201 = auVar342._24_4_;
        auVar399._24_4_ = fVar152 * fVar201;
        auVar399._28_4_ = 0;
        auVar45 = vsubps_avx(auVar399,auVar70);
        auVar71._4_4_ = fVar275 * fVar278;
        auVar71._0_4_ = fVar250 * fVar253;
        auVar71._8_4_ = fVar288 * fVar290;
        auVar71._12_4_ = fVar293 * fVar334;
        auVar71._16_4_ = fVar304 * fVar254;
        auVar71._20_4_ = fVar362 * fVar305;
        auVar71._24_4_ = fVar180 * fVar201;
        auVar71._28_4_ = auVar369._28_4_;
        auVar72._4_4_ = fVar277 * fVar273;
        auVar72._0_4_ = fVar249 * fVar229;
        auVar72._8_4_ = fVar289 * fVar280;
        auVar72._12_4_ = fVar333 * fVar292;
        auVar72._16_4_ = fVar358 * fVar359;
        auVar72._20_4_ = fVar257 * fVar360;
        auVar72._24_4_ = fVar200 * fVar178;
        auVar72._28_4_ = auVar407._28_4_;
        auVar158 = vsubps_avx(auVar72,auVar71);
        auVar186 = vsubps_avx(auVar41,auVar44);
        fVar270 = auVar158._28_4_ + auVar45._28_4_;
        auVar190._0_4_ = auVar158._0_4_ + auVar45._0_4_ * 0.0 + auVar172._0_4_ * 0.0;
        auVar190._4_4_ = auVar158._4_4_ + auVar45._4_4_ * 0.0 + auVar172._4_4_ * 0.0;
        auVar190._8_4_ = auVar158._8_4_ + auVar45._8_4_ * 0.0 + auVar172._8_4_ * 0.0;
        auVar190._12_4_ = auVar158._12_4_ + auVar45._12_4_ * 0.0 + auVar172._12_4_ * 0.0;
        auVar190._16_4_ = auVar158._16_4_ + auVar45._16_4_ * 0.0 + auVar172._16_4_ * 0.0;
        auVar190._20_4_ = auVar158._20_4_ + auVar45._20_4_ * 0.0 + auVar172._20_4_ * 0.0;
        auVar190._24_4_ = auVar158._24_4_ + auVar45._24_4_ * 0.0 + auVar172._24_4_ * 0.0;
        auVar190._28_4_ = fVar270 + auVar172._28_4_;
        fVar176 = auVar157._0_4_;
        fVar228 = auVar157._4_4_;
        auVar73._4_4_ = fVar228 * auVar44._4_4_;
        auVar73._0_4_ = fVar176 * auVar44._0_4_;
        fVar177 = auVar157._8_4_;
        auVar73._8_4_ = fVar177 * auVar44._8_4_;
        fVar179 = auVar157._12_4_;
        auVar73._12_4_ = fVar179 * auVar44._12_4_;
        fVar199 = auVar157._16_4_;
        auVar73._16_4_ = fVar199 * auVar44._16_4_;
        fVar295 = auVar157._20_4_;
        auVar73._20_4_ = fVar295 * auVar44._20_4_;
        fVar202 = auVar157._24_4_;
        auVar73._24_4_ = fVar202 * auVar44._24_4_;
        auVar73._28_4_ = fVar270;
        fVar270 = auVar186._0_4_;
        fVar279 = auVar186._4_4_;
        auVar74._4_4_ = auVar43._4_4_ * fVar279;
        auVar74._0_4_ = auVar43._0_4_ * fVar270;
        fVar291 = auVar186._8_4_;
        auVar74._8_4_ = auVar43._8_4_ * fVar291;
        fVar252 = auVar186._12_4_;
        auVar74._12_4_ = auVar43._12_4_ * fVar252;
        fVar361 = auVar186._16_4_;
        auVar74._16_4_ = auVar43._16_4_ * fVar361;
        fVar294 = auVar186._20_4_;
        auVar74._20_4_ = auVar43._20_4_ * fVar294;
        fVar203 = auVar186._24_4_;
        auVar74._24_4_ = auVar43._24_4_ * fVar203;
        auVar74._28_4_ = auVar158._28_4_;
        auVar45 = vsubps_avx(auVar74,auVar73);
        auVar165 = vsubps_avx(auVar165,auVar42);
        fVar348 = auVar165._0_4_;
        fVar356 = auVar165._4_4_;
        auVar75._4_4_ = fVar356 * auVar44._4_4_;
        auVar75._0_4_ = fVar348 * auVar44._0_4_;
        fVar357 = auVar165._8_4_;
        auVar75._8_4_ = fVar357 * auVar44._8_4_;
        fVar363 = auVar165._12_4_;
        auVar75._12_4_ = fVar363 * auVar44._12_4_;
        fVar370 = auVar165._16_4_;
        auVar75._16_4_ = fVar370 * auVar44._16_4_;
        fVar371 = auVar165._20_4_;
        auVar75._20_4_ = fVar371 * auVar44._20_4_;
        fVar372 = auVar165._24_4_;
        auVar75._24_4_ = fVar372 * auVar44._24_4_;
        auVar75._28_4_ = auVar44._28_4_;
        auVar76._4_4_ = auVar42._4_4_ * fVar279;
        auVar76._0_4_ = auVar42._0_4_ * fVar270;
        auVar76._8_4_ = auVar42._8_4_ * fVar291;
        auVar76._12_4_ = auVar42._12_4_ * fVar252;
        auVar76._16_4_ = auVar42._16_4_ * fVar361;
        auVar76._20_4_ = auVar42._20_4_ * fVar294;
        auVar76._24_4_ = auVar42._24_4_ * fVar203;
        auVar76._28_4_ = auVar172._28_4_;
        auVar165 = vsubps_avx(auVar75,auVar76);
        auVar77._4_4_ = auVar43._4_4_ * fVar356;
        auVar77._0_4_ = auVar43._0_4_ * fVar348;
        auVar77._8_4_ = auVar43._8_4_ * fVar357;
        auVar77._12_4_ = auVar43._12_4_ * fVar363;
        auVar77._16_4_ = auVar43._16_4_ * fVar370;
        auVar77._20_4_ = auVar43._20_4_ * fVar371;
        auVar77._24_4_ = auVar43._24_4_ * fVar372;
        auVar77._28_4_ = auVar44._28_4_;
        auVar78._4_4_ = auVar42._4_4_ * fVar228;
        auVar78._0_4_ = auVar42._0_4_ * fVar176;
        auVar78._8_4_ = auVar42._8_4_ * fVar177;
        auVar78._12_4_ = auVar42._12_4_ * fVar179;
        auVar78._16_4_ = auVar42._16_4_ * fVar199;
        auVar78._20_4_ = auVar42._20_4_ * fVar295;
        auVar78._24_4_ = auVar42._24_4_ * fVar202;
        auVar78._28_4_ = auVar42._28_4_;
        auVar172 = vsubps_avx(auVar78,auVar77);
        auVar175 = ZEXT864(0) << 0x20;
        auVar267._0_4_ = auVar45._0_4_ * 0.0 + auVar172._0_4_ + auVar165._0_4_ * 0.0;
        auVar267._4_4_ = auVar45._4_4_ * 0.0 + auVar172._4_4_ + auVar165._4_4_ * 0.0;
        auVar267._8_4_ = auVar45._8_4_ * 0.0 + auVar172._8_4_ + auVar165._8_4_ * 0.0;
        auVar267._12_4_ = auVar45._12_4_ * 0.0 + auVar172._12_4_ + auVar165._12_4_ * 0.0;
        auVar267._16_4_ = auVar45._16_4_ * 0.0 + auVar172._16_4_ + auVar165._16_4_ * 0.0;
        auVar267._20_4_ = auVar45._20_4_ * 0.0 + auVar172._20_4_ + auVar165._20_4_ * 0.0;
        auVar267._24_4_ = auVar45._24_4_ * 0.0 + auVar172._24_4_ + auVar165._24_4_ * 0.0;
        auVar267._28_4_ = auVar172._28_4_ + auVar172._28_4_ + auVar165._28_4_;
        auVar165 = vmaxps_avx(auVar190,auVar267);
        auVar165 = vcmpps_avx(auVar165,ZEXT832(0) << 0x20,2);
        auVar212 = vpackssdw_avx(auVar165._0_16_,auVar165._16_16_);
        auVar214 = vpand_avx(auVar212,auVar214);
        auVar212 = vpmovsxwd_avx(auVar214);
        auVar235 = vpunpckhwd_avx(auVar214,auVar214);
        auVar242._16_16_ = auVar235;
        auVar242._0_16_ = auVar212;
        if ((((((((auVar242 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar242 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar242 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar242 >> 0x7f,0) == '\0') &&
              (auVar242 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar235 >> 0x3f,0) == '\0') &&
            (auVar242 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar235[0xf]) {
LAB_011595c0:
          auVar315 = ZEXT3264(local_640);
          auVar246 = ZEXT3264(auVar242);
          auVar329 = ZEXT3264(CONCAT824(uStack_648,
                                        CONCAT816(uStack_650,CONCAT88(uStack_658,local_660))));
        }
        else {
          auVar79._4_4_ = fVar279 * fVar273;
          auVar79._0_4_ = fVar270 * fVar229;
          auVar79._8_4_ = fVar291 * fVar280;
          auVar79._12_4_ = fVar252 * fVar292;
          auVar79._16_4_ = fVar361 * fVar359;
          auVar79._20_4_ = fVar294 * fVar360;
          auVar79._24_4_ = fVar203 * fVar178;
          auVar79._28_4_ = auVar235._12_4_;
          auVar380._0_4_ = fVar176 * fVar319;
          auVar380._4_4_ = fVar228 * fVar330;
          auVar380._8_4_ = fVar177 * fVar331;
          auVar380._12_4_ = fVar179 * fVar332;
          auVar380._16_4_ = fVar199 * fVar335;
          auVar380._20_4_ = fVar295 * fVar346;
          auVar380._24_4_ = fVar202 * fVar347;
          auVar380._28_4_ = 0;
          auVar165 = vsubps_avx(auVar380,auVar79);
          auVar80._4_4_ = fVar356 * fVar330;
          auVar80._0_4_ = fVar348 * fVar319;
          auVar80._8_4_ = fVar357 * fVar331;
          auVar80._12_4_ = fVar363 * fVar332;
          auVar80._16_4_ = fVar370 * fVar335;
          auVar80._20_4_ = fVar371 * fVar346;
          auVar80._24_4_ = fVar372 * fVar347;
          auVar80._28_4_ = auVar46._28_4_;
          auVar81._4_4_ = fVar279 * fVar278;
          auVar81._0_4_ = fVar270 * fVar253;
          auVar81._8_4_ = fVar291 * fVar290;
          auVar81._12_4_ = fVar252 * fVar334;
          auVar81._16_4_ = fVar361 * fVar254;
          auVar81._20_4_ = fVar294 * fVar305;
          auVar81._24_4_ = fVar203 * fVar201;
          auVar81._28_4_ = auVar186._28_4_;
          auVar172 = vsubps_avx(auVar81,auVar80);
          auVar82._4_4_ = fVar228 * fVar278;
          auVar82._0_4_ = fVar176 * fVar253;
          auVar82._8_4_ = fVar177 * fVar290;
          auVar82._12_4_ = fVar179 * fVar334;
          auVar82._16_4_ = fVar199 * fVar254;
          auVar82._20_4_ = fVar295 * fVar305;
          auVar82._24_4_ = fVar202 * fVar201;
          auVar82._28_4_ = auVar190._28_4_;
          auVar83._4_4_ = fVar356 * fVar273;
          auVar83._0_4_ = fVar348 * fVar229;
          auVar83._8_4_ = fVar357 * fVar280;
          auVar83._12_4_ = fVar363 * fVar292;
          auVar83._16_4_ = fVar370 * fVar359;
          auVar83._20_4_ = fVar371 * fVar360;
          auVar83._24_4_ = fVar372 * fVar178;
          auVar83._28_4_ = auVar40._28_4_;
          auVar43 = vsubps_avx(auVar83,auVar82);
          auVar313._0_4_ = auVar165._0_4_ * 0.0 + auVar43._0_4_ + auVar172._0_4_ * 0.0;
          auVar313._4_4_ = auVar165._4_4_ * 0.0 + auVar43._4_4_ + auVar172._4_4_ * 0.0;
          auVar313._8_4_ = auVar165._8_4_ * 0.0 + auVar43._8_4_ + auVar172._8_4_ * 0.0;
          auVar313._12_4_ = auVar165._12_4_ * 0.0 + auVar43._12_4_ + auVar172._12_4_ * 0.0;
          auVar313._16_4_ = auVar165._16_4_ * 0.0 + auVar43._16_4_ + auVar172._16_4_ * 0.0;
          auVar313._20_4_ = auVar165._20_4_ * 0.0 + auVar43._20_4_ + auVar172._20_4_ * 0.0;
          auVar313._24_4_ = auVar165._24_4_ * 0.0 + auVar43._24_4_ + auVar172._24_4_ * 0.0;
          auVar313._28_4_ = auVar40._28_4_ + auVar43._28_4_ + auVar190._28_4_;
          auVar42 = vrcpps_avx(auVar313);
          fVar229 = auVar42._0_4_;
          fVar253 = auVar42._4_4_;
          auVar84._4_4_ = auVar313._4_4_ * fVar253;
          auVar84._0_4_ = auVar313._0_4_ * fVar229;
          fVar270 = auVar42._8_4_;
          auVar84._8_4_ = auVar313._8_4_ * fVar270;
          fVar273 = auVar42._12_4_;
          auVar84._12_4_ = auVar313._12_4_ * fVar273;
          fVar278 = auVar42._16_4_;
          auVar84._16_4_ = auVar313._16_4_ * fVar278;
          fVar279 = auVar42._20_4_;
          auVar84._20_4_ = auVar313._20_4_ * fVar279;
          fVar280 = auVar42._24_4_;
          auVar84._24_4_ = auVar313._24_4_ * fVar280;
          auVar84._28_4_ = auVar186._28_4_;
          auVar381._8_4_ = 0x3f800000;
          auVar381._0_8_ = 0x3f8000003f800000;
          auVar381._12_4_ = 0x3f800000;
          auVar381._16_4_ = 0x3f800000;
          auVar381._20_4_ = 0x3f800000;
          auVar381._24_4_ = 0x3f800000;
          auVar381._28_4_ = 0x3f800000;
          auVar44 = vsubps_avx(auVar381,auVar84);
          fVar229 = auVar44._0_4_ * fVar229 + fVar229;
          fVar253 = auVar44._4_4_ * fVar253 + fVar253;
          fVar270 = auVar44._8_4_ * fVar270 + fVar270;
          fVar273 = auVar44._12_4_ * fVar273 + fVar273;
          fVar278 = auVar44._16_4_ * fVar278 + fVar278;
          fVar279 = auVar44._20_4_ * fVar279 + fVar279;
          fVar280 = auVar44._24_4_ * fVar280 + fVar280;
          auVar85._4_4_ =
               (auVar165._4_4_ * fVar277 + auVar172._4_4_ * fVar275 + auVar43._4_4_ * fVar205) *
               fVar253;
          auVar85._0_4_ =
               (auVar165._0_4_ * fVar249 + auVar172._0_4_ * fVar250 + auVar43._0_4_ * fVar204) *
               fVar229;
          auVar85._8_4_ =
               (auVar165._8_4_ * fVar289 + auVar172._8_4_ * fVar288 + auVar43._8_4_ * fVar207) *
               fVar270;
          auVar85._12_4_ =
               (auVar165._12_4_ * fVar333 + auVar172._12_4_ * fVar293 + auVar43._12_4_ * fVar208) *
               fVar273;
          auVar85._16_4_ =
               (auVar165._16_4_ * fVar358 + auVar172._16_4_ * fVar304 + auVar43._16_4_ * fVar306) *
               fVar278;
          auVar85._20_4_ =
               (auVar165._20_4_ * fVar257 + auVar172._20_4_ * fVar362 + auVar43._20_4_ * fVar230) *
               fVar279;
          auVar85._24_4_ =
               (auVar165._24_4_ * fVar200 + auVar172._24_4_ * fVar180 + auVar43._24_4_ * fVar152) *
               fVar280;
          auVar85._28_4_ = auVar342._28_4_ + auVar41._28_4_;
          auVar212 = vpermilps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0);
          auVar164._16_16_ = auVar212;
          auVar164._0_16_ = auVar212;
          auVar165 = vcmpps_avx(auVar164,auVar85,2);
          uVar12 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar243._4_4_ = uVar12;
          auVar243._0_4_ = uVar12;
          auVar243._8_4_ = uVar12;
          auVar243._12_4_ = uVar12;
          auVar243._16_4_ = uVar12;
          auVar243._20_4_ = uVar12;
          auVar243._24_4_ = uVar12;
          auVar243._28_4_ = uVar12;
          auVar172 = vcmpps_avx(auVar85,auVar243,2);
          auVar165 = vandps_avx(auVar172,auVar165);
          auVar212 = vpackssdw_avx(auVar165._0_16_,auVar165._16_16_);
          auVar214 = vpand_avx(auVar214,auVar212);
          auVar212 = vpmovsxwd_avx(auVar214);
          auVar235 = vpshufd_avx(auVar214,0xee);
          auVar235 = vpmovsxwd_avx(auVar235);
          auVar303 = ZEXT1664(auVar235);
          auVar242._16_16_ = auVar235;
          auVar242._0_16_ = auVar212;
          auVar315 = ZEXT3264(local_640);
          if ((((((((auVar242 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar242 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar242 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar242 >> 0x7f,0) == '\0') &&
                (auVar242 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar235 >> 0x3f,0) == '\0') &&
              (auVar242 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar235[0xf]) goto LAB_011595c0;
          auVar165 = vcmpps_avx(ZEXT832(0) << 0x20,auVar313,4);
          auVar212 = vpackssdw_avx(auVar165._0_16_,auVar165._16_16_);
          auVar214 = vpand_avx(auVar214,auVar212);
          auVar212 = vpmovsxwd_avx(auVar214);
          auVar246 = ZEXT1664(auVar212);
          auVar214 = vpunpckhwd_avx(auVar214,auVar214);
          auVar300._16_16_ = auVar214;
          auVar300._0_16_ = auVar212;
          auVar303 = ZEXT3264(auVar300);
          auVar329 = ZEXT3264(CONCAT824(uStack_648,
                                        CONCAT816(uStack_650,CONCAT88(uStack_658,local_660))));
          if ((((((((auVar300 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar300 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar300 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar300 >> 0x7f,0) != '\0') ||
                (auVar300 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar214 >> 0x3f,0) != '\0') ||
              (auVar300 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar214[0xf] < '\0') {
            auVar86._4_4_ = auVar190._4_4_ * fVar253;
            auVar86._0_4_ = auVar190._0_4_ * fVar229;
            auVar86._8_4_ = auVar190._8_4_ * fVar270;
            auVar86._12_4_ = auVar190._12_4_ * fVar273;
            auVar86._16_4_ = auVar190._16_4_ * fVar278;
            auVar86._20_4_ = auVar190._20_4_ * fVar279;
            auVar86._24_4_ = auVar190._24_4_ * fVar280;
            auVar86._28_4_ = SUB84(uStack_648,4);
            auVar87._4_4_ = auVar267._4_4_ * fVar253;
            auVar87._0_4_ = auVar267._0_4_ * fVar229;
            auVar87._8_4_ = auVar267._8_4_ * fVar270;
            auVar87._12_4_ = auVar267._12_4_ * fVar273;
            auVar87._16_4_ = auVar267._16_4_ * fVar278;
            auVar87._20_4_ = auVar267._20_4_ * fVar279;
            auVar87._24_4_ = auVar267._24_4_ * fVar280;
            auVar87._28_4_ = auVar44._28_4_ + auVar42._28_4_;
            auVar268._8_4_ = 0x3f800000;
            auVar268._0_8_ = 0x3f8000003f800000;
            auVar268._12_4_ = 0x3f800000;
            auVar268._16_4_ = 0x3f800000;
            auVar268._20_4_ = 0x3f800000;
            auVar268._24_4_ = 0x3f800000;
            auVar268._28_4_ = 0x3f800000;
            auVar165 = vsubps_avx(auVar268,auVar86);
            auVar246 = ZEXT3264(auVar165);
            auVar165 = vblendvps_avx(auVar165,auVar86,auVar47);
            auVar315 = ZEXT3264(auVar165);
            auVar165 = vsubps_avx(auVar268,auVar87);
            _local_4c0 = vblendvps_avx(auVar165,auVar87,auVar47);
            auVar329 = ZEXT3264(auVar300);
            local_4a0 = auVar85;
          }
        }
        local_640 = auVar315._0_32_;
        auVar165 = auVar329._0_32_;
        auVar342 = local_640;
        if ((((((((auVar165 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar165 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar165 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar165 >> 0x7f,0) != '\0') ||
              (auVar329 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar165 >> 0xbf,0) != '\0') ||
            (auVar329 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar329[0x1f] < '\0') {
          auVar172 = vsubps_avx(local_840,auVar159);
          fVar250 = auVar159._0_4_ + auVar315._0_4_ * auVar172._0_4_;
          fVar249 = auVar159._4_4_ + auVar315._4_4_ * auVar172._4_4_;
          fVar253 = auVar159._8_4_ + auVar315._8_4_ * auVar172._8_4_;
          fVar270 = auVar159._12_4_ + auVar315._12_4_ * auVar172._12_4_;
          fVar273 = auVar159._16_4_ + auVar315._16_4_ * auVar172._16_4_;
          fVar275 = auVar159._20_4_ + auVar315._20_4_ * auVar172._20_4_;
          fVar277 = auVar159._24_4_ + auVar315._24_4_ * auVar172._24_4_;
          fVar278 = auVar172._28_4_ + 0.0;
          fVar229 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
          auVar88._4_4_ = (fVar249 + fVar249) * fVar229;
          auVar88._0_4_ = (fVar250 + fVar250) * fVar229;
          auVar88._8_4_ = (fVar253 + fVar253) * fVar229;
          auVar88._12_4_ = (fVar270 + fVar270) * fVar229;
          auVar88._16_4_ = (fVar273 + fVar273) * fVar229;
          auVar88._20_4_ = (fVar275 + fVar275) * fVar229;
          auVar88._24_4_ = (fVar277 + fVar277) * fVar229;
          auVar88._28_4_ = fVar278 + fVar278;
          auVar172 = vcmpps_avx(local_4a0,auVar88,6);
          auVar41 = auVar165 & auVar172;
          if ((((((((auVar41 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar41 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar41 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar41 >> 0x7f,0) != '\0') ||
                (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar41 >> 0xbf,0) != '\0') ||
              (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar41[0x1f] < '\0') {
            auVar246 = ZEXT3264(CONCAT428(0xbf800000,
                                          CONCAT424(0xbf800000,
                                                    CONCAT420(0xbf800000,
                                                              CONCAT416(0xbf800000,
                                                                        CONCAT412(0xbf800000,
                                                                                  CONCAT48(
                                                  0xbf800000,0xbf800000bf800000)))))));
            local_400 = (float)local_4c0._0_4_ + (float)local_4c0._0_4_ + -1.0;
            fStack_3fc = (float)local_4c0._4_4_ + (float)local_4c0._4_4_ + -1.0;
            fStack_3f8 = (float)uStack_4b8 + (float)uStack_4b8 + -1.0;
            fStack_3f4 = uStack_4b8._4_4_ + uStack_4b8._4_4_ + -1.0;
            fStack_3f0 = (float)uStack_4b0 + (float)uStack_4b0 + -1.0;
            fStack_3ec = uStack_4b0._4_4_ + uStack_4b0._4_4_ + -1.0;
            fStack_3e8 = (float)uStack_4a8 + (float)uStack_4a8 + -1.0;
            fStack_3e4 = uStack_4a8._4_4_ + uStack_4a8._4_4_ + -1.0;
            local_4c0._4_4_ = fStack_3fc;
            local_4c0._0_4_ = local_400;
            uStack_4b8._0_4_ = fStack_3f8;
            uStack_4b8._4_4_ = fStack_3f4;
            uStack_4b0._0_4_ = fStack_3f0;
            uStack_4b0._4_4_ = fStack_3ec;
            auVar141 = _local_4c0;
            uStack_4a8._0_4_ = fStack_3e8;
            uStack_4a8._4_4_ = fStack_3e4;
            auVar41 = _local_4c0;
            local_3e0 = local_4a0;
            local_3c0 = 0;
            uStack_3a8 = uStack_918;
            uStack_398 = uStack_898;
            uStack_388 = uStack_8a8;
            uStack_378 = uStack_8b8;
            _local_4c0 = auVar41;
            if ((pGVar36->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              local_6a0 = vandps_avx(auVar172,auVar165);
              auVar211._0_4_ = 1.0 / auVar233._0_4_;
              auVar211._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar214 = vshufps_avx(auVar211,auVar211,0);
              local_340[0] = auVar214._0_4_ * (auVar315._0_4_ + 0.0);
              local_340[1] = auVar214._4_4_ * (auVar315._4_4_ + 1.0);
              local_340[2] = auVar214._8_4_ * (auVar315._8_4_ + 2.0);
              local_340[3] = auVar214._12_4_ * (auVar315._12_4_ + 3.0);
              fStack_330 = auVar214._0_4_ * (auVar315._16_4_ + 4.0);
              fStack_32c = auVar214._4_4_ * (auVar315._20_4_ + 5.0);
              fStack_328 = auVar214._8_4_ * (auVar315._24_4_ + 6.0);
              fStack_324 = auVar315._28_4_ + 7.0;
              uStack_4b0 = auVar141._16_8_;
              uStack_4a8 = auVar41._24_8_;
              local_320 = local_4c0;
              uStack_318 = uStack_4b8;
              uStack_310 = uStack_4b0;
              uStack_308 = uStack_4a8;
              local_300 = local_4a0;
              auVar191._8_4_ = 0x7f800000;
              auVar191._0_8_ = 0x7f8000007f800000;
              auVar191._12_4_ = 0x7f800000;
              auVar191._16_4_ = 0x7f800000;
              auVar191._20_4_ = 0x7f800000;
              auVar191._24_4_ = 0x7f800000;
              auVar191._28_4_ = 0x7f800000;
              auVar165 = vblendvps_avx(auVar191,local_4a0,local_6a0);
              auVar172 = vshufps_avx(auVar165,auVar165,0xb1);
              auVar172 = vminps_avx(auVar165,auVar172);
              auVar41 = vshufpd_avx(auVar172,auVar172,5);
              auVar172 = vminps_avx(auVar172,auVar41);
              auVar41 = vperm2f128_avx(auVar172,auVar172,1);
              auVar172 = vminps_avx(auVar172,auVar41);
              auVar172 = vcmpps_avx(auVar165,auVar172,0);
              auVar41 = local_6a0 & auVar172;
              auVar165 = local_6a0;
              if ((((((((auVar41 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar41 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar41 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar41 >> 0x7f,0) != '\0') ||
                    (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar41 >> 0xbf,0) != '\0') ||
                  (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar41[0x1f] < '\0') {
                auVar165 = vandps_avx(auVar172,local_6a0);
              }
              uVar143 = vmovmskps_avx(auVar165);
              uVar39 = 0;
              if (uVar143 != 0) {
                for (; (uVar143 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                }
              }
              uVar144 = (ulong)uVar39;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar36->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar229 = local_340[uVar144];
                uVar12 = *(undefined4 *)((long)&local_320 + uVar144 * 4);
                fVar249 = 1.0 - fVar229;
                fVar250 = fVar229 * fVar249 * 4.0;
                auVar303 = ZEXT464(0x3f000000);
                auVar214 = ZEXT416((uint)(fVar229 * fVar229 * 0.5));
                auVar214 = vshufps_avx(auVar214,auVar214,0);
                auVar212 = ZEXT416((uint)((fVar249 * fVar249 + fVar250) * 0.5));
                auVar212 = vshufps_avx(auVar212,auVar212,0);
                auVar235 = ZEXT416((uint)((-fVar229 * fVar229 - fVar250) * 0.5));
                auVar235 = vshufps_avx(auVar235,auVar235,0);
                auVar234 = ZEXT416((uint)(fVar249 * -fVar249 * 0.5));
                auVar234 = vshufps_avx(auVar234,auVar234,0);
                auVar213._0_4_ =
                     auVar234._0_4_ * fVar259 +
                     auVar235._0_4_ * fVar395 + auVar214._0_4_ * fVar373 + auVar212._0_4_ * fVar405;
                auVar213._4_4_ =
                     auVar234._4_4_ * fVar271 +
                     auVar235._4_4_ * fVar401 + auVar214._4_4_ * fVar384 + auVar212._4_4_ * fVar409;
                auVar213._8_4_ =
                     auVar234._8_4_ * auVar262._8_4_ +
                     auVar235._8_4_ * auVar397._8_4_ +
                     auVar214._8_4_ * auVar374._8_4_ + auVar212._8_4_ * auVar406._8_4_;
                auVar213._12_4_ =
                     auVar234._12_4_ * auVar262._12_4_ +
                     auVar235._12_4_ * auVar397._12_4_ +
                     auVar214._12_4_ * auVar374._12_4_ + auVar212._12_4_ * auVar406._12_4_;
                auVar246 = ZEXT464(*(uint *)(local_300 + uVar144 * 4));
                *(uint *)(ray + k * 4 + 0x100) = *(uint *)(local_300 + uVar144 * 4);
                *(float *)(ray + k * 4 + 0x180) = auVar213._0_4_;
                uVar35 = vextractps_avx(auVar213,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar35;
                uVar35 = vextractps_avx(auVar213,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar35;
                *(float *)(ray + k * 4 + 0x1e0) = fVar229;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar12;
                *(uint *)(ray + k * 4 + 0x220) = uVar33;
                *(uint *)(ray + k * 4 + 0x240) = uVar146;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              }
              else {
                auVar214 = vshufps_avx(ZEXT416(uVar146),ZEXT416(uVar146),0);
                local_740._16_16_ = auVar214;
                local_740._0_16_ = auVar214;
                auVar214 = vshufps_avx(ZEXT416(uVar33),ZEXT416(uVar33),0);
                register0x00001210 = auVar214;
                _local_860 = auVar214;
                uStack_7d0 = *(undefined8 *)(local_758 + 0x10);
                uStack_7c8 = *(undefined8 *)(local_758 + 0x18);
                local_580 = ZEXT1632(*local_750);
                fStack_7b0 = (float)uStack_7d0;
                fStack_7ac = (float)((ulong)uStack_7d0 >> 0x20);
                fStack_7a8 = (float)uStack_7c8;
                fStack_7a4 = (float)((ulong)uStack_7c8 >> 0x20);
                _local_7e0 = *local_750;
                auVar329 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                _local_5c0 = *pauVar10;
                local_420 = local_640;
                local_3bc = uVar34;
                local_3b0 = auVar262._0_8_;
                local_3a0 = auVar397._0_8_;
                local_390 = auVar406._0_8_;
                local_380 = auVar374._0_8_;
                while( true ) {
                  local_220 = local_340[uVar144];
                  local_200 = *(undefined4 *)((long)&local_320 + uVar144 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar144 * 4);
                  fVar250 = 1.0 - local_220;
                  fVar229 = local_220 * fVar250 * 4.0;
                  auVar303 = ZEXT464(0x3f000000);
                  auVar214 = ZEXT416((uint)(local_220 * local_220 * 0.5));
                  auVar214 = vshufps_avx(auVar214,auVar214,0);
                  auVar212 = ZEXT416((uint)((fVar250 * fVar250 + fVar229) * 0.5));
                  auVar212 = vshufps_avx(auVar212,auVar212,0);
                  auVar235 = ZEXT416((uint)((-local_220 * local_220 - fVar229) * 0.5));
                  auVar235 = vshufps_avx(auVar235,auVar235,0);
                  local_890.context = context->user;
                  auVar234 = ZEXT416((uint)(fVar250 * -fVar250 * 0.5));
                  auVar234 = vshufps_avx(auVar234,auVar234,0);
                  auVar217._0_4_ =
                       auVar234._0_4_ * fVar259 +
                       auVar235._0_4_ * fVar395 +
                       auVar214._0_4_ * fVar373 + auVar212._0_4_ * fVar405;
                  auVar217._4_4_ =
                       auVar234._4_4_ * fVar271 +
                       auVar235._4_4_ * fVar401 +
                       auVar214._4_4_ * fVar384 + auVar212._4_4_ * fVar409;
                  auVar217._8_4_ =
                       auVar234._8_4_ * auVar262._8_4_ +
                       auVar235._8_4_ * auVar397._8_4_ +
                       auVar214._8_4_ * auVar374._8_4_ + auVar212._8_4_ * auVar406._8_4_;
                  auVar217._12_4_ =
                       auVar234._12_4_ * auVar262._12_4_ +
                       auVar235._12_4_ * auVar397._12_4_ +
                       auVar214._12_4_ * auVar374._12_4_ + auVar212._12_4_ * auVar406._12_4_;
                  auStack_270 = vshufps_avx(auVar217,auVar217,0);
                  local_280[0] = (RTCHitN)auStack_270[0];
                  local_280[1] = (RTCHitN)auStack_270[1];
                  local_280[2] = (RTCHitN)auStack_270[2];
                  local_280[3] = (RTCHitN)auStack_270[3];
                  local_280[4] = (RTCHitN)auStack_270[4];
                  local_280[5] = (RTCHitN)auStack_270[5];
                  local_280[6] = (RTCHitN)auStack_270[6];
                  local_280[7] = (RTCHitN)auStack_270[7];
                  local_280[8] = (RTCHitN)auStack_270[8];
                  local_280[9] = (RTCHitN)auStack_270[9];
                  local_280[10] = (RTCHitN)auStack_270[10];
                  local_280[0xb] = (RTCHitN)auStack_270[0xb];
                  local_280[0xc] = (RTCHitN)auStack_270[0xc];
                  local_280[0xd] = (RTCHitN)auStack_270[0xd];
                  local_280[0xe] = (RTCHitN)auStack_270[0xe];
                  local_280[0xf] = (RTCHitN)auStack_270[0xf];
                  auStack_250 = vshufps_avx(auVar217,auVar217,0x55);
                  local_260 = auStack_250;
                  auStack_230 = vshufps_avx(auVar217,auVar217,0xaa);
                  local_240 = auStack_230;
                  fStack_21c = local_220;
                  fStack_218 = local_220;
                  fStack_214 = local_220;
                  fStack_210 = local_220;
                  fStack_20c = local_220;
                  fStack_208 = local_220;
                  fStack_204 = local_220;
                  uStack_1fc = local_200;
                  uStack_1f8 = local_200;
                  uStack_1f4 = local_200;
                  uStack_1f0 = local_200;
                  uStack_1ec = local_200;
                  uStack_1e8 = local_200;
                  uStack_1e4 = local_200;
                  local_1e0 = local_860;
                  uStack_1d8 = uStack_858;
                  uStack_1d0 = uStack_850;
                  uStack_1c8 = uStack_848;
                  local_1c0 = local_740._0_8_;
                  uStack_1b8 = local_740._8_8_;
                  uStack_1b0 = local_740._16_8_;
                  uStack_1a8 = local_740._24_8_;
                  local_7a0 = vcmpps_avx(auVar175._0_32_,auVar175._0_32_,0xf);
                  local_748[1] = local_7a0;
                  *local_748 = local_7a0;
                  local_1a0 = (local_890.context)->instID[0];
                  uStack_19c = local_1a0;
                  uStack_198 = local_1a0;
                  uStack_194 = local_1a0;
                  uStack_190 = local_1a0;
                  uStack_18c = local_1a0;
                  uStack_188 = local_1a0;
                  uStack_184 = local_1a0;
                  local_180 = (local_890.context)->instPrimID[0];
                  uStack_17c = local_180;
                  uStack_178 = local_180;
                  uStack_174 = local_180;
                  uStack_170 = local_180;
                  uStack_16c = local_180;
                  uStack_168 = local_180;
                  uStack_164 = local_180;
                  local_780 = local_7e0;
                  uStack_778 = uStack_7d8;
                  uStack_770 = uStack_7d0;
                  uStack_768 = uStack_7c8;
                  local_890.valid = (int *)&local_780;
                  local_890.geometryUserPtr = pGVar36->userPtr;
                  local_890.hit = local_280;
                  local_890.N = 8;
                  auVar156._4_4_ = fStack_7bc;
                  auVar156._0_4_ = local_7c0;
                  auVar156._8_4_ = fStack_7b8;
                  auVar156._12_4_ = fStack_7b4;
                  auVar185 = local_580._0_16_;
                  local_890.ray = (RTCRayN *)ray;
                  if (pGVar36->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    local_840._0_16_ = auVar329._0_16_;
                    auVar303 = ZEXT1664(auVar303._0_16_);
                    (*pGVar36->intersectionFilterN)(&local_890);
                    auVar329 = ZEXT1664(local_840._0_16_);
                    auVar315 = ZEXT3264(local_640);
                    auVar175 = ZEXT1664(ZEXT816(0) << 0x40);
                    auVar185._8_8_ = uStack_778;
                    auVar185._0_8_ = local_780;
                    auVar156._8_8_ = uStack_768;
                    auVar156._0_8_ = uStack_770;
                    fVar260 = (float)local_700._0_4_;
                    fVar272 = (float)local_700._4_4_;
                    fVar274 = fStack_6f8;
                    fVar276 = fStack_6f4;
                    fVar248 = fStack_6f0;
                    fVar247 = fStack_6ec;
                    fVar227 = fStack_6e8;
                    fVar255 = fStack_6e4;
                    fVar316 = (float)local_720._0_4_;
                    fVar317 = (float)local_720._4_4_;
                    fVar318 = fStack_718;
                    fVar336 = fStack_714;
                    fVar206 = fStack_710;
                    fVar251 = fStack_70c;
                    fVar256 = fStack_708;
                    fVar258 = fStack_704;
                  }
                  auVar214 = vpcmpeqd_avx(auVar185,ZEXT816(0) << 0x40);
                  auVar212 = vpcmpeqd_avx(auVar156,ZEXT816(0) << 0x40);
                  auVar223._16_16_ = auVar212;
                  auVar223._0_16_ = auVar214;
                  auVar165 = local_7a0 & ~auVar223;
                  if ((((((((auVar165 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar165 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar165 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar165 >> 0x7f,0) == '\0') &&
                        (auVar165 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar165 >> 0xbf,0) == '\0') &&
                      (auVar165 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar165[0x1f]) {
                    auVar173._0_4_ = auVar214._0_4_ ^ local_7a0._0_4_;
                    auVar173._4_4_ = auVar214._4_4_ ^ local_7a0._4_4_;
                    auVar173._8_4_ = auVar214._8_4_ ^ local_7a0._8_4_;
                    auVar173._12_4_ = auVar214._12_4_ ^ local_7a0._12_4_;
                    auVar173._16_4_ = auVar212._0_4_ ^ local_7a0._16_4_;
                    auVar173._20_4_ = auVar212._4_4_ ^ local_7a0._20_4_;
                    auVar173._24_4_ = auVar212._8_4_ ^ local_7a0._24_4_;
                    auVar173._28_4_ = auVar212._12_4_ ^ local_7a0._28_4_;
                  }
                  else {
                    p_Var38 = context->args->filter;
                    if ((p_Var38 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar36->field_8).field_0x2 & 0x40) != 0)))) {
                      local_840._0_16_ = auVar329._0_16_;
                      auVar303 = ZEXT1664(auVar303._0_16_);
                      (*p_Var38)(&local_890);
                      auVar329 = ZEXT1664(local_840._0_16_);
                      auVar315 = ZEXT3264(local_640);
                      auVar175 = ZEXT1664(ZEXT816(0) << 0x40);
                      auVar185._8_8_ = uStack_778;
                      auVar185._0_8_ = local_780;
                      auVar156._8_8_ = uStack_768;
                      auVar156._0_8_ = uStack_770;
                      fVar260 = (float)local_700._0_4_;
                      fVar272 = (float)local_700._4_4_;
                      fVar274 = fStack_6f8;
                      fVar276 = fStack_6f4;
                      fVar248 = fStack_6f0;
                      fVar247 = fStack_6ec;
                      fVar227 = fStack_6e8;
                      fVar255 = fStack_6e4;
                      fVar316 = (float)local_720._0_4_;
                      fVar317 = (float)local_720._4_4_;
                      fVar318 = fStack_718;
                      fVar336 = fStack_714;
                      fVar206 = fStack_710;
                      fVar251 = fStack_70c;
                      fVar256 = fStack_708;
                      fVar258 = fStack_704;
                    }
                    auVar214 = vpcmpeqd_avx(auVar185,ZEXT816(0) << 0x40);
                    auVar212 = vpcmpeqd_avx(auVar156,ZEXT816(0) << 0x40);
                    auVar197._16_16_ = auVar212;
                    auVar197._0_16_ = auVar214;
                    auVar173._0_4_ = auVar214._0_4_ ^ local_7a0._0_4_;
                    auVar173._4_4_ = auVar214._4_4_ ^ local_7a0._4_4_;
                    auVar173._8_4_ = auVar214._8_4_ ^ local_7a0._8_4_;
                    auVar173._12_4_ = auVar214._12_4_ ^ local_7a0._12_4_;
                    auVar173._16_4_ = auVar212._0_4_ ^ local_7a0._16_4_;
                    auVar173._20_4_ = auVar212._4_4_ ^ local_7a0._20_4_;
                    auVar173._24_4_ = auVar212._8_4_ ^ local_7a0._24_4_;
                    auVar173._28_4_ = auVar212._12_4_ ^ local_7a0._28_4_;
                    local_7a0 = local_7a0 & ~auVar197;
                    if ((((((((local_7a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                             || (local_7a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                             ) || (local_7a0 >> 0x5f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(local_7a0 >> 0x7f,0) != '\0') ||
                          (local_7a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(local_7a0 >> 0xbf,0) != '\0') ||
                        (local_7a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        local_7a0[0x1f] < '\0') {
                      auVar165 = vmaskmovps_avx(auVar173,*(undefined1 (*) [32])local_890.hit);
                      *(undefined1 (*) [32])(local_890.ray + 0x180) = auVar165;
                      auVar165 = vmaskmovps_avx(auVar173,*(undefined1 (*) [32])
                                                          (local_890.hit + 0x20));
                      *(undefined1 (*) [32])(local_890.ray + 0x1a0) = auVar165;
                      auVar165 = vmaskmovps_avx(auVar173,*(undefined1 (*) [32])
                                                          (local_890.hit + 0x40));
                      *(undefined1 (*) [32])(local_890.ray + 0x1c0) = auVar165;
                      auVar165 = vmaskmovps_avx(auVar173,*(undefined1 (*) [32])
                                                          (local_890.hit + 0x60));
                      *(undefined1 (*) [32])(local_890.ray + 0x1e0) = auVar165;
                      auVar165 = vmaskmovps_avx(auVar173,*(undefined1 (*) [32])
                                                          (local_890.hit + 0x80));
                      *(undefined1 (*) [32])(local_890.ray + 0x200) = auVar165;
                      auVar165 = vmaskmovps_avx(auVar173,*(undefined1 (*) [32])
                                                          (local_890.hit + 0xa0));
                      *(undefined1 (*) [32])(local_890.ray + 0x220) = auVar165;
                      auVar165 = vmaskmovps_avx(auVar173,*(undefined1 (*) [32])
                                                          (local_890.hit + 0xc0));
                      *(undefined1 (*) [32])(local_890.ray + 0x240) = auVar165;
                      auVar165 = vmaskmovps_avx(auVar173,*(undefined1 (*) [32])
                                                          (local_890.hit + 0xe0));
                      *(undefined1 (*) [32])(local_890.ray + 0x260) = auVar165;
                      auVar165 = vmaskmovps_avx(auVar173,*(undefined1 (*) [32])
                                                          (local_890.hit + 0x100));
                      *(undefined1 (*) [32])(local_890.ray + 0x280) = auVar165;
                    }
                  }
                  auVar165 = local_4a0;
                  if ((((((((auVar173 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar173 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar173 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar173 >> 0x7f,0) == '\0') &&
                        (auVar173 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar173 >> 0xbf,0) == '\0') &&
                      (auVar173 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar173[0x1f]) {
                    *(int *)(ray + k * 4 + 0x100) = auVar329._0_4_;
                  }
                  else {
                    auVar329 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                  }
                  *(undefined4 *)(local_6a0 + uVar144 * 4) = 0;
                  auVar214 = vshufps_avx(auVar329._0_16_,auVar329._0_16_,0);
                  auVar174._16_16_ = auVar214;
                  auVar174._0_16_ = auVar214;
                  auVar246 = ZEXT3264(auVar165);
                  auVar41 = vcmpps_avx(auVar165,auVar174,2);
                  auVar172 = vandps_avx(auVar41,local_6a0);
                  local_6a0 = local_6a0 & auVar41;
                  auVar342 = auVar315._0_32_;
                  if ((((((((local_6a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_6a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_6a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_6a0 >> 0x7f,0) == '\0') &&
                        (local_6a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_6a0 >> 0xbf,0) == '\0') &&
                      (local_6a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_6a0[0x1f]) break;
                  auVar198._8_4_ = 0x7f800000;
                  auVar198._0_8_ = 0x7f8000007f800000;
                  auVar198._12_4_ = 0x7f800000;
                  auVar198._16_4_ = 0x7f800000;
                  auVar198._20_4_ = 0x7f800000;
                  auVar198._24_4_ = 0x7f800000;
                  auVar198._28_4_ = 0x7f800000;
                  auVar165 = vblendvps_avx(auVar198,auVar165,auVar172);
                  auVar41 = vshufps_avx(auVar165,auVar165,0xb1);
                  auVar41 = vminps_avx(auVar165,auVar41);
                  auVar42 = vshufpd_avx(auVar41,auVar41,5);
                  auVar41 = vminps_avx(auVar41,auVar42);
                  auVar42 = vperm2f128_avx(auVar41,auVar41,1);
                  auVar41 = vminps_avx(auVar41,auVar42);
                  auVar41 = vcmpps_avx(auVar165,auVar41,0);
                  auVar42 = auVar172 & auVar41;
                  auVar165 = auVar172;
                  if ((((((((auVar42 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar42 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar42 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar42 >> 0x7f,0) != '\0') ||
                        (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar42 >> 0xbf,0) != '\0') ||
                      (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar42[0x1f] < '\0') {
                    auVar165 = vandps_avx(auVar41,auVar172);
                  }
                  uVar143 = vmovmskps_avx(auVar165);
                  uVar39 = 0;
                  if (uVar143 != 0) {
                    for (; (uVar143 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                    }
                  }
                  uVar144 = (ulong)uVar39;
                  local_6a0 = auVar172;
                }
              }
            }
          }
        }
      }
      local_640 = auVar342;
      if (8 < (int)uVar34) {
        auVar214 = vpshufd_avx(ZEXT416(uVar34),0);
        local_460._0_16_ = auVar214;
        auVar282 = vshufps_avx(auVar282,auVar282,0);
        register0x00001210 = auVar282;
        _local_480 = auVar282;
        auVar282 = vpermilps_avx(local_800._0_16_,0);
        local_100._16_16_ = auVar282;
        local_100._0_16_ = auVar282;
        auVar154._0_4_ = 1.0 / (float)local_520._0_4_;
        auVar154._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar282 = vshufps_avx(auVar154,auVar154,0);
        register0x00001210 = auVar282;
        _local_160 = auVar282;
        auVar282 = vshufps_avx(ZEXT416(uVar146),ZEXT416(uVar146),0);
        local_120._16_16_ = auVar282;
        local_120._0_16_ = auVar282;
        auVar282 = vshufps_avx(ZEXT416(uVar33),ZEXT416(uVar33),0);
        local_140._16_16_ = auVar282;
        local_140._0_16_ = auVar282;
        auVar175 = ZEXT3264(local_140);
        lVar151 = 8;
        fVar229 = (float)local_6c0._0_4_;
        fVar250 = (float)local_6c0._4_4_;
        fVar249 = fStack_6b8;
        fVar253 = fStack_6b4;
        fVar270 = fStack_6b0;
        fVar273 = fStack_6ac;
        fVar275 = fStack_6a8;
        fVar277 = (float)local_6e0._0_4_;
        fVar278 = (float)local_6e0._4_4_;
        fVar279 = fStack_6d8;
        fVar280 = fStack_6d4;
        fVar288 = fStack_6d0;
        fVar289 = fStack_6cc;
        fVar290 = fStack_6c8;
        fVar291 = fStack_6c4;
        do {
          pauVar9 = (undefined1 (*) [28])(bspline_basis0 + lVar151 * 4 + lVar147);
          fVar292 = *(float *)*pauVar9;
          fVar293 = *(float *)(*pauVar9 + 4);
          fVar333 = *(float *)(*pauVar9 + 8);
          fVar334 = *(float *)(*pauVar9 + 0xc);
          fVar252 = *(float *)(*pauVar9 + 0x10);
          fVar359 = *(float *)(*pauVar9 + 0x14);
          fVar304 = *(float *)(*pauVar9 + 0x18);
          auVar138 = *pauVar9;
          pfVar1 = (float *)(lVar147 + 0x21aefac + lVar151 * 4);
          fVar358 = *pfVar1;
          fVar254 = pfVar1[1];
          fVar361 = pfVar1[2];
          fVar360 = pfVar1[3];
          fVar362 = pfVar1[4];
          fVar257 = pfVar1[5];
          fVar305 = pfVar1[6];
          pauVar9 = (undefined1 (*) [28])(lVar147 + 0x21af430 + lVar151 * 4);
          fVar294 = *(float *)*pauVar9;
          fVar178 = *(float *)(*pauVar9 + 4);
          fVar180 = *(float *)(*pauVar9 + 8);
          fVar200 = *(float *)(*pauVar9 + 0xc);
          fVar201 = *(float *)(*pauVar9 + 0x10);
          fVar203 = *(float *)(*pauVar9 + 0x14);
          fVar204 = *(float *)(*pauVar9 + 0x18);
          auVar137 = *pauVar9;
          pauVar10 = (undefined1 (*) [32])(lVar147 + 0x21af8b4 + lVar151 * 4);
          fVar205 = *(float *)*pauVar10;
          fVar207 = *(float *)(*pauVar10 + 4);
          fVar208 = *(float *)(*pauVar10 + 8);
          fVar306 = *(float *)(*pauVar10 + 0xc);
          fVar230 = *(float *)(*pauVar10 + 0x10);
          fVar152 = *(float *)(*pauVar10 + 0x14);
          fVar176 = *(float *)(*pauVar10 + 0x18);
          auVar136 = *(undefined1 (*) [28])*pauVar10;
          fVar177 = auVar246._28_4_;
          fVar228 = fVar177 + *(float *)(*pauVar10 + 0x1c);
          fStack_944 = fVar177 + fVar177 + auVar175._28_4_;
          auVar400._0_4_ =
               fVar277 * fVar292 +
               fVar358 * fVar260 +
               fVar294 * (float)local_540._0_4_ + (float)local_560._0_4_ * fVar205;
          auVar400._4_4_ =
               fVar278 * fVar293 +
               fVar254 * fVar272 +
               fVar178 * (float)local_540._4_4_ + (float)local_560._4_4_ * fVar207;
          auVar400._8_4_ =
               fVar279 * fVar333 + fVar361 * fVar274 + fVar180 * fStack_538 + fStack_558 * fVar208;
          auVar400._12_4_ =
               fVar280 * fVar334 + fVar360 * fVar276 + fVar200 * fStack_534 + fStack_554 * fVar306;
          auVar400._16_4_ =
               fVar288 * fVar252 + fVar362 * fVar248 + fVar201 * fStack_530 + fStack_550 * fVar230;
          auVar400._20_4_ =
               fVar289 * fVar359 + fVar257 * fVar247 + fVar203 * fStack_52c + fStack_54c * fVar152;
          auVar400._24_4_ =
               fVar290 * fVar304 + fVar305 * fVar227 + fVar204 * fStack_528 + fStack_548 * fVar176;
          auVar400._28_4_ = fVar228 + fStack_944;
          local_800._0_4_ =
               (float)local_2a0._0_4_ * fVar292 +
               fVar316 * fVar358 + fVar209 * fVar294 + fVar229 * fVar205;
          local_800._4_4_ =
               (float)local_2a0._4_4_ * fVar293 +
               fVar317 * fVar254 + fVar224 * fVar178 + fVar250 * fVar207;
          local_800._8_4_ =
               fStack_298 * fVar333 + fVar318 * fVar361 + fVar225 * fVar180 + fVar249 * fVar208;
          local_800._12_4_ =
               fStack_294 * fVar334 + fVar336 * fVar360 + fVar226 * fVar200 + fVar253 * fVar306;
          local_800._16_4_ =
               fStack_290 * fVar252 + fVar206 * fVar362 + fVar209 * fVar201 + fVar270 * fVar230;
          local_800._20_4_ =
               fStack_28c * fVar359 + fVar251 * fVar257 + fVar224 * fVar203 + fVar273 * fVar152;
          local_800._24_4_ =
               fStack_288 * fVar304 + fVar256 * fVar305 + fVar225 * fVar204 + fVar275 * fVar176;
          local_800._28_4_ = fStack_944 + fVar177 + fVar177 + auVar303._28_4_;
          local_960._0_4_ =
               fVar292 * (float)local_2e0._0_4_ +
               (float)local_c0._0_4_ * fVar358 +
               (float)local_a0._0_4_ * fVar294 + fVar205 * (float)local_2c0._0_4_;
          local_960._4_4_ =
               fVar293 * (float)local_2e0._4_4_ +
               (float)local_c0._4_4_ * fVar254 +
               (float)local_a0._4_4_ * fVar178 + fVar207 * (float)local_2c0._4_4_;
          fStack_958 = fVar333 * fStack_2d8 +
                       fStack_b8 * fVar361 + fStack_98 * fVar180 + fVar208 * fStack_2b8;
          fStack_954 = fVar334 * fStack_2d4 +
                       fStack_b4 * fVar360 + fStack_94 * fVar200 + fVar306 * fStack_2b4;
          fStack_950 = fVar252 * fStack_2d0 +
                       fStack_b0 * fVar362 + fStack_90 * fVar201 + fVar230 * fStack_2b0;
          fStack_94c = fVar359 * fStack_2cc +
                       fStack_ac * fVar257 + fStack_8c * fVar203 + fVar152 * fStack_2ac;
          fStack_948 = fVar304 * fStack_2c8 +
                       fStack_a8 * fVar305 + fStack_88 * fVar204 + fVar176 * fStack_2a8;
          fStack_944 = fStack_944 + fVar177 + fVar228;
          pfVar1 = (float *)(bspline_basis1 + lVar151 * 4 + lVar147);
          fVar292 = *pfVar1;
          fVar293 = pfVar1[1];
          fVar333 = pfVar1[2];
          fVar334 = pfVar1[3];
          fVar252 = pfVar1[4];
          fVar359 = pfVar1[5];
          fVar304 = pfVar1[6];
          pauVar9 = (undefined1 (*) [28])(lVar147 + 0x21b13cc + lVar151 * 4);
          auVar139 = *pauVar9;
          pauVar11 = (undefined1 (*) [28])(lVar147 + 0x21b1850 + lVar151 * 4);
          fVar294 = *(float *)*pauVar11;
          fVar178 = *(float *)(*pauVar11 + 4);
          fVar180 = *(float *)(*pauVar11 + 8);
          fVar200 = *(float *)(*pauVar11 + 0xc);
          fVar201 = *(float *)(*pauVar11 + 0x10);
          fVar203 = *(float *)(*pauVar11 + 0x14);
          fVar204 = *(float *)(*pauVar11 + 0x18);
          auVar140 = *pauVar11;
          pfVar1 = (float *)(lVar147 + 0x21b1cd4 + lVar151 * 4);
          fVar205 = *pfVar1;
          fVar207 = pfVar1[1];
          fVar208 = pfVar1[2];
          fVar306 = pfVar1[3];
          fVar230 = pfVar1[4];
          fVar152 = pfVar1[5];
          fVar176 = pfVar1[6];
          local_900 = auVar139._0_4_;
          fStack_8fc = auVar139._4_4_;
          fStack_8f8 = auVar139._8_4_;
          fStack_8f4 = auVar139._12_4_;
          fStack_8f0 = auVar139._16_4_;
          fStack_8ec = auVar139._20_4_;
          fStack_8e8 = auVar139._24_4_;
          fVar228 = fVar255 + fVar255 + *(float *)pauVar9[1];
          local_7a0._0_4_ =
               fVar277 * fVar292 +
               local_900 * fVar260 +
               fVar294 * (float)local_540._0_4_ + (float)local_560._0_4_ * fVar205;
          local_7a0._4_4_ =
               fVar278 * fVar293 +
               fStack_8fc * fVar272 +
               fVar178 * (float)local_540._4_4_ + (float)local_560._4_4_ * fVar207;
          local_7a0._8_4_ =
               fVar279 * fVar333 +
               fStack_8f8 * fVar274 + fVar180 * fStack_538 + fStack_558 * fVar208;
          local_7a0._12_4_ =
               fVar280 * fVar334 +
               fStack_8f4 * fVar276 + fVar200 * fStack_534 + fStack_554 * fVar306;
          auVar301._16_4_ =
               fVar288 * fVar252 +
               fStack_8f0 * fVar248 + fVar201 * fStack_530 + fStack_550 * fVar230;
          auVar301._0_16_ = local_7a0._0_16_;
          auVar301._20_4_ =
               fVar289 * fVar359 +
               fStack_8ec * fVar247 + fVar203 * fStack_52c + fStack_54c * fVar152;
          auVar301._24_4_ =
               fVar290 * fVar304 +
               fStack_8e8 * fVar227 + fVar204 * fStack_528 + fStack_548 * fVar176;
          auVar301._28_4_ = fVar255 + pfVar1[7] + fVar228;
          auVar286._0_4_ =
               (float)local_2a0._0_4_ * fVar292 +
               fVar316 * local_900 + fVar294 * fVar209 + fVar229 * fVar205;
          auVar286._4_4_ =
               (float)local_2a0._4_4_ * fVar293 +
               fVar317 * fStack_8fc + fVar178 * fVar224 + fVar250 * fVar207;
          auVar286._8_4_ =
               fStack_298 * fVar333 + fVar318 * fStack_8f8 + fVar180 * fVar225 + fVar249 * fVar208;
          auVar286._12_4_ =
               fStack_294 * fVar334 + fVar336 * fStack_8f4 + fVar200 * fVar226 + fVar253 * fVar306;
          auVar286._16_4_ =
               fStack_290 * fVar252 + fVar206 * fStack_8f0 + fVar201 * fVar209 + fVar270 * fVar230;
          auVar286._20_4_ =
               fStack_28c * fVar359 + fVar251 * fStack_8ec + fVar203 * fVar224 + fVar273 * fVar152;
          auVar286._24_4_ =
               fStack_288 * fVar304 + fVar256 * fStack_8e8 + fVar204 * fVar225 + fVar275 * fVar176;
          auVar286._28_4_ = fVar228 + fVar255 + fVar255 + fVar258;
          auVar314._0_4_ =
               (float)local_c0._0_4_ * local_900 +
               (float)local_a0._0_4_ * fVar294 + fVar205 * (float)local_2c0._0_4_ +
               fVar292 * (float)local_2e0._0_4_;
          auVar314._4_4_ =
               (float)local_c0._4_4_ * fStack_8fc +
               (float)local_a0._4_4_ * fVar178 + fVar207 * (float)local_2c0._4_4_ +
               fVar293 * (float)local_2e0._4_4_;
          auVar314._8_4_ =
               fStack_b8 * fStack_8f8 + fStack_98 * fVar180 + fVar208 * fStack_2b8 +
               fVar333 * fStack_2d8;
          auVar314._12_4_ =
               fStack_b4 * fStack_8f4 + fStack_94 * fVar200 + fVar306 * fStack_2b4 +
               fVar334 * fStack_2d4;
          auVar314._16_4_ =
               fStack_b0 * fStack_8f0 + fStack_90 * fVar201 + fVar230 * fStack_2b0 +
               fVar252 * fStack_2d0;
          auVar314._20_4_ =
               fStack_ac * fStack_8ec + fStack_8c * fVar203 + fVar152 * fStack_2ac +
               fVar359 * fStack_2cc;
          auVar314._24_4_ =
               fStack_a8 * fStack_8e8 + fStack_88 * fVar204 + fVar176 * fStack_2a8 +
               fVar304 * fStack_2c8;
          auVar314._28_4_ = fVar255 + fVar255 + pfVar1[7] + fVar228;
          auVar172 = vsubps_avx(auVar301,auVar400);
          auVar41 = vsubps_avx(auVar286,local_800);
          auVar175 = ZEXT3264(auVar41);
          fVar253 = auVar172._0_4_;
          fVar258 = auVar172._4_4_;
          auVar89._4_4_ = fVar258 * local_800._4_4_;
          auVar89._0_4_ = fVar253 * local_800._0_4_;
          fVar270 = auVar172._8_4_;
          auVar89._8_4_ = fVar270 * local_800._8_4_;
          fVar273 = auVar172._12_4_;
          auVar89._12_4_ = fVar273 * local_800._12_4_;
          fVar275 = auVar172._16_4_;
          auVar89._16_4_ = fVar275 * local_800._16_4_;
          fVar277 = auVar172._20_4_;
          auVar89._20_4_ = fVar277 * local_800._20_4_;
          fVar278 = auVar172._24_4_;
          auVar89._24_4_ = fVar278 * local_800._24_4_;
          auVar89._28_4_ = fVar228;
          fVar229 = auVar41._0_4_;
          fVar248 = auVar41._4_4_;
          auVar90._4_4_ = auVar400._4_4_ * fVar248;
          auVar90._0_4_ = auVar400._0_4_ * fVar229;
          fVar247 = auVar41._8_4_;
          auVar90._8_4_ = auVar400._8_4_ * fVar247;
          fVar250 = auVar41._12_4_;
          auVar90._12_4_ = auVar400._12_4_ * fVar250;
          fVar227 = auVar41._16_4_;
          auVar90._16_4_ = auVar400._16_4_ * fVar227;
          fVar255 = auVar41._20_4_;
          auVar90._20_4_ = auVar400._20_4_ * fVar255;
          fVar249 = auVar41._24_4_;
          auVar90._24_4_ = auVar400._24_4_ * fVar249;
          auVar90._28_4_ = auVar286._28_4_;
          auVar42 = vsubps_avx(auVar89,auVar90);
          auVar165 = vmaxps_avx(_local_960,auVar314);
          auVar91._4_4_ = auVar165._4_4_ * auVar165._4_4_ * (fVar258 * fVar258 + fVar248 * fVar248);
          auVar91._0_4_ = auVar165._0_4_ * auVar165._0_4_ * (fVar253 * fVar253 + fVar229 * fVar229);
          auVar91._8_4_ = auVar165._8_4_ * auVar165._8_4_ * (fVar270 * fVar270 + fVar247 * fVar247);
          auVar91._12_4_ =
               auVar165._12_4_ * auVar165._12_4_ * (fVar273 * fVar273 + fVar250 * fVar250);
          auVar91._16_4_ =
               auVar165._16_4_ * auVar165._16_4_ * (fVar275 * fVar275 + fVar227 * fVar227);
          auVar91._20_4_ =
               auVar165._20_4_ * auVar165._20_4_ * (fVar277 * fVar277 + fVar255 * fVar255);
          auVar91._24_4_ =
               auVar165._24_4_ * auVar165._24_4_ * (fVar278 * fVar278 + fVar249 * fVar249);
          auVar91._28_4_ = auVar301._28_4_ + auVar286._28_4_;
          auVar92._4_4_ = auVar42._4_4_ * auVar42._4_4_;
          auVar92._0_4_ = auVar42._0_4_ * auVar42._0_4_;
          auVar92._8_4_ = auVar42._8_4_ * auVar42._8_4_;
          auVar92._12_4_ = auVar42._12_4_ * auVar42._12_4_;
          auVar92._16_4_ = auVar42._16_4_ * auVar42._16_4_;
          auVar92._20_4_ = auVar42._20_4_ * auVar42._20_4_;
          auVar92._24_4_ = auVar42._24_4_ * auVar42._24_4_;
          auVar92._28_4_ = auVar42._28_4_;
          local_580 = vcmpps_avx(auVar92,auVar91,2);
          local_3c0 = (uint)lVar151;
          auVar214 = vpshufd_avx(ZEXT416(local_3c0),0);
          auVar282 = vpor_avx(auVar214,_DAT_01f7fcf0);
          auVar214 = vpor_avx(auVar214,_DAT_01fafea0);
          auVar282 = vpcmpgtd_avx(local_460._0_16_,auVar282);
          auVar303 = ZEXT1664(auVar282);
          auVar214 = vpcmpgtd_avx(local_460._0_16_,auVar214);
          auVar244._16_16_ = auVar214;
          auVar244._0_16_ = auVar282;
          auVar246 = ZEXT3264(auVar244);
          auVar165 = auVar244 & local_580;
          fVar229 = (float)local_6c0._0_4_;
          fVar250 = (float)local_6c0._4_4_;
          fVar249 = fStack_6b8;
          fVar253 = fStack_6b4;
          fVar270 = fStack_6b0;
          fVar273 = fStack_6ac;
          fVar275 = fStack_6a8;
          fVar277 = (float)local_6e0._0_4_;
          fVar278 = (float)local_6e0._4_4_;
          fVar279 = fStack_6d8;
          fVar280 = fStack_6d4;
          fVar288 = fStack_6d0;
          fVar289 = fStack_6cc;
          fVar290 = fStack_6c8;
          fVar248 = fStack_6c4;
          if ((((((((auVar165 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar165 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar165 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar165 >> 0x7f,0) != '\0') ||
                (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar165 >> 0xbf,0) != '\0') ||
              (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar165[0x1f] < '\0') {
            local_5c0._0_4_ = auVar140._0_4_;
            local_5c0._4_4_ = auVar140._4_4_;
            fStack_5b8 = auVar140._8_4_;
            fStack_5b4 = auVar140._12_4_;
            fStack_5b0 = auVar140._16_4_;
            fStack_5ac = auVar140._20_4_;
            fStack_5a8 = auVar140._24_4_;
            local_5e0 = fVar292 * (float)local_620._0_4_ +
                        local_900 * (float)local_440._0_4_ +
                        (float)local_e0._0_4_ * (float)local_5c0._0_4_ +
                        (float)local_820._0_4_ * fVar205;
            fStack_5dc = fVar293 * (float)local_620._4_4_ +
                         fStack_8fc * (float)local_440._4_4_ +
                         (float)local_e0._4_4_ * (float)local_5c0._4_4_ +
                         (float)local_820._4_4_ * fVar207;
            fStack_5d8 = fVar333 * fStack_618 +
                         fStack_8f8 * fStack_438 + fStack_d8 * fStack_5b8 + fStack_818 * fVar208;
            fStack_5d4 = fVar334 * fStack_614 +
                         fStack_8f4 * fStack_434 + fStack_d4 * fStack_5b4 + fStack_814 * fVar306;
            fStack_5d0 = fVar252 * fStack_610 +
                         fStack_8f0 * fStack_430 + fStack_d0 * fStack_5b0 + fStack_810 * fVar230;
            fStack_5cc = fVar359 * fStack_60c +
                         fStack_8ec * fStack_42c + fStack_cc * fStack_5ac + fStack_80c * fVar152;
            fStack_5c8 = fVar304 * fStack_608 +
                         fStack_8e8 * fStack_428 + fStack_c8 * fStack_5a8 + fStack_808 * fVar176;
            fStack_5c4 = fVar291 + fStack_604 + local_580._28_4_ + 0.0;
            local_7e0._0_4_ = auVar137._0_4_;
            local_7e0._4_4_ = auVar137._4_4_;
            uStack_7d8._0_4_ = auVar137._8_4_;
            uStack_7d8._4_4_ = auVar137._12_4_;
            uStack_7d0._0_4_ = auVar137._16_4_;
            uStack_7d0._4_4_ = auVar137._20_4_;
            uStack_7c8._0_4_ = auVar137._24_4_;
            fVar180 = (float)local_e0._0_4_ * (float)local_7e0._0_4_;
            fVar200 = (float)local_e0._4_4_ * (float)local_7e0._4_4_;
            fVar201 = fStack_d8 * (float)uStack_7d8;
            fVar203 = fStack_d4 * uStack_7d8._4_4_;
            fVar204 = fStack_d0 * (float)uStack_7d0;
            fVar205 = fStack_cc * uStack_7d0._4_4_;
            fVar207 = fStack_c8 * (float)uStack_7c8;
            local_5a0._0_4_ = auVar136._0_4_;
            local_5a0._4_4_ = auVar136._4_4_;
            fStack_598 = auVar136._8_4_;
            fStack_594 = auVar136._12_4_;
            fStack_590 = auVar136._16_4_;
            fStack_58c = auVar136._20_4_;
            fStack_588 = auVar136._24_4_;
            pfVar1 = (float *)(lVar147 + 0x21b0640 + lVar151 * 4);
            fVar229 = *pfVar1;
            fVar248 = pfVar1[1];
            fVar247 = pfVar1[2];
            fVar250 = pfVar1[3];
            fVar227 = pfVar1[4];
            fVar255 = pfVar1[5];
            fVar249 = pfVar1[6];
            pfVar2 = (float *)(lVar147 + 0x21b0ac4 + lVar151 * 4);
            fVar253 = *pfVar2;
            fVar258 = pfVar2[1];
            fVar270 = pfVar2[2];
            fVar273 = pfVar2[3];
            fVar275 = pfVar2[4];
            fVar277 = pfVar2[5];
            fVar278 = pfVar2[6];
            pfVar3 = (float *)(lVar147 + 0x21b01bc + lVar151 * 4);
            fVar279 = *pfVar3;
            fVar280 = pfVar3[1];
            fVar288 = pfVar3[2];
            fVar289 = pfVar3[3];
            fVar290 = pfVar3[4];
            fVar291 = pfVar3[5];
            fVar292 = pfVar3[6];
            fVar178 = pfVar1[7] + pfVar2[7];
            fVar208 = pfVar2[7] + auVar400._28_4_ + 0.0;
            fVar306 = auVar400._28_4_ + fStack_284 + auVar400._28_4_ + 0.0;
            pfVar1 = (float *)(lVar147 + 0x21afd38 + lVar151 * 4);
            fVar293 = *pfVar1;
            fVar333 = pfVar1[1];
            fVar334 = pfVar1[2];
            fVar252 = pfVar1[3];
            fVar359 = pfVar1[4];
            fVar304 = pfVar1[5];
            fVar294 = pfVar1[6];
            local_7e0._4_4_ =
                 fVar333 * (float)local_6e0._4_4_ +
                 fVar280 * (float)local_700._4_4_ +
                 fVar248 * (float)local_540._4_4_ + (float)local_560._4_4_ * fVar258;
            local_7e0._0_4_ =
                 fVar293 * (float)local_6e0._0_4_ +
                 fVar279 * (float)local_700._0_4_ +
                 fVar229 * (float)local_540._0_4_ + (float)local_560._0_4_ * fVar253;
            uStack_7d8._0_4_ =
                 fVar334 * fStack_6d8 +
                 fVar288 * fStack_6f8 + fVar247 * fStack_538 + fStack_558 * fVar270;
            uStack_7d8._4_4_ =
                 fVar252 * fStack_6d4 +
                 fVar289 * fStack_6f4 + fVar250 * fStack_534 + fStack_554 * fVar273;
            uStack_7d0._0_4_ =
                 fVar359 * fStack_6d0 +
                 fVar290 * fStack_6f0 + fVar227 * fStack_530 + fStack_550 * fVar275;
            uStack_7d0._4_4_ =
                 fVar304 * fStack_6cc +
                 fVar291 * fStack_6ec + fVar255 * fStack_52c + fStack_54c * fVar277;
            uStack_7c8._0_4_ =
                 fVar294 * fStack_6c8 +
                 fVar292 * fStack_6e8 + fVar249 * fStack_528 + fStack_548 * fVar278;
            uStack_7c8._4_4_ = fVar178 + fVar208;
            auVar192._0_4_ =
                 fVar293 * (float)local_2a0._0_4_ +
                 fVar209 * fVar229 + (float)local_6c0._0_4_ * fVar253 + fVar279 * fVar316;
            auVar192._4_4_ =
                 fVar333 * (float)local_2a0._4_4_ +
                 fVar224 * fVar248 + (float)local_6c0._4_4_ * fVar258 + fVar280 * fVar317;
            auVar192._8_4_ =
                 fVar334 * fStack_298 + fVar225 * fVar247 + fStack_6b8 * fVar270 + fVar288 * fVar318
            ;
            auVar192._12_4_ =
                 fVar252 * fStack_294 + fVar226 * fVar250 + fStack_6b4 * fVar273 + fVar289 * fVar336
            ;
            auVar192._16_4_ =
                 fVar359 * fStack_290 + fVar209 * fVar227 + fStack_6b0 * fVar275 + fVar290 * fVar206
            ;
            auVar192._20_4_ =
                 fVar304 * fStack_28c + fVar224 * fVar255 + fStack_6ac * fVar277 + fVar291 * fVar251
            ;
            auVar192._24_4_ =
                 fVar294 * fStack_288 + fVar225 * fVar249 + fStack_6a8 * fVar278 + fVar292 * fVar256
            ;
            auVar192._28_4_ = fVar208 + fVar306;
            auVar388._0_4_ =
                 fVar279 * (float)local_440._0_4_ +
                 (float)local_e0._0_4_ * fVar229 + (float)local_820._0_4_ * fVar253 +
                 (float)local_620._0_4_ * fVar293;
            auVar388._4_4_ =
                 fVar280 * (float)local_440._4_4_ +
                 (float)local_e0._4_4_ * fVar248 + (float)local_820._4_4_ * fVar258 +
                 (float)local_620._4_4_ * fVar333;
            auVar388._8_4_ =
                 fVar288 * fStack_438 + fStack_d8 * fVar247 + fStack_818 * fVar270 +
                 fStack_618 * fVar334;
            auVar388._12_4_ =
                 fVar289 * fStack_434 + fStack_d4 * fVar250 + fStack_814 * fVar273 +
                 fStack_614 * fVar252;
            auVar388._16_4_ =
                 fVar290 * fStack_430 + fStack_d0 * fVar227 + fStack_810 * fVar275 +
                 fStack_610 * fVar359;
            auVar388._20_4_ =
                 fVar291 * fStack_42c + fStack_cc * fVar255 + fStack_80c * fVar277 +
                 fStack_60c * fVar304;
            auVar388._24_4_ =
                 fVar292 * fStack_428 + fStack_c8 * fVar249 + fStack_808 * fVar278 +
                 fStack_608 * fVar294;
            auVar388._28_4_ = pfVar3[7] + fVar178 + fVar306;
            pfVar1 = (float *)(lVar147 + 0x21b2a60 + lVar151 * 4);
            fVar229 = *pfVar1;
            fVar248 = pfVar1[1];
            fVar247 = pfVar1[2];
            fVar250 = pfVar1[3];
            fVar227 = pfVar1[4];
            fVar255 = pfVar1[5];
            fVar249 = pfVar1[6];
            pfVar2 = (float *)(lVar147 + 0x21b2ee4 + lVar151 * 4);
            fVar206 = *pfVar2;
            fVar251 = pfVar2[1];
            fVar253 = pfVar2[2];
            fVar256 = pfVar2[3];
            fVar258 = pfVar2[4];
            fVar270 = pfVar2[5];
            fVar273 = pfVar2[6];
            pfVar3 = (float *)(lVar147 + 0x21b25dc + lVar151 * 4);
            fVar275 = *pfVar3;
            fVar277 = pfVar3[1];
            fVar278 = pfVar3[2];
            fVar279 = pfVar3[3];
            fVar280 = pfVar3[4];
            fVar288 = pfVar3[5];
            fVar289 = pfVar3[6];
            pfVar4 = (float *)(lVar147 + 0x21b2158 + lVar151 * 4);
            fVar290 = *pfVar4;
            fVar291 = pfVar4[1];
            fVar292 = pfVar4[2];
            fVar293 = pfVar4[3];
            fVar333 = pfVar4[4];
            fVar334 = pfVar4[5];
            fVar252 = pfVar4[6];
            auVar343._0_4_ =
                 fVar290 * (float)local_6e0._0_4_ +
                 fVar275 * (float)local_700._0_4_ +
                 fVar229 * (float)local_540._0_4_ + (float)local_560._0_4_ * fVar206;
            auVar343._4_4_ =
                 fVar291 * (float)local_6e0._4_4_ +
                 fVar277 * (float)local_700._4_4_ +
                 fVar248 * (float)local_540._4_4_ + (float)local_560._4_4_ * fVar251;
            auVar343._8_4_ =
                 fVar292 * fStack_6d8 +
                 fVar278 * fStack_6f8 + fVar247 * fStack_538 + fStack_558 * fVar253;
            auVar343._12_4_ =
                 fVar293 * fStack_6d4 +
                 fVar279 * fStack_6f4 + fVar250 * fStack_534 + fStack_554 * fVar256;
            auVar343._16_4_ =
                 fVar333 * fStack_6d0 +
                 fVar280 * fStack_6f0 + fVar227 * fStack_530 + fStack_550 * fVar258;
            auVar343._20_4_ =
                 fVar334 * fStack_6cc +
                 fVar288 * fStack_6ec + fVar255 * fStack_52c + fStack_54c * fVar270;
            auVar343._24_4_ =
                 fVar252 * fStack_6c8 +
                 fVar289 * fStack_6e8 + fVar249 * fStack_528 + fStack_548 * fVar273;
            auVar343._28_4_ = fStack_604 + fStack_604 + fStack_544 + fStack_604;
            auVar382._0_4_ =
                 fVar290 * (float)local_2a0._0_4_ +
                 fVar275 * (float)local_720._0_4_ +
                 fVar209 * fVar229 + (float)local_6c0._0_4_ * fVar206;
            auVar382._4_4_ =
                 fVar291 * (float)local_2a0._4_4_ +
                 fVar277 * (float)local_720._4_4_ +
                 fVar224 * fVar248 + (float)local_6c0._4_4_ * fVar251;
            auVar382._8_4_ =
                 fVar292 * fStack_298 +
                 fVar278 * fStack_718 + fVar225 * fVar247 + fStack_6b8 * fVar253;
            auVar382._12_4_ =
                 fVar293 * fStack_294 +
                 fVar279 * fStack_714 + fVar226 * fVar250 + fStack_6b4 * fVar256;
            auVar382._16_4_ =
                 fVar333 * fStack_290 +
                 fVar280 * fStack_710 + fVar209 * fVar227 + fStack_6b0 * fVar258;
            auVar382._20_4_ =
                 fVar334 * fStack_28c +
                 fVar288 * fStack_70c + fVar224 * fVar255 + fStack_6ac * fVar270;
            auVar382._24_4_ =
                 fVar252 * fStack_288 +
                 fVar289 * fStack_708 + fVar225 * fVar249 + fStack_6a8 * fVar273;
            auVar382._28_4_ = fStack_604 + fStack_604 + fVar226 + fStack_604;
            auVar287._8_4_ = 0x7fffffff;
            auVar287._0_8_ = 0x7fffffff7fffffff;
            auVar287._12_4_ = 0x7fffffff;
            auVar287._16_4_ = 0x7fffffff;
            auVar287._20_4_ = 0x7fffffff;
            auVar287._24_4_ = 0x7fffffff;
            auVar287._28_4_ = 0x7fffffff;
            auVar165 = vandps_avx(_local_7e0,auVar287);
            auVar42 = vandps_avx(auVar192,auVar287);
            auVar42 = vmaxps_avx(auVar165,auVar42);
            auVar165 = vandps_avx(auVar388,auVar287);
            auVar42 = vmaxps_avx(auVar42,auVar165);
            auVar42 = vcmpps_avx(auVar42,_local_480,1);
            auVar43 = vblendvps_avx(_local_7e0,auVar172,auVar42);
            auVar167._0_4_ =
                 fVar290 * (float)local_620._0_4_ +
                 fVar275 * (float)local_440._0_4_ +
                 (float)local_820._0_4_ * fVar206 + (float)local_e0._0_4_ * fVar229;
            auVar167._4_4_ =
                 fVar291 * (float)local_620._4_4_ +
                 fVar277 * (float)local_440._4_4_ +
                 (float)local_820._4_4_ * fVar251 + (float)local_e0._4_4_ * fVar248;
            auVar167._8_4_ =
                 fVar292 * fStack_618 +
                 fVar278 * fStack_438 + fStack_818 * fVar253 + fStack_d8 * fVar247;
            auVar167._12_4_ =
                 fVar293 * fStack_614 +
                 fVar279 * fStack_434 + fStack_814 * fVar256 + fStack_d4 * fVar250;
            auVar167._16_4_ =
                 fVar333 * fStack_610 +
                 fVar280 * fStack_430 + fStack_810 * fVar258 + fStack_d0 * fVar227;
            auVar167._20_4_ =
                 fVar334 * fStack_60c +
                 fVar288 * fStack_42c + fStack_80c * fVar270 + fStack_cc * fVar255;
            auVar167._24_4_ =
                 fVar252 * fStack_608 +
                 fVar289 * fStack_428 + fStack_808 * fVar273 + fStack_c8 * fVar249;
            auVar167._28_4_ = auVar165._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
            auVar44 = vblendvps_avx(auVar192,auVar41,auVar42);
            auVar165 = vandps_avx(auVar343,auVar287);
            auVar42 = vandps_avx(auVar382,auVar287);
            auVar342 = vmaxps_avx(auVar165,auVar42);
            auVar165 = vandps_avx(auVar167,auVar287);
            auVar165 = vmaxps_avx(auVar342,auVar165);
            local_860._0_4_ = auVar138._0_4_;
            local_860._4_4_ = auVar138._4_4_;
            uStack_858._0_4_ = auVar138._8_4_;
            uStack_858._4_4_ = auVar138._12_4_;
            uStack_850._0_4_ = auVar138._16_4_;
            uStack_850._4_4_ = auVar138._20_4_;
            uStack_848._0_4_ = auVar138._24_4_;
            auVar42 = vcmpps_avx(auVar165,_local_480,1);
            auVar165 = vblendvps_avx(auVar343,auVar172,auVar42);
            auVar168._0_4_ =
                 (float)local_620._0_4_ * (float)local_860._0_4_ +
                 (float)local_440._0_4_ * fVar358 +
                 fVar180 + (float)local_820._0_4_ * (float)local_5a0._0_4_;
            auVar168._4_4_ =
                 (float)local_620._4_4_ * (float)local_860._4_4_ +
                 (float)local_440._4_4_ * fVar254 +
                 fVar200 + (float)local_820._4_4_ * (float)local_5a0._4_4_;
            auVar168._8_4_ =
                 fStack_618 * (float)uStack_858 +
                 fStack_438 * fVar361 + fVar201 + fStack_818 * fStack_598;
            auVar168._12_4_ =
                 fStack_614 * uStack_858._4_4_ +
                 fStack_434 * fVar360 + fVar203 + fStack_814 * fStack_594;
            auVar168._16_4_ =
                 fStack_610 * (float)uStack_850 +
                 fStack_430 * fVar362 + fVar204 + fStack_810 * fStack_590;
            auVar168._20_4_ =
                 fStack_60c * uStack_850._4_4_ +
                 fStack_42c * fVar257 + fVar205 + fStack_80c * fStack_58c;
            auVar168._24_4_ =
                 fStack_608 * (float)uStack_848 +
                 fStack_428 * fVar305 + fVar207 + fStack_808 * fStack_588;
            auVar168._28_4_ = auVar342._28_4_ + fStack_5c4 + local_580._28_4_ + 0.0;
            auVar42 = vblendvps_avx(auVar382,auVar41,auVar42);
            fVar257 = auVar43._0_4_;
            fVar305 = auVar43._4_4_;
            fVar294 = auVar43._8_4_;
            fVar178 = auVar43._12_4_;
            fVar180 = auVar43._16_4_;
            fVar200 = auVar43._20_4_;
            fVar201 = auVar43._24_4_;
            fVar203 = auVar43._28_4_;
            fVar275 = auVar165._0_4_;
            fVar278 = auVar165._4_4_;
            fVar280 = auVar165._8_4_;
            fVar289 = auVar165._12_4_;
            fVar291 = auVar165._16_4_;
            fVar293 = auVar165._20_4_;
            fVar334 = auVar165._24_4_;
            fVar229 = auVar44._0_4_;
            fVar247 = auVar44._4_4_;
            fVar227 = auVar44._8_4_;
            fVar249 = auVar44._12_4_;
            fVar251 = auVar44._16_4_;
            fVar256 = auVar44._20_4_;
            fVar270 = auVar44._24_4_;
            auVar354._0_4_ = fVar229 * fVar229 + fVar257 * fVar257;
            auVar354._4_4_ = fVar247 * fVar247 + fVar305 * fVar305;
            auVar354._8_4_ = fVar227 * fVar227 + fVar294 * fVar294;
            auVar354._12_4_ = fVar249 * fVar249 + fVar178 * fVar178;
            auVar354._16_4_ = fVar251 * fVar251 + fVar180 * fVar180;
            auVar354._20_4_ = fVar256 * fVar256 + fVar200 * fVar200;
            auVar354._24_4_ = fVar270 * fVar270 + fVar201 * fVar201;
            auVar354._28_4_ = fStack_804 + auVar172._28_4_;
            auVar172 = vrsqrtps_avx(auVar354);
            fVar248 = auVar172._0_4_;
            fVar250 = auVar172._4_4_;
            auVar93._4_4_ = fVar250 * 1.5;
            auVar93._0_4_ = fVar248 * 1.5;
            fVar255 = auVar172._8_4_;
            auVar93._8_4_ = fVar255 * 1.5;
            fVar206 = auVar172._12_4_;
            auVar93._12_4_ = fVar206 * 1.5;
            fVar253 = auVar172._16_4_;
            auVar93._16_4_ = fVar253 * 1.5;
            fVar258 = auVar172._20_4_;
            auVar93._20_4_ = fVar258 * 1.5;
            fVar273 = auVar172._24_4_;
            auVar93._24_4_ = fVar273 * 1.5;
            auVar93._28_4_ = auVar382._28_4_;
            auVar94._4_4_ = fVar250 * fVar250 * fVar250 * auVar354._4_4_ * 0.5;
            auVar94._0_4_ = fVar248 * fVar248 * fVar248 * auVar354._0_4_ * 0.5;
            auVar94._8_4_ = fVar255 * fVar255 * fVar255 * auVar354._8_4_ * 0.5;
            auVar94._12_4_ = fVar206 * fVar206 * fVar206 * auVar354._12_4_ * 0.5;
            auVar94._16_4_ = fVar253 * fVar253 * fVar253 * auVar354._16_4_ * 0.5;
            auVar94._20_4_ = fVar258 * fVar258 * fVar258 * auVar354._20_4_ * 0.5;
            auVar94._24_4_ = fVar273 * fVar273 * fVar273 * auVar354._24_4_ * 0.5;
            auVar94._28_4_ = auVar354._28_4_;
            auVar43 = vsubps_avx(auVar93,auVar94);
            fVar359 = auVar43._0_4_;
            fVar304 = auVar43._4_4_;
            fVar358 = auVar43._8_4_;
            fVar254 = auVar43._12_4_;
            fVar361 = auVar43._16_4_;
            fVar360 = auVar43._20_4_;
            fVar362 = auVar43._24_4_;
            fVar248 = auVar42._0_4_;
            fVar250 = auVar42._4_4_;
            fVar255 = auVar42._8_4_;
            fVar206 = auVar42._12_4_;
            fVar253 = auVar42._16_4_;
            fVar258 = auVar42._20_4_;
            fVar273 = auVar42._24_4_;
            auVar327._0_4_ = fVar248 * fVar248 + fVar275 * fVar275;
            auVar327._4_4_ = fVar250 * fVar250 + fVar278 * fVar278;
            auVar327._8_4_ = fVar255 * fVar255 + fVar280 * fVar280;
            auVar327._12_4_ = fVar206 * fVar206 + fVar289 * fVar289;
            auVar327._16_4_ = fVar253 * fVar253 + fVar291 * fVar291;
            auVar327._20_4_ = fVar258 * fVar258 + fVar293 * fVar293;
            auVar327._24_4_ = fVar273 * fVar273 + fVar334 * fVar334;
            auVar327._28_4_ = auVar172._28_4_ + auVar165._28_4_;
            auVar165 = vrsqrtps_avx(auVar327);
            fVar277 = auVar165._0_4_;
            fVar279 = auVar165._4_4_;
            auVar95._4_4_ = fVar279 * 1.5;
            auVar95._0_4_ = fVar277 * 1.5;
            fVar288 = auVar165._8_4_;
            auVar95._8_4_ = fVar288 * 1.5;
            fVar290 = auVar165._12_4_;
            auVar95._12_4_ = fVar290 * 1.5;
            fVar292 = auVar165._16_4_;
            auVar95._16_4_ = fVar292 * 1.5;
            fVar333 = auVar165._20_4_;
            auVar95._20_4_ = fVar333 * 1.5;
            fVar252 = auVar165._24_4_;
            auVar95._24_4_ = fVar252 * 1.5;
            auVar95._28_4_ = auVar382._28_4_;
            auVar96._4_4_ = fVar279 * fVar279 * fVar279 * auVar327._4_4_ * 0.5;
            auVar96._0_4_ = fVar277 * fVar277 * fVar277 * auVar327._0_4_ * 0.5;
            auVar96._8_4_ = fVar288 * fVar288 * fVar288 * auVar327._8_4_ * 0.5;
            auVar96._12_4_ = fVar290 * fVar290 * fVar290 * auVar327._12_4_ * 0.5;
            auVar96._16_4_ = fVar292 * fVar292 * fVar292 * auVar327._16_4_ * 0.5;
            auVar96._20_4_ = fVar333 * fVar333 * fVar333 * auVar327._20_4_ * 0.5;
            auVar96._24_4_ = fVar252 * fVar252 * fVar252 * auVar327._24_4_ * 0.5;
            auVar96._28_4_ = auVar327._28_4_;
            auVar172 = vsubps_avx(auVar95,auVar96);
            fVar277 = auVar172._0_4_;
            fVar279 = auVar172._4_4_;
            fVar288 = auVar172._8_4_;
            fVar290 = auVar172._12_4_;
            fVar292 = auVar172._16_4_;
            fVar333 = auVar172._20_4_;
            fVar252 = auVar172._24_4_;
            fVar229 = (float)local_960._0_4_ * fVar359 * fVar229;
            fVar247 = (float)local_960._4_4_ * fVar304 * fVar247;
            auVar97._4_4_ = fVar247;
            auVar97._0_4_ = fVar229;
            fVar227 = fStack_958 * fVar358 * fVar227;
            auVar97._8_4_ = fVar227;
            fVar249 = fStack_954 * fVar254 * fVar249;
            auVar97._12_4_ = fVar249;
            fVar251 = fStack_950 * fVar361 * fVar251;
            auVar97._16_4_ = fVar251;
            fVar256 = fStack_94c * fVar360 * fVar256;
            auVar97._20_4_ = fVar256;
            fVar270 = fStack_948 * fVar362 * fVar270;
            auVar97._24_4_ = fVar270;
            auVar97._28_4_ = auVar165._28_4_;
            local_860._4_4_ = fVar247 + auVar400._4_4_;
            local_860._0_4_ = fVar229 + auVar400._0_4_;
            uStack_858._0_4_ = fVar227 + auVar400._8_4_;
            uStack_858._4_4_ = fVar249 + auVar400._12_4_;
            uStack_850._0_4_ = fVar251 + auVar400._16_4_;
            uStack_850._4_4_ = fVar256 + auVar400._20_4_;
            uStack_848._0_4_ = fVar270 + auVar400._24_4_;
            uStack_848._4_4_ = auVar165._28_4_ + auVar400._28_4_;
            local_7c0 = (float)local_960._0_4_ * fVar359 * -fVar257;
            fStack_7bc = (float)local_960._4_4_ * fVar304 * -fVar305;
            auVar98._4_4_ = fStack_7bc;
            auVar98._0_4_ = local_7c0;
            fStack_7b8 = fStack_958 * fVar358 * -fVar294;
            auVar98._8_4_ = fStack_7b8;
            fStack_7b4 = fStack_954 * fVar254 * -fVar178;
            auVar98._12_4_ = fStack_7b4;
            fStack_7b0 = fStack_950 * fVar361 * -fVar180;
            auVar98._16_4_ = fStack_7b0;
            fStack_7ac = fStack_94c * fVar360 * -fVar200;
            auVar98._20_4_ = fStack_7ac;
            fStack_7a8 = fStack_948 * fVar362 * -fVar201;
            auVar98._24_4_ = fStack_7a8;
            auVar98._28_4_ = -fVar203;
            local_7c0 = local_800._0_4_ + local_7c0;
            fStack_7bc = local_800._4_4_ + fStack_7bc;
            fStack_7b8 = local_800._8_4_ + fStack_7b8;
            fStack_7b4 = local_800._12_4_ + fStack_7b4;
            fStack_7b0 = local_800._16_4_ + fStack_7b0;
            fStack_7ac = local_800._20_4_ + fStack_7ac;
            fStack_7a8 = local_800._24_4_ + fStack_7a8;
            fStack_7a4 = local_800._28_4_ + -fVar203;
            fVar229 = fVar359 * 0.0 * (float)local_960._0_4_;
            fVar247 = fVar304 * 0.0 * (float)local_960._4_4_;
            auVar99._4_4_ = fVar247;
            auVar99._0_4_ = fVar229;
            fVar227 = fVar358 * 0.0 * fStack_958;
            auVar99._8_4_ = fVar227;
            fVar249 = fVar254 * 0.0 * fStack_954;
            auVar99._12_4_ = fVar249;
            fVar251 = fVar361 * 0.0 * fStack_950;
            auVar99._16_4_ = fVar251;
            fVar256 = fVar360 * 0.0 * fStack_94c;
            auVar99._20_4_ = fVar256;
            fVar270 = fVar362 * 0.0 * fStack_948;
            auVar99._24_4_ = fVar270;
            auVar99._28_4_ = fVar203;
            auVar45 = vsubps_avx(auVar400,auVar97);
            auVar408._0_4_ = fVar229 + auVar168._0_4_;
            auVar408._4_4_ = fVar247 + auVar168._4_4_;
            auVar408._8_4_ = fVar227 + auVar168._8_4_;
            auVar408._12_4_ = fVar249 + auVar168._12_4_;
            auVar408._16_4_ = fVar251 + auVar168._16_4_;
            auVar408._20_4_ = fVar256 + auVar168._20_4_;
            auVar408._24_4_ = fVar270 + auVar168._24_4_;
            auVar408._28_4_ = fVar203 + auVar168._28_4_;
            fVar229 = auVar314._0_4_ * fVar277 * fVar248;
            fVar248 = auVar314._4_4_ * fVar279 * fVar250;
            auVar100._4_4_ = fVar248;
            auVar100._0_4_ = fVar229;
            fVar247 = auVar314._8_4_ * fVar288 * fVar255;
            auVar100._8_4_ = fVar247;
            fVar250 = auVar314._12_4_ * fVar290 * fVar206;
            auVar100._12_4_ = fVar250;
            fVar227 = auVar314._16_4_ * fVar292 * fVar253;
            auVar100._16_4_ = fVar227;
            fVar255 = auVar314._20_4_ * fVar333 * fVar258;
            auVar100._20_4_ = fVar255;
            fVar249 = auVar314._24_4_ * fVar252 * fVar273;
            auVar100._24_4_ = fVar249;
            auVar100._28_4_ = fStack_944;
            auVar157 = vsubps_avx(local_800,auVar98);
            auVar389._0_4_ = local_7a0._0_4_ + fVar229;
            auVar389._4_4_ = local_7a0._4_4_ + fVar248;
            auVar389._8_4_ = local_7a0._8_4_ + fVar247;
            auVar389._12_4_ = local_7a0._12_4_ + fVar250;
            auVar389._16_4_ = auVar301._16_4_ + fVar227;
            auVar389._20_4_ = auVar301._20_4_ + fVar255;
            auVar389._24_4_ = auVar301._24_4_ + fVar249;
            auVar389._28_4_ = auVar301._28_4_ + fStack_944;
            fVar229 = fVar277 * -fVar275 * auVar314._0_4_;
            fVar248 = fVar279 * -fVar278 * auVar314._4_4_;
            auVar101._4_4_ = fVar248;
            auVar101._0_4_ = fVar229;
            fVar247 = fVar288 * -fVar280 * auVar314._8_4_;
            auVar101._8_4_ = fVar247;
            fVar250 = fVar290 * -fVar289 * auVar314._12_4_;
            auVar101._12_4_ = fVar250;
            fVar227 = fVar292 * -fVar291 * auVar314._16_4_;
            auVar101._16_4_ = fVar227;
            fVar255 = fVar333 * -fVar293 * auVar314._20_4_;
            auVar101._20_4_ = fVar255;
            fVar249 = fVar252 * -fVar334 * auVar314._24_4_;
            auVar101._24_4_ = fVar249;
            auVar101._28_4_ = auVar400._28_4_;
            auVar158 = vsubps_avx(auVar168,auVar99);
            auVar269._0_4_ = auVar286._0_4_ + fVar229;
            auVar269._4_4_ = auVar286._4_4_ + fVar248;
            auVar269._8_4_ = auVar286._8_4_ + fVar247;
            auVar269._12_4_ = auVar286._12_4_ + fVar250;
            auVar269._16_4_ = auVar286._16_4_ + fVar227;
            auVar269._20_4_ = auVar286._20_4_ + fVar255;
            auVar269._24_4_ = auVar286._24_4_ + fVar249;
            auVar269._28_4_ = auVar286._28_4_ + auVar400._28_4_;
            fVar229 = fVar277 * 0.0 * auVar314._0_4_;
            fVar248 = fVar279 * 0.0 * auVar314._4_4_;
            auVar102._4_4_ = fVar248;
            auVar102._0_4_ = fVar229;
            fVar247 = fVar288 * 0.0 * auVar314._8_4_;
            auVar102._8_4_ = fVar247;
            fVar250 = fVar290 * 0.0 * auVar314._12_4_;
            auVar102._12_4_ = fVar250;
            fVar227 = fVar292 * 0.0 * auVar314._16_4_;
            auVar102._16_4_ = fVar227;
            fVar255 = fVar333 * 0.0 * auVar314._20_4_;
            auVar102._20_4_ = fVar255;
            fVar249 = fVar252 * 0.0 * auVar314._24_4_;
            auVar102._24_4_ = fVar249;
            auVar102._28_4_ = auVar168._28_4_;
            auVar165 = vsubps_avx(auVar301,auVar100);
            auVar135._4_4_ = fStack_5dc;
            auVar135._0_4_ = local_5e0;
            auVar135._8_4_ = fStack_5d8;
            auVar135._12_4_ = fStack_5d4;
            auVar135._16_4_ = fStack_5d0;
            auVar135._20_4_ = fStack_5cc;
            auVar135._24_4_ = fStack_5c8;
            auVar135._28_4_ = fStack_5c4;
            auVar344._0_4_ = local_5e0 + fVar229;
            auVar344._4_4_ = fStack_5dc + fVar248;
            auVar344._8_4_ = fStack_5d8 + fVar247;
            auVar344._12_4_ = fStack_5d4 + fVar250;
            auVar344._16_4_ = fStack_5d0 + fVar227;
            auVar344._20_4_ = fStack_5cc + fVar255;
            auVar344._24_4_ = fStack_5c8 + fVar249;
            auVar344._28_4_ = fStack_5c4 + auVar168._28_4_;
            auVar42 = vsubps_avx(auVar286,auVar101);
            auVar43 = vsubps_avx(auVar135,auVar102);
            auVar44 = vsubps_avx(auVar269,auVar157);
            auVar342 = vsubps_avx(auVar344,auVar158);
            auVar103._4_4_ = auVar158._4_4_ * auVar44._4_4_;
            auVar103._0_4_ = auVar158._0_4_ * auVar44._0_4_;
            auVar103._8_4_ = auVar158._8_4_ * auVar44._8_4_;
            auVar103._12_4_ = auVar158._12_4_ * auVar44._12_4_;
            auVar103._16_4_ = auVar158._16_4_ * auVar44._16_4_;
            auVar103._20_4_ = auVar158._20_4_ * auVar44._20_4_;
            auVar103._24_4_ = auVar158._24_4_ * auVar44._24_4_;
            auVar103._28_4_ = auVar382._28_4_;
            auVar104._4_4_ = auVar157._4_4_ * auVar342._4_4_;
            auVar104._0_4_ = auVar157._0_4_ * auVar342._0_4_;
            auVar104._8_4_ = auVar157._8_4_ * auVar342._8_4_;
            auVar104._12_4_ = auVar157._12_4_ * auVar342._12_4_;
            auVar104._16_4_ = auVar157._16_4_ * auVar342._16_4_;
            auVar104._20_4_ = auVar157._20_4_ * auVar342._20_4_;
            auVar104._24_4_ = auVar157._24_4_ * auVar342._24_4_;
            auVar104._28_4_ = fStack_5c4;
            auVar46 = vsubps_avx(auVar104,auVar103);
            auVar105._4_4_ = auVar45._4_4_ * auVar342._4_4_;
            auVar105._0_4_ = auVar45._0_4_ * auVar342._0_4_;
            auVar105._8_4_ = auVar45._8_4_ * auVar342._8_4_;
            auVar105._12_4_ = auVar45._12_4_ * auVar342._12_4_;
            auVar105._16_4_ = auVar45._16_4_ * auVar342._16_4_;
            auVar105._20_4_ = auVar45._20_4_ * auVar342._20_4_;
            auVar105._24_4_ = auVar45._24_4_ * auVar342._24_4_;
            auVar105._28_4_ = auVar342._28_4_;
            auVar342 = vsubps_avx(auVar389,auVar45);
            auVar106._4_4_ = auVar158._4_4_ * auVar342._4_4_;
            auVar106._0_4_ = auVar158._0_4_ * auVar342._0_4_;
            auVar106._8_4_ = auVar158._8_4_ * auVar342._8_4_;
            auVar106._12_4_ = auVar158._12_4_ * auVar342._12_4_;
            auVar106._16_4_ = auVar158._16_4_ * auVar342._16_4_;
            auVar106._20_4_ = auVar158._20_4_ * auVar342._20_4_;
            auVar106._24_4_ = auVar158._24_4_ * auVar342._24_4_;
            auVar106._28_4_ = auVar172._28_4_;
            auVar47 = vsubps_avx(auVar106,auVar105);
            auVar107._4_4_ = auVar157._4_4_ * auVar342._4_4_;
            auVar107._0_4_ = auVar157._0_4_ * auVar342._0_4_;
            auVar107._8_4_ = auVar157._8_4_ * auVar342._8_4_;
            auVar107._12_4_ = auVar157._12_4_ * auVar342._12_4_;
            auVar107._16_4_ = auVar157._16_4_ * auVar342._16_4_;
            auVar107._20_4_ = auVar157._20_4_ * auVar342._20_4_;
            auVar107._24_4_ = auVar157._24_4_ * auVar342._24_4_;
            auVar107._28_4_ = auVar172._28_4_;
            auVar108._4_4_ = auVar45._4_4_ * auVar44._4_4_;
            auVar108._0_4_ = auVar45._0_4_ * auVar44._0_4_;
            auVar108._8_4_ = auVar45._8_4_ * auVar44._8_4_;
            auVar108._12_4_ = auVar45._12_4_ * auVar44._12_4_;
            auVar108._16_4_ = auVar45._16_4_ * auVar44._16_4_;
            auVar108._20_4_ = auVar45._20_4_ * auVar44._20_4_;
            auVar108._24_4_ = auVar45._24_4_ * auVar44._24_4_;
            auVar108._28_4_ = auVar44._28_4_;
            auVar172 = vsubps_avx(auVar108,auVar107);
            auVar193._0_4_ = auVar46._0_4_ * 0.0 + auVar172._0_4_ + auVar47._0_4_ * 0.0;
            auVar193._4_4_ = auVar46._4_4_ * 0.0 + auVar172._4_4_ + auVar47._4_4_ * 0.0;
            auVar193._8_4_ = auVar46._8_4_ * 0.0 + auVar172._8_4_ + auVar47._8_4_ * 0.0;
            auVar193._12_4_ = auVar46._12_4_ * 0.0 + auVar172._12_4_ + auVar47._12_4_ * 0.0;
            auVar193._16_4_ = auVar46._16_4_ * 0.0 + auVar172._16_4_ + auVar47._16_4_ * 0.0;
            auVar193._20_4_ = auVar46._20_4_ * 0.0 + auVar172._20_4_ + auVar47._20_4_ * 0.0;
            auVar193._24_4_ = auVar46._24_4_ * 0.0 + auVar172._24_4_ + auVar47._24_4_ * 0.0;
            auVar193._28_4_ = auVar46._28_4_ + auVar172._28_4_ + auVar47._28_4_;
            auVar40 = vcmpps_avx(auVar193,ZEXT832(0) << 0x20,2);
            auVar165 = vblendvps_avx(auVar165,_local_860,auVar40);
            auVar134._4_4_ = fStack_7bc;
            auVar134._0_4_ = local_7c0;
            auVar134._8_4_ = fStack_7b8;
            auVar134._12_4_ = fStack_7b4;
            auVar134._16_4_ = fStack_7b0;
            auVar134._20_4_ = fStack_7ac;
            auVar134._24_4_ = fStack_7a8;
            auVar134._28_4_ = fStack_7a4;
            auVar172 = vblendvps_avx(auVar42,auVar134,auVar40);
            auVar42 = vblendvps_avx(auVar43,auVar408,auVar40);
            auVar43 = vblendvps_avx(auVar45,auVar389,auVar40);
            auVar44 = vblendvps_avx(auVar157,auVar269,auVar40);
            auVar342 = vblendvps_avx(auVar158,auVar344,auVar40);
            auVar45 = vblendvps_avx(auVar389,auVar45,auVar40);
            auVar46 = vblendvps_avx(auVar269,auVar157,auVar40);
            auVar47 = vblendvps_avx(auVar344,auVar158,auVar40);
            local_800 = vandps_avx(local_580,auVar244);
            auVar45 = vsubps_avx(auVar45,auVar165);
            auVar186 = vsubps_avx(auVar46,auVar172);
            auVar47 = vsubps_avx(auVar47,auVar42);
            auVar187 = vsubps_avx(auVar172,auVar44);
            fVar229 = auVar186._0_4_;
            fVar260 = auVar42._0_4_;
            fVar206 = auVar186._4_4_;
            fVar272 = auVar42._4_4_;
            auVar109._4_4_ = fVar272 * fVar206;
            auVar109._0_4_ = fVar260 * fVar229;
            fVar275 = auVar186._8_4_;
            fVar274 = auVar42._8_4_;
            auVar109._8_4_ = fVar274 * fVar275;
            fVar290 = auVar186._12_4_;
            fVar276 = auVar42._12_4_;
            auVar109._12_4_ = fVar276 * fVar290;
            fVar359 = auVar186._16_4_;
            fVar316 = auVar42._16_4_;
            auVar109._16_4_ = fVar316 * fVar359;
            fVar257 = auVar186._20_4_;
            fVar317 = auVar42._20_4_;
            auVar109._20_4_ = fVar317 * fVar257;
            fVar203 = auVar186._24_4_;
            fVar318 = auVar42._24_4_;
            auVar109._24_4_ = fVar318 * fVar203;
            auVar109._28_4_ = auVar46._28_4_;
            fVar248 = auVar172._0_4_;
            fVar336 = auVar47._0_4_;
            fVar251 = auVar172._4_4_;
            fVar152 = auVar47._4_4_;
            auVar110._4_4_ = fVar152 * fVar251;
            auVar110._0_4_ = fVar336 * fVar248;
            fVar277 = auVar172._8_4_;
            fVar176 = auVar47._8_4_;
            auVar110._8_4_ = fVar176 * fVar277;
            fVar291 = auVar172._12_4_;
            fVar228 = auVar47._12_4_;
            auVar110._12_4_ = fVar228 * fVar291;
            fVar304 = auVar172._16_4_;
            fVar177 = auVar47._16_4_;
            auVar110._16_4_ = fVar177 * fVar304;
            fVar305 = auVar172._20_4_;
            fVar179 = auVar47._20_4_;
            auVar110._20_4_ = fVar179 * fVar305;
            fVar204 = auVar172._24_4_;
            fVar199 = auVar47._24_4_;
            uVar12 = auVar157._28_4_;
            auVar110._24_4_ = fVar199 * fVar204;
            auVar110._28_4_ = uVar12;
            auVar46 = vsubps_avx(auVar110,auVar109);
            fVar247 = auVar165._0_4_;
            fVar253 = auVar165._4_4_;
            auVar111._4_4_ = fVar152 * fVar253;
            auVar111._0_4_ = fVar336 * fVar247;
            fVar278 = auVar165._8_4_;
            auVar111._8_4_ = fVar176 * fVar278;
            fVar292 = auVar165._12_4_;
            auVar111._12_4_ = fVar228 * fVar292;
            fVar358 = auVar165._16_4_;
            auVar111._16_4_ = fVar177 * fVar358;
            fVar294 = auVar165._20_4_;
            auVar111._20_4_ = fVar179 * fVar294;
            fVar205 = auVar165._24_4_;
            auVar111._24_4_ = fVar199 * fVar205;
            auVar111._28_4_ = uVar12;
            fVar250 = auVar45._0_4_;
            fVar256 = auVar45._4_4_;
            auVar112._4_4_ = fVar272 * fVar256;
            auVar112._0_4_ = fVar260 * fVar250;
            fVar279 = auVar45._8_4_;
            auVar112._8_4_ = fVar274 * fVar279;
            fVar293 = auVar45._12_4_;
            auVar112._12_4_ = fVar276 * fVar293;
            fVar254 = auVar45._16_4_;
            auVar112._16_4_ = fVar316 * fVar254;
            fVar178 = auVar45._20_4_;
            auVar112._20_4_ = fVar317 * fVar178;
            fVar207 = auVar45._24_4_;
            auVar112._24_4_ = fVar318 * fVar207;
            auVar112._28_4_ = auVar389._28_4_;
            auVar157 = vsubps_avx(auVar112,auVar111);
            auVar113._4_4_ = fVar251 * fVar256;
            auVar113._0_4_ = fVar248 * fVar250;
            auVar113._8_4_ = fVar277 * fVar279;
            auVar113._12_4_ = fVar291 * fVar293;
            auVar113._16_4_ = fVar304 * fVar254;
            auVar113._20_4_ = fVar305 * fVar178;
            auVar113._24_4_ = fVar204 * fVar207;
            auVar113._28_4_ = uVar12;
            auVar114._4_4_ = fVar253 * fVar206;
            auVar114._0_4_ = fVar247 * fVar229;
            auVar114._8_4_ = fVar278 * fVar275;
            auVar114._12_4_ = fVar292 * fVar290;
            auVar114._16_4_ = fVar358 * fVar359;
            auVar114._20_4_ = fVar294 * fVar257;
            auVar114._24_4_ = fVar205 * fVar203;
            auVar114._28_4_ = auVar158._28_4_;
            auVar158 = vsubps_avx(auVar114,auVar113);
            auVar42 = vsubps_avx(auVar42,auVar342);
            fVar255 = auVar158._28_4_ + auVar157._28_4_;
            auVar355._0_4_ = auVar158._0_4_ + auVar157._0_4_ * 0.0 + auVar46._0_4_ * 0.0;
            auVar355._4_4_ = auVar158._4_4_ + auVar157._4_4_ * 0.0 + auVar46._4_4_ * 0.0;
            auVar355._8_4_ = auVar158._8_4_ + auVar157._8_4_ * 0.0 + auVar46._8_4_ * 0.0;
            auVar355._12_4_ = auVar158._12_4_ + auVar157._12_4_ * 0.0 + auVar46._12_4_ * 0.0;
            auVar355._16_4_ = auVar158._16_4_ + auVar157._16_4_ * 0.0 + auVar46._16_4_ * 0.0;
            auVar355._20_4_ = auVar158._20_4_ + auVar157._20_4_ * 0.0 + auVar46._20_4_ * 0.0;
            auVar355._24_4_ = auVar158._24_4_ + auVar157._24_4_ * 0.0 + auVar46._24_4_ * 0.0;
            auVar355._28_4_ = fVar255 + auVar46._28_4_;
            fVar227 = auVar187._0_4_;
            fVar258 = auVar187._4_4_;
            auVar115._4_4_ = auVar342._4_4_ * fVar258;
            auVar115._0_4_ = auVar342._0_4_ * fVar227;
            fVar280 = auVar187._8_4_;
            auVar115._8_4_ = auVar342._8_4_ * fVar280;
            fVar333 = auVar187._12_4_;
            auVar115._12_4_ = auVar342._12_4_ * fVar333;
            fVar361 = auVar187._16_4_;
            auVar115._16_4_ = auVar342._16_4_ * fVar361;
            fVar180 = auVar187._20_4_;
            auVar115._20_4_ = auVar342._20_4_ * fVar180;
            fVar208 = auVar187._24_4_;
            auVar115._24_4_ = auVar342._24_4_ * fVar208;
            auVar115._28_4_ = fVar255;
            fVar255 = auVar42._0_4_;
            fVar270 = auVar42._4_4_;
            auVar116._4_4_ = auVar44._4_4_ * fVar270;
            auVar116._0_4_ = auVar44._0_4_ * fVar255;
            fVar288 = auVar42._8_4_;
            auVar116._8_4_ = auVar44._8_4_ * fVar288;
            fVar334 = auVar42._12_4_;
            auVar116._12_4_ = auVar44._12_4_ * fVar334;
            fVar360 = auVar42._16_4_;
            auVar116._16_4_ = auVar44._16_4_ * fVar360;
            fVar200 = auVar42._20_4_;
            auVar116._20_4_ = auVar44._20_4_ * fVar200;
            fVar306 = auVar42._24_4_;
            auVar116._24_4_ = auVar44._24_4_ * fVar306;
            auVar116._28_4_ = auVar158._28_4_;
            auVar157 = vsubps_avx(auVar116,auVar115);
            auVar165 = vsubps_avx(auVar165,auVar43);
            fVar249 = auVar165._0_4_;
            fVar273 = auVar165._4_4_;
            auVar117._4_4_ = auVar342._4_4_ * fVar273;
            auVar117._0_4_ = auVar342._0_4_ * fVar249;
            fVar289 = auVar165._8_4_;
            auVar117._8_4_ = auVar342._8_4_ * fVar289;
            fVar252 = auVar165._12_4_;
            auVar117._12_4_ = auVar342._12_4_ * fVar252;
            fVar362 = auVar165._16_4_;
            auVar117._16_4_ = auVar342._16_4_ * fVar362;
            fVar201 = auVar165._20_4_;
            auVar117._20_4_ = auVar342._20_4_ * fVar201;
            fVar230 = auVar165._24_4_;
            auVar117._24_4_ = auVar342._24_4_ * fVar230;
            auVar117._28_4_ = auVar342._28_4_;
            auVar118._4_4_ = fVar270 * auVar43._4_4_;
            auVar118._0_4_ = fVar255 * auVar43._0_4_;
            auVar118._8_4_ = fVar288 * auVar43._8_4_;
            auVar118._12_4_ = fVar334 * auVar43._12_4_;
            auVar118._16_4_ = fVar360 * auVar43._16_4_;
            auVar118._20_4_ = fVar200 * auVar43._20_4_;
            auVar118._24_4_ = fVar306 * auVar43._24_4_;
            auVar118._28_4_ = auVar46._28_4_;
            auVar165 = vsubps_avx(auVar117,auVar118);
            auVar119._4_4_ = auVar44._4_4_ * fVar273;
            auVar119._0_4_ = auVar44._0_4_ * fVar249;
            auVar119._8_4_ = auVar44._8_4_ * fVar289;
            auVar119._12_4_ = auVar44._12_4_ * fVar252;
            auVar119._16_4_ = auVar44._16_4_ * fVar362;
            auVar119._20_4_ = auVar44._20_4_ * fVar201;
            auVar119._24_4_ = auVar44._24_4_ * fVar230;
            auVar119._28_4_ = auVar44._28_4_;
            auVar120._4_4_ = fVar258 * auVar43._4_4_;
            auVar120._0_4_ = fVar227 * auVar43._0_4_;
            auVar120._8_4_ = fVar280 * auVar43._8_4_;
            auVar120._12_4_ = fVar333 * auVar43._12_4_;
            auVar120._16_4_ = fVar361 * auVar43._16_4_;
            auVar120._20_4_ = fVar180 * auVar43._20_4_;
            auVar120._24_4_ = fVar208 * auVar43._24_4_;
            auVar120._28_4_ = auVar43._28_4_;
            auVar43 = vsubps_avx(auVar120,auVar119);
            auVar169._0_4_ = auVar157._0_4_ * 0.0 + auVar43._0_4_ + auVar165._0_4_ * 0.0;
            auVar169._4_4_ = auVar157._4_4_ * 0.0 + auVar43._4_4_ + auVar165._4_4_ * 0.0;
            auVar169._8_4_ = auVar157._8_4_ * 0.0 + auVar43._8_4_ + auVar165._8_4_ * 0.0;
            auVar169._12_4_ = auVar157._12_4_ * 0.0 + auVar43._12_4_ + auVar165._12_4_ * 0.0;
            auVar169._16_4_ = auVar157._16_4_ * 0.0 + auVar43._16_4_ + auVar165._16_4_ * 0.0;
            auVar169._20_4_ = auVar157._20_4_ * 0.0 + auVar43._20_4_ + auVar165._20_4_ * 0.0;
            auVar169._24_4_ = auVar157._24_4_ * 0.0 + auVar43._24_4_ + auVar165._24_4_ * 0.0;
            auVar169._28_4_ = auVar165._28_4_ + auVar43._28_4_ + auVar165._28_4_;
            auVar175 = ZEXT3264(auVar169);
            auVar165 = vmaxps_avx(auVar355,auVar169);
            auVar165 = vcmpps_avx(auVar165,ZEXT832(0) << 0x20,2);
            auVar43 = local_800 & auVar165;
            auVar128 = auVar172;
            if ((((((((auVar43 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar43 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar43 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar43 >> 0x7f,0) == '\0') &&
                  (auVar43 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar43 >> 0xbf,0) == '\0') &&
                (auVar43 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar43[0x1f]) {
LAB_0115909c:
              auVar303 = ZEXT3264(auVar128);
              auVar246 = ZEXT3264(CONCAT824(uStack_648,
                                            CONCAT816(uStack_650,CONCAT88(uStack_658,local_660))));
            }
            else {
              auVar43 = vandps_avx(auVar165,local_800);
              auVar121._4_4_ = fVar270 * fVar206;
              auVar121._0_4_ = fVar255 * fVar229;
              auVar121._8_4_ = fVar288 * fVar275;
              auVar121._12_4_ = fVar334 * fVar290;
              auVar121._16_4_ = fVar360 * fVar359;
              auVar121._20_4_ = fVar200 * fVar257;
              auVar121._24_4_ = fVar306 * fVar203;
              auVar121._28_4_ = local_800._28_4_;
              auVar122._4_4_ = fVar258 * fVar152;
              auVar122._0_4_ = fVar227 * fVar336;
              auVar122._8_4_ = fVar280 * fVar176;
              auVar122._12_4_ = fVar333 * fVar228;
              auVar122._16_4_ = fVar361 * fVar177;
              auVar122._20_4_ = fVar180 * fVar179;
              auVar122._24_4_ = fVar208 * fVar199;
              auVar122._28_4_ = auVar165._28_4_;
              auVar44 = vsubps_avx(auVar122,auVar121);
              auVar123._4_4_ = fVar273 * fVar152;
              auVar123._0_4_ = fVar249 * fVar336;
              auVar123._8_4_ = fVar289 * fVar176;
              auVar123._12_4_ = fVar252 * fVar228;
              auVar123._16_4_ = fVar362 * fVar177;
              auVar123._20_4_ = fVar201 * fVar179;
              auVar123._24_4_ = fVar230 * fVar199;
              auVar123._28_4_ = auVar47._28_4_;
              auVar124._4_4_ = fVar270 * fVar256;
              auVar124._0_4_ = fVar255 * fVar250;
              auVar124._8_4_ = fVar288 * fVar279;
              auVar124._12_4_ = fVar334 * fVar293;
              auVar124._16_4_ = fVar360 * fVar254;
              auVar124._20_4_ = fVar200 * fVar178;
              auVar124._24_4_ = fVar306 * fVar207;
              auVar124._28_4_ = auVar42._28_4_;
              auVar342 = vsubps_avx(auVar124,auVar123);
              auVar125._4_4_ = fVar258 * fVar256;
              auVar125._0_4_ = fVar227 * fVar250;
              auVar125._8_4_ = fVar280 * fVar279;
              auVar125._12_4_ = fVar333 * fVar293;
              auVar125._16_4_ = fVar361 * fVar254;
              auVar125._20_4_ = fVar180 * fVar178;
              auVar125._24_4_ = fVar208 * fVar207;
              auVar125._28_4_ = auVar45._28_4_;
              auVar126._4_4_ = fVar273 * fVar206;
              auVar126._0_4_ = fVar249 * fVar229;
              auVar126._8_4_ = fVar289 * fVar275;
              auVar126._12_4_ = fVar252 * fVar290;
              auVar126._16_4_ = fVar362 * fVar359;
              auVar126._20_4_ = fVar201 * fVar257;
              auVar126._24_4_ = fVar230 * fVar203;
              auVar126._28_4_ = auVar186._28_4_;
              auVar46 = vsubps_avx(auVar126,auVar125);
              auVar328._0_4_ = auVar44._0_4_ * 0.0 + auVar46._0_4_ + auVar342._0_4_ * 0.0;
              auVar328._4_4_ = auVar44._4_4_ * 0.0 + auVar46._4_4_ + auVar342._4_4_ * 0.0;
              auVar328._8_4_ = auVar44._8_4_ * 0.0 + auVar46._8_4_ + auVar342._8_4_ * 0.0;
              auVar328._12_4_ = auVar44._12_4_ * 0.0 + auVar46._12_4_ + auVar342._12_4_ * 0.0;
              auVar328._16_4_ = auVar44._16_4_ * 0.0 + auVar46._16_4_ + auVar342._16_4_ * 0.0;
              auVar328._20_4_ = auVar44._20_4_ * 0.0 + auVar46._20_4_ + auVar342._20_4_ * 0.0;
              auVar328._24_4_ = auVar44._24_4_ * 0.0 + auVar46._24_4_ + auVar342._24_4_ * 0.0;
              auVar328._28_4_ = auVar187._28_4_ + auVar46._28_4_ + auVar45._28_4_;
              auVar165 = vrcpps_avx(auVar328);
              fVar229 = auVar165._0_4_;
              fVar250 = auVar165._4_4_;
              auVar127._4_4_ = auVar328._4_4_ * fVar250;
              auVar127._0_4_ = auVar328._0_4_ * fVar229;
              fVar227 = auVar165._8_4_;
              auVar127._8_4_ = auVar328._8_4_ * fVar227;
              fVar255 = auVar165._12_4_;
              auVar127._12_4_ = auVar328._12_4_ * fVar255;
              fVar249 = auVar165._16_4_;
              auVar127._16_4_ = auVar328._16_4_ * fVar249;
              fVar206 = auVar165._20_4_;
              auVar127._20_4_ = auVar328._20_4_ * fVar206;
              fVar256 = auVar165._24_4_;
              auVar127._24_4_ = auVar328._24_4_ * fVar256;
              auVar127._28_4_ = auVar42._28_4_;
              auVar383._8_4_ = 0x3f800000;
              auVar383._0_8_ = 0x3f8000003f800000;
              auVar383._12_4_ = 0x3f800000;
              auVar383._16_4_ = 0x3f800000;
              auVar383._20_4_ = 0x3f800000;
              auVar383._24_4_ = 0x3f800000;
              auVar383._28_4_ = 0x3f800000;
              auVar165 = vsubps_avx(auVar383,auVar127);
              fVar229 = auVar165._0_4_ * fVar229 + fVar229;
              fVar250 = auVar165._4_4_ * fVar250 + fVar250;
              fVar227 = auVar165._8_4_ * fVar227 + fVar227;
              fVar255 = auVar165._12_4_ * fVar255 + fVar255;
              fVar249 = auVar165._16_4_ * fVar249 + fVar249;
              fVar206 = auVar165._20_4_ * fVar206 + fVar206;
              fVar256 = auVar165._24_4_ * fVar256 + fVar256;
              fVar248 = auVar342._0_4_ * fVar248;
              fVar251 = auVar342._4_4_ * fVar251;
              auVar128._4_4_ = fVar251;
              auVar128._0_4_ = fVar248;
              fVar277 = auVar342._8_4_ * fVar277;
              auVar128._8_4_ = fVar277;
              fVar291 = auVar342._12_4_ * fVar291;
              auVar128._12_4_ = fVar291;
              fVar304 = auVar342._16_4_ * fVar304;
              auVar128._16_4_ = fVar304;
              fVar305 = auVar342._20_4_ * fVar305;
              auVar128._20_4_ = fVar305;
              fVar204 = auVar342._24_4_ * fVar204;
              auVar128._24_4_ = fVar204;
              auVar128._28_4_ = auVar172._28_4_;
              auVar129._4_4_ =
                   (fVar253 * auVar44._4_4_ + fVar251 + fVar272 * auVar46._4_4_) * fVar250;
              auVar129._0_4_ =
                   (fVar247 * auVar44._0_4_ + fVar248 + fVar260 * auVar46._0_4_) * fVar229;
              auVar129._8_4_ =
                   (fVar278 * auVar44._8_4_ + fVar277 + fVar274 * auVar46._8_4_) * fVar227;
              auVar129._12_4_ =
                   (fVar292 * auVar44._12_4_ + fVar291 + fVar276 * auVar46._12_4_) * fVar255;
              auVar129._16_4_ =
                   (fVar358 * auVar44._16_4_ + fVar304 + fVar316 * auVar46._16_4_) * fVar249;
              auVar129._20_4_ =
                   (fVar294 * auVar44._20_4_ + fVar305 + fVar317 * auVar46._20_4_) * fVar206;
              auVar129._24_4_ =
                   (fVar205 * auVar44._24_4_ + fVar204 + fVar318 * auVar46._24_4_) * fVar256;
              auVar129._28_4_ = auVar172._28_4_ + auVar46._28_4_;
              uVar12 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar245._4_4_ = uVar12;
              auVar245._0_4_ = uVar12;
              auVar245._8_4_ = uVar12;
              auVar245._12_4_ = uVar12;
              auVar245._16_4_ = uVar12;
              auVar245._20_4_ = uVar12;
              auVar245._24_4_ = uVar12;
              auVar245._28_4_ = uVar12;
              auVar172 = vcmpps_avx(local_100,auVar129,2);
              auVar165 = vcmpps_avx(auVar129,auVar245,2);
              auVar165 = vandps_avx(auVar172,auVar165);
              auVar42 = auVar43 & auVar165;
              if ((((((((auVar42 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar42 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar42 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar42 >> 0x7f,0) == '\0') &&
                    (auVar42 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar42 >> 0xbf,0) == '\0') &&
                  (auVar42 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar42[0x1f]) goto LAB_0115909c;
              auVar165 = vandps_avx(auVar43,auVar165);
              auVar303 = ZEXT3264(auVar165);
              auVar42 = vcmpps_avx(auVar328,ZEXT832(0) << 0x20,4);
              auVar43 = auVar165 & auVar42;
              auVar246 = ZEXT3264(CONCAT824(uStack_648,
                                            CONCAT816(uStack_650,CONCAT88(uStack_658,local_660))));
              if ((((((((auVar43 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar43 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar43 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar43 >> 0x7f,0) != '\0') ||
                    (auVar43 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar43 >> 0xbf,0) != '\0') ||
                  (auVar43 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar43[0x1f] < '\0') {
                auVar165 = vandps_avx(auVar42,auVar165);
                auVar246 = ZEXT3264(auVar165);
                auVar130._4_4_ = auVar355._4_4_ * fVar250;
                auVar130._0_4_ = auVar355._0_4_ * fVar229;
                auVar130._8_4_ = auVar355._8_4_ * fVar227;
                auVar130._12_4_ = auVar355._12_4_ * fVar255;
                auVar130._16_4_ = auVar355._16_4_ * fVar249;
                auVar130._20_4_ = auVar355._20_4_ * fVar206;
                auVar130._24_4_ = auVar355._24_4_ * fVar256;
                auVar130._28_4_ = auVar172._28_4_;
                auVar131._4_4_ = auVar169._4_4_ * fVar250;
                auVar131._0_4_ = auVar169._0_4_ * fVar229;
                auVar131._8_4_ = auVar169._8_4_ * fVar227;
                auVar131._12_4_ = auVar169._12_4_ * fVar255;
                auVar131._16_4_ = auVar169._16_4_ * fVar249;
                auVar131._20_4_ = auVar169._20_4_ * fVar206;
                auVar131._24_4_ = auVar169._24_4_ * fVar256;
                auVar131._28_4_ = auVar169._28_4_;
                auVar302._8_4_ = 0x3f800000;
                auVar302._0_8_ = 0x3f8000003f800000;
                auVar302._12_4_ = 0x3f800000;
                auVar302._16_4_ = 0x3f800000;
                auVar302._20_4_ = 0x3f800000;
                auVar302._24_4_ = 0x3f800000;
                auVar302._28_4_ = 0x3f800000;
                auVar303 = ZEXT3264(auVar302);
                auVar165 = vsubps_avx(auVar302,auVar130);
                local_4e0 = vblendvps_avx(auVar165,auVar130,auVar40);
                auVar165 = vsubps_avx(auVar302,auVar131);
                _local_500 = vblendvps_avx(auVar165,auVar131,auVar40);
                auVar175 = ZEXT3264(_local_500);
                local_600 = auVar129;
              }
            }
            auVar165 = auVar246._0_32_;
            local_520 = auVar41;
            if ((((((((auVar165 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar165 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar165 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar165 >> 0x7f,0) != '\0') ||
                  (auVar246 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                 SUB321(auVar165 >> 0xbf,0) != '\0') ||
                (auVar246 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                auVar246[0x1f] < '\0') {
              auVar172 = vsubps_avx(auVar314,_local_960);
              local_960._0_4_ = (float)local_960._0_4_ + local_4e0._0_4_ * auVar172._0_4_;
              local_960._4_4_ = (float)local_960._4_4_ + local_4e0._4_4_ * auVar172._4_4_;
              fStack_958 = fStack_958 + local_4e0._8_4_ * auVar172._8_4_;
              fStack_954 = fStack_954 + local_4e0._12_4_ * auVar172._12_4_;
              fStack_950 = fStack_950 + local_4e0._16_4_ * auVar172._16_4_;
              fStack_94c = fStack_94c + local_4e0._20_4_ * auVar172._20_4_;
              fStack_948 = fStack_948 + local_4e0._24_4_ * auVar172._24_4_;
              fStack_944 = fStack_944 + auVar172._28_4_;
              fVar229 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
              auVar132._4_4_ = ((float)local_960._4_4_ + (float)local_960._4_4_) * fVar229;
              auVar132._0_4_ = ((float)local_960._0_4_ + (float)local_960._0_4_) * fVar229;
              auVar132._8_4_ = (fStack_958 + fStack_958) * fVar229;
              auVar132._12_4_ = (fStack_954 + fStack_954) * fVar229;
              auVar132._16_4_ = (fStack_950 + fStack_950) * fVar229;
              auVar132._20_4_ = (fStack_94c + fStack_94c) * fVar229;
              auVar132._24_4_ = (fStack_948 + fStack_948) * fVar229;
              auVar132._28_4_ = fStack_944 + fStack_944;
              auVar172 = vcmpps_avx(local_600,auVar132,6);
              auVar175 = ZEXT3264(auVar172);
              auVar41 = auVar165 & auVar172;
              if ((((((((auVar41 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar41 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar41 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar41 >> 0x7f,0) != '\0') ||
                    (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar41 >> 0xbf,0) != '\0') ||
                  (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar41[0x1f] < '\0') {
                local_400 = (float)local_500._0_4_ + (float)local_500._0_4_ + -1.0;
                fStack_3fc = (float)local_500._4_4_ + (float)local_500._4_4_ + -1.0;
                fStack_3f8 = (float)uStack_4f8 + (float)uStack_4f8 + -1.0;
                fStack_3f4 = uStack_4f8._4_4_ + uStack_4f8._4_4_ + -1.0;
                fStack_3f0 = (float)uStack_4f0 + (float)uStack_4f0 + -1.0;
                fStack_3ec = uStack_4f0._4_4_ + uStack_4f0._4_4_ + -1.0;
                fStack_3e8 = (float)uStack_4e8 + (float)uStack_4e8 + -1.0;
                fStack_3e4 = uStack_4e8._4_4_ + uStack_4e8._4_4_ + -1.0;
                local_500._4_4_ = fStack_3fc;
                local_500._0_4_ = local_400;
                uStack_4f8._0_4_ = fStack_3f8;
                uStack_4f8._4_4_ = fStack_3f4;
                uStack_4f0._0_4_ = fStack_3f0;
                uStack_4f0._4_4_ = fStack_3ec;
                auVar141 = _local_500;
                uStack_4e8._0_4_ = fStack_3e8;
                uStack_4e8._4_4_ = fStack_3e4;
                auVar41 = _local_500;
                local_3e0 = local_600;
                uStack_3a8 = uStack_918;
                uStack_398 = uStack_898;
                uStack_388 = uStack_8a8;
                uStack_378 = uStack_8b8;
                auVar150 = (undefined1  [8])(context->scene->geometries).items[uVar146].ptr;
                _local_500 = auVar41;
                if ((((Geometry *)auVar150)->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  local_6a0 = vandps_avx(auVar172,auVar165);
                  auVar282 = vshufps_avx(ZEXT416((uint)(float)(int)local_3c0),
                                         ZEXT416((uint)(float)(int)local_3c0),0);
                  local_340[0] = (auVar282._0_4_ + local_4e0._0_4_ + 0.0) * (float)local_160._0_4_;
                  local_340[1] = (auVar282._4_4_ + local_4e0._4_4_ + 1.0) * (float)local_160._4_4_;
                  local_340[2] = (auVar282._8_4_ + local_4e0._8_4_ + 2.0) * fStack_158;
                  local_340[3] = (auVar282._12_4_ + local_4e0._12_4_ + 3.0) * fStack_154;
                  fStack_330 = (auVar282._0_4_ + local_4e0._16_4_ + 4.0) * fStack_150;
                  fStack_32c = (auVar282._4_4_ + local_4e0._20_4_ + 5.0) * fStack_14c;
                  fStack_328 = (auVar282._8_4_ + local_4e0._24_4_ + 6.0) * fStack_148;
                  fStack_324 = auVar282._12_4_ + local_4e0._28_4_ + 7.0;
                  uStack_4f0 = auVar141._16_8_;
                  uStack_4e8 = auVar41._24_8_;
                  local_320 = local_500;
                  uStack_318 = uStack_4f8;
                  uStack_310 = uStack_4f0;
                  uStack_308 = uStack_4e8;
                  local_300 = local_600;
                  auVar194._8_4_ = 0x7f800000;
                  auVar194._0_8_ = 0x7f8000007f800000;
                  auVar194._12_4_ = 0x7f800000;
                  auVar194._16_4_ = 0x7f800000;
                  auVar194._20_4_ = 0x7f800000;
                  auVar194._24_4_ = 0x7f800000;
                  auVar194._28_4_ = 0x7f800000;
                  auVar165 = vblendvps_avx(auVar194,local_600,local_6a0);
                  auVar172 = vshufps_avx(auVar165,auVar165,0xb1);
                  auVar172 = vminps_avx(auVar165,auVar172);
                  auVar41 = vshufpd_avx(auVar172,auVar172,5);
                  auVar172 = vminps_avx(auVar172,auVar41);
                  auVar41 = vperm2f128_avx(auVar172,auVar172,1);
                  auVar172 = vminps_avx(auVar172,auVar41);
                  auVar172 = vcmpps_avx(auVar165,auVar172,0);
                  auVar41 = local_6a0 & auVar172;
                  auVar165 = local_6a0;
                  if ((((((((auVar41 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar41 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar41 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar41 >> 0x7f,0) != '\0') ||
                        (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar41 >> 0xbf,0) != '\0') ||
                      (auVar41 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar41[0x1f] < '\0') {
                    auVar165 = vandps_avx(auVar172,local_6a0);
                  }
                  uVar143 = vmovmskps_avx(auVar165);
                  uVar39 = 0;
                  if (uVar143 != 0) {
                    for (; (uVar143 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                    }
                  }
                  uVar144 = (ulong)uVar39;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (((Geometry *)auVar150)->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar229 = local_340[uVar144];
                    auVar175 = ZEXT464((uint)fVar229);
                    uVar12 = *(undefined4 *)((long)&local_320 + uVar144 * 4);
                    fVar247 = 1.0 - fVar229;
                    fVar248 = fVar229 * fVar247 * 4.0;
                    auVar303 = ZEXT464(0x3f000000);
                    auVar282 = ZEXT416((uint)(fVar229 * fVar229 * 0.5));
                    auVar282 = vshufps_avx(auVar282,auVar282,0);
                    auVar214 = ZEXT416((uint)((fVar247 * fVar247 + fVar248) * 0.5));
                    auVar214 = vshufps_avx(auVar214,auVar214,0);
                    auVar212 = ZEXT416((uint)((-fVar229 * fVar229 - fVar248) * 0.5));
                    auVar212 = vshufps_avx(auVar212,auVar212,0);
                    auVar235 = ZEXT416((uint)(fVar247 * -fVar247 * 0.5));
                    auVar235 = vshufps_avx(auVar235,auVar235,0);
                    auVar215._0_4_ =
                         auVar235._0_4_ * fVar259 +
                         auVar212._0_4_ * fVar395 +
                         auVar282._0_4_ * fVar373 + auVar214._0_4_ * fVar405;
                    auVar215._4_4_ =
                         auVar235._4_4_ * fVar271 +
                         auVar212._4_4_ * fVar401 +
                         auVar282._4_4_ * fVar384 + auVar214._4_4_ * fVar409;
                    auVar215._8_4_ =
                         auVar235._8_4_ * auVar262._8_4_ +
                         auVar212._8_4_ * auVar397._8_4_ +
                         auVar282._8_4_ * auVar374._8_4_ + auVar214._8_4_ * auVar406._8_4_;
                    auVar215._12_4_ =
                         auVar235._12_4_ * auVar262._12_4_ +
                         auVar212._12_4_ * auVar397._12_4_ +
                         auVar282._12_4_ * auVar374._12_4_ + auVar214._12_4_ * auVar406._12_4_;
                    auVar246 = ZEXT464(*(uint *)(local_300 + uVar144 * 4));
                    *(uint *)(ray + k * 4 + 0x100) = *(uint *)(local_300 + uVar144 * 4);
                    *(float *)(ray + k * 4 + 0x180) = auVar215._0_4_;
                    uVar35 = vextractps_avx(auVar215,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar35;
                    uVar35 = vextractps_avx(auVar215,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar35;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar229;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar12;
                    *(uint *)(ray + k * 4 + 0x220) = uVar33;
                    *(uint *)(ray + k * 4 + 0x240) = uVar146;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    local_840 = ZEXT1632(*local_750);
                    local_7a0._16_8_ = *(undefined8 *)(local_758 + 0x10);
                    local_7a0._24_8_ = *(undefined8 *)(local_758 + 0x18);
                    local_740._16_8_ = *(undefined8 *)(local_758 + 0x10);
                    local_740._0_16_ = *local_750;
                    local_740._24_8_ = *(undefined8 *)(local_758 + 0x18);
                    auVar329 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                    auVar315 = ZEXT3264(local_600);
                    local_860 = auVar150;
                    auVar345 = ZEXT1664(ZEXT816(0) << 0x40);
                    _local_5c0 = auVar244;
                    _local_5a0 = *pauVar10;
                    local_420 = local_4e0;
                    local_3bc = uVar34;
                    local_3b0 = auVar262._0_8_;
                    local_3a0 = auVar397._0_8_;
                    local_390 = auVar406._0_8_;
                    local_380 = auVar374._0_8_;
                    while( true ) {
                      local_220 = local_340[uVar144];
                      local_200 = *(undefined4 *)((long)&local_320 + uVar144 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) =
                           *(undefined4 *)(local_300 + uVar144 * 4);
                      fVar248 = 1.0 - local_220;
                      fVar229 = local_220 * fVar248 * 4.0;
                      auVar303 = ZEXT464(0x3f000000);
                      auVar282 = ZEXT416((uint)(local_220 * local_220 * 0.5));
                      auVar282 = vshufps_avx(auVar282,auVar282,0);
                      auVar214 = ZEXT416((uint)((fVar248 * fVar248 + fVar229) * 0.5));
                      auVar214 = vshufps_avx(auVar214,auVar214,0);
                      auVar212 = ZEXT416((uint)((-local_220 * local_220 - fVar229) * 0.5));
                      auVar212 = vshufps_avx(auVar212,auVar212,0);
                      local_890.context = context->user;
                      auVar235 = ZEXT416((uint)(fVar248 * -fVar248 * 0.5));
                      auVar235 = vshufps_avx(auVar235,auVar235,0);
                      auVar216._0_4_ =
                           auVar235._0_4_ * fVar259 +
                           auVar212._0_4_ * fVar395 +
                           auVar282._0_4_ * fVar373 + auVar214._0_4_ * fVar405;
                      auVar216._4_4_ =
                           auVar235._4_4_ * fVar271 +
                           auVar212._4_4_ * fVar401 +
                           auVar282._4_4_ * fVar384 + auVar214._4_4_ * fVar409;
                      auVar216._8_4_ =
                           auVar235._8_4_ * auVar262._8_4_ +
                           auVar212._8_4_ * auVar397._8_4_ +
                           auVar282._8_4_ * auVar374._8_4_ + auVar214._8_4_ * auVar406._8_4_;
                      auVar216._12_4_ =
                           auVar235._12_4_ * auVar262._12_4_ +
                           auVar212._12_4_ * auVar397._12_4_ +
                           auVar282._12_4_ * auVar374._12_4_ + auVar214._12_4_ * auVar406._12_4_;
                      auStack_270 = vshufps_avx(auVar216,auVar216,0);
                      local_280[0] = (RTCHitN)auStack_270[0];
                      local_280[1] = (RTCHitN)auStack_270[1];
                      local_280[2] = (RTCHitN)auStack_270[2];
                      local_280[3] = (RTCHitN)auStack_270[3];
                      local_280[4] = (RTCHitN)auStack_270[4];
                      local_280[5] = (RTCHitN)auStack_270[5];
                      local_280[6] = (RTCHitN)auStack_270[6];
                      local_280[7] = (RTCHitN)auStack_270[7];
                      local_280[8] = (RTCHitN)auStack_270[8];
                      local_280[9] = (RTCHitN)auStack_270[9];
                      local_280[10] = (RTCHitN)auStack_270[10];
                      local_280[0xb] = (RTCHitN)auStack_270[0xb];
                      local_280[0xc] = (RTCHitN)auStack_270[0xc];
                      local_280[0xd] = (RTCHitN)auStack_270[0xd];
                      local_280[0xe] = (RTCHitN)auStack_270[0xe];
                      local_280[0xf] = (RTCHitN)auStack_270[0xf];
                      auStack_250 = vshufps_avx(auVar216,auVar216,0x55);
                      local_260 = auStack_250;
                      auStack_230 = vshufps_avx(auVar216,auVar216,0xaa);
                      local_240 = auStack_230;
                      fStack_21c = local_220;
                      fStack_218 = local_220;
                      fStack_214 = local_220;
                      fStack_210 = local_220;
                      fStack_20c = local_220;
                      fStack_208 = local_220;
                      fStack_204 = local_220;
                      uStack_1fc = local_200;
                      uStack_1f8 = local_200;
                      uStack_1f4 = local_200;
                      uStack_1f0 = local_200;
                      uStack_1ec = local_200;
                      uStack_1e8 = local_200;
                      uStack_1e4 = local_200;
                      local_1e0 = local_140._0_8_;
                      uStack_1d8 = local_140._8_8_;
                      uStack_1d0 = local_140._16_8_;
                      uStack_1c8 = local_140._24_8_;
                      local_1c0 = local_120._0_8_;
                      uStack_1b8 = local_120._8_8_;
                      uStack_1b0 = local_120._16_8_;
                      uStack_1a8 = local_120._24_8_;
                      auVar165 = vcmpps_avx(auVar345._0_32_,auVar345._0_32_,0xf);
                      local_748[1] = auVar165;
                      *local_748 = auVar165;
                      local_1a0 = (local_890.context)->instID[0];
                      uStack_19c = local_1a0;
                      uStack_198 = local_1a0;
                      uStack_194 = local_1a0;
                      uStack_190 = local_1a0;
                      uStack_18c = local_1a0;
                      uStack_188 = local_1a0;
                      uStack_184 = local_1a0;
                      local_180 = (local_890.context)->instPrimID[0];
                      uStack_17c = local_180;
                      uStack_178 = local_180;
                      uStack_174 = local_180;
                      uStack_170 = local_180;
                      uStack_16c = local_180;
                      uStack_168 = local_180;
                      uStack_164 = local_180;
                      local_780 = local_740._0_8_;
                      uStack_778 = local_740._8_8_;
                      uStack_770 = local_740._16_8_;
                      uStack_768 = local_740._24_8_;
                      local_890.valid = (int *)&local_780;
                      local_890.geometryUserPtr = ((Geometry *)auVar150)->userPtr;
                      local_890.hit = local_280;
                      local_890.N = 8;
                      auVar184 = local_840._0_16_;
                      auVar155 = local_7a0._0_16_;
                      local_890.ray = (RTCRayN *)ray;
                      if (((Geometry *)auVar150)->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar303 = ZEXT1664(auVar303._0_16_);
                        local_800 = auVar165;
                        (*((Geometry *)auVar150)->intersectionFilterN)(&local_890);
                        auVar329 = ZEXT1664(auVar329._0_16_);
                        auVar315 = ZEXT3264(local_600);
                        auVar345 = ZEXT1664(ZEXT816(0) << 0x40);
                        auVar184._8_8_ = uStack_778;
                        auVar184._0_8_ = local_780;
                        auVar155._8_8_ = uStack_768;
                        auVar155._0_8_ = uStack_770;
                        auVar150 = local_860;
                        auVar165 = local_800;
                      }
                      auVar282 = vpcmpeqd_avx(auVar184,ZEXT816(0) << 0x40);
                      auVar214 = vpcmpeqd_avx(auVar155,ZEXT816(0) << 0x40);
                      auVar246 = ZEXT1664(auVar214);
                      auVar222._16_16_ = auVar214;
                      auVar222._0_16_ = auVar282;
                      auVar172 = auVar165 & ~auVar222;
                      if ((((((((auVar172 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar172 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar172 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar172 >> 0x7f,0) == '\0') &&
                            (auVar172 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar172 >> 0xbf,0) == '\0') &&
                          (auVar172 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar172[0x1f]) {
                        auVar170._0_4_ = auVar282._0_4_ ^ auVar165._0_4_;
                        auVar170._4_4_ = auVar282._4_4_ ^ auVar165._4_4_;
                        auVar170._8_4_ = auVar282._8_4_ ^ auVar165._8_4_;
                        auVar170._12_4_ = auVar282._12_4_ ^ auVar165._12_4_;
                        auVar170._16_4_ = auVar214._0_4_ ^ auVar165._16_4_;
                        auVar170._20_4_ = auVar214._4_4_ ^ auVar165._20_4_;
                        auVar170._24_4_ = auVar214._8_4_ ^ auVar165._24_4_;
                        auVar170._28_4_ = auVar214._12_4_ ^ auVar165._28_4_;
                      }
                      else {
                        p_Var38 = context->args->filter;
                        if ((p_Var38 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((((Geometry *)auVar150)->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar246 = ZEXT1664(auVar214);
                          auVar303 = ZEXT1664(auVar303._0_16_);
                          local_800 = auVar165;
                          (*p_Var38)(&local_890);
                          auVar329 = ZEXT1664(auVar329._0_16_);
                          auVar315 = ZEXT3264(local_600);
                          auVar345 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar184._8_8_ = uStack_778;
                          auVar184._0_8_ = local_780;
                          auVar155._8_8_ = uStack_768;
                          auVar155._0_8_ = uStack_770;
                          auVar150 = local_860;
                          auVar165 = local_800;
                        }
                        auVar282 = vpcmpeqd_avx(auVar184,ZEXT816(0) << 0x40);
                        auVar214 = vpcmpeqd_avx(auVar155,ZEXT816(0) << 0x40);
                        auVar195._16_16_ = auVar214;
                        auVar195._0_16_ = auVar282;
                        auVar170._0_4_ = auVar282._0_4_ ^ auVar165._0_4_;
                        auVar170._4_4_ = auVar282._4_4_ ^ auVar165._4_4_;
                        auVar170._8_4_ = auVar282._8_4_ ^ auVar165._8_4_;
                        auVar170._12_4_ = auVar282._12_4_ ^ auVar165._12_4_;
                        auVar170._16_4_ = auVar214._0_4_ ^ auVar165._16_4_;
                        auVar170._20_4_ = auVar214._4_4_ ^ auVar165._20_4_;
                        auVar170._24_4_ = auVar214._8_4_ ^ auVar165._24_4_;
                        auVar170._28_4_ = auVar214._12_4_ ^ auVar165._28_4_;
                        auVar165 = auVar165 & ~auVar195;
                        if ((((((((auVar165 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar165 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar165 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar165 >> 0x7f,0) != '\0')
                              || (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar165 >> 0xbf,0) != '\0') ||
                            (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar165[0x1f] < '\0') {
                          auVar165 = vmaskmovps_avx(auVar170,*(undefined1 (*) [32])local_890.hit);
                          *(undefined1 (*) [32])(local_890.ray + 0x180) = auVar165;
                          auVar165 = vmaskmovps_avx(auVar170,*(undefined1 (*) [32])
                                                              (local_890.hit + 0x20));
                          *(undefined1 (*) [32])(local_890.ray + 0x1a0) = auVar165;
                          auVar165 = vmaskmovps_avx(auVar170,*(undefined1 (*) [32])
                                                              (local_890.hit + 0x40));
                          *(undefined1 (*) [32])(local_890.ray + 0x1c0) = auVar165;
                          auVar165 = vmaskmovps_avx(auVar170,*(undefined1 (*) [32])
                                                              (local_890.hit + 0x60));
                          *(undefined1 (*) [32])(local_890.ray + 0x1e0) = auVar165;
                          auVar165 = vmaskmovps_avx(auVar170,*(undefined1 (*) [32])
                                                              (local_890.hit + 0x80));
                          *(undefined1 (*) [32])(local_890.ray + 0x200) = auVar165;
                          auVar165 = vmaskmovps_avx(auVar170,*(undefined1 (*) [32])
                                                              (local_890.hit + 0xa0));
                          *(undefined1 (*) [32])(local_890.ray + 0x220) = auVar165;
                          auVar165 = vmaskmovps_avx(auVar170,*(undefined1 (*) [32])
                                                              (local_890.hit + 0xc0));
                          *(undefined1 (*) [32])(local_890.ray + 0x240) = auVar165;
                          auVar165 = vmaskmovps_avx(auVar170,*(undefined1 (*) [32])
                                                              (local_890.hit + 0xe0));
                          *(undefined1 (*) [32])(local_890.ray + 0x260) = auVar165;
                          auVar165 = vmaskmovps_avx(auVar170,*(undefined1 (*) [32])
                                                              (local_890.hit + 0x100));
                          *(undefined1 (*) [32])(local_890.ray + 0x280) = auVar165;
                        }
                      }
                      if ((((((((auVar170 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar170 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar170 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar170 >> 0x7f,0) == '\0') &&
                            (auVar170 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar170 >> 0xbf,0) == '\0') &&
                          (auVar170 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar170[0x1f]) {
                        *(int *)(ray + k * 4 + 0x100) = auVar329._0_4_;
                      }
                      else {
                        auVar329 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                      }
                      *(undefined4 *)(local_6a0 + uVar144 * 4) = 0;
                      auVar282 = vshufps_avx(auVar329._0_16_,auVar329._0_16_,0);
                      auVar171._16_16_ = auVar282;
                      auVar171._0_16_ = auVar282;
                      auVar172 = vcmpps_avx(auVar315._0_32_,auVar171,2);
                      auVar165 = vandps_avx(auVar172,local_6a0);
                      auVar175 = ZEXT3264(auVar165);
                      local_6a0 = local_6a0 & auVar172;
                      if ((((((((local_6a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (local_6a0 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (local_6a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(local_6a0 >> 0x7f,0) == '\0') &&
                            (local_6a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(local_6a0 >> 0xbf,0) == '\0') &&
                          (local_6a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < local_6a0[0x1f]) break;
                      auVar196._8_4_ = 0x7f800000;
                      auVar196._0_8_ = 0x7f8000007f800000;
                      auVar196._12_4_ = 0x7f800000;
                      auVar196._16_4_ = 0x7f800000;
                      auVar196._20_4_ = 0x7f800000;
                      auVar196._24_4_ = 0x7f800000;
                      auVar196._28_4_ = 0x7f800000;
                      auVar172 = vblendvps_avx(auVar196,auVar315._0_32_,auVar165);
                      auVar41 = vshufps_avx(auVar172,auVar172,0xb1);
                      auVar41 = vminps_avx(auVar172,auVar41);
                      auVar42 = vshufpd_avx(auVar41,auVar41,5);
                      auVar41 = vminps_avx(auVar41,auVar42);
                      auVar42 = vperm2f128_avx(auVar41,auVar41,1);
                      auVar41 = vminps_avx(auVar41,auVar42);
                      auVar41 = vcmpps_avx(auVar172,auVar41,0);
                      auVar42 = auVar165 & auVar41;
                      auVar172 = auVar165;
                      if ((((((((auVar42 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar42 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar42 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar42 >> 0x7f,0) != '\0') ||
                            (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar42 >> 0xbf,0) != '\0') ||
                          (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar42[0x1f] < '\0') {
                        auVar172 = vandps_avx(auVar41,auVar165);
                      }
                      uVar143 = vmovmskps_avx(auVar172);
                      uVar39 = 0;
                      if (uVar143 != 0) {
                        for (; (uVar143 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                        }
                      }
                      uVar144 = (ulong)uVar39;
                      local_6a0 = auVar165;
                    }
                  }
                }
              }
            }
            fVar229 = (float)local_6c0._0_4_;
            fVar250 = (float)local_6c0._4_4_;
            fVar249 = fStack_6b8;
            fVar253 = fStack_6b4;
            fVar270 = fStack_6b0;
            fVar273 = fStack_6ac;
            fVar275 = fStack_6a8;
            fVar277 = (float)local_6e0._0_4_;
            fVar278 = (float)local_6e0._4_4_;
            fVar279 = fStack_6d8;
            fVar280 = fStack_6d4;
            fVar288 = fStack_6d0;
            fVar289 = fStack_6cc;
            fVar290 = fStack_6c8;
            fVar248 = fStack_6c4;
          }
          fVar291 = fVar248;
          lVar151 = lVar151 + 8;
          fVar260 = (float)local_700._0_4_;
          fVar272 = (float)local_700._4_4_;
          fVar274 = fStack_6f8;
          fVar276 = fStack_6f4;
          fVar248 = fStack_6f0;
          fVar247 = fStack_6ec;
          fVar227 = fStack_6e8;
          fVar255 = fStack_6e4;
          fVar316 = (float)local_720._0_4_;
          fVar317 = (float)local_720._4_4_;
          fVar318 = fStack_718;
          fVar336 = fStack_714;
          fVar206 = fStack_710;
          fVar251 = fStack_70c;
          fVar256 = fStack_708;
          fVar258 = fStack_704;
        } while ((int)lVar151 < (int)uVar34);
      }
      uVar12 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar166._4_4_ = uVar12;
      auVar166._0_4_ = uVar12;
      auVar166._8_4_ = uVar12;
      auVar166._12_4_ = uVar12;
      auVar166._16_4_ = uVar12;
      auVar166._20_4_ = uVar12;
      auVar166._24_4_ = uVar12;
      auVar166._28_4_ = uVar12;
      auVar165 = vcmpps_avx(local_80,auVar166,2);
      uVar146 = vmovmskps_avx(auVar165);
      uVar142 = uVar142 & uVar142 + 0xff & uVar146;
    } while (uVar142 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }